

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [28];
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [12];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [28];
  uint uVar127;
  int iVar128;
  ulong uVar129;
  RTCIntersectArguments *pRVar130;
  uint uVar131;
  long lVar132;
  ulong uVar133;
  ulong uVar134;
  long lVar135;
  float fVar136;
  float fVar137;
  float fVar150;
  float fVar152;
  vint4 bi_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar156;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar162;
  float fVar180;
  float fVar181;
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar185;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar186;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar179 [64];
  float fVar197;
  vint4 bi;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar198;
  float fVar210;
  float fVar213;
  vint4 ai_1;
  undefined1 auVar199 [16];
  float fVar215;
  undefined1 auVar200 [16];
  float fVar212;
  float fVar217;
  undefined1 auVar202 [16];
  undefined1 auVar201 [16];
  float fVar218;
  float fVar219;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar211;
  float fVar214;
  float fVar216;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar220;
  float fVar232;
  float fVar235;
  vint4 ai_2;
  undefined1 auVar223 [16];
  float fVar238;
  undefined1 auVar224 [16];
  float fVar221;
  float fVar222;
  undefined1 auVar226 [16];
  undefined1 auVar245 [16];
  undefined1 auVar225 [16];
  float fVar233;
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar239;
  undefined1 auVar227 [32];
  float fVar240;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar241;
  float fVar242;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar243;
  float fVar253;
  float fVar254;
  undefined1 auVar244 [16];
  float fVar255;
  float fVar257;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar256;
  float fVar258;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar267;
  undefined1 auVar266 [32];
  float fVar268;
  float fVar269;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  vint4 ai;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar276 [32];
  float fVar283;
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  float fVar288;
  undefined4 uVar289;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  float fVar295;
  float fVar303;
  float fVar304;
  undefined1 auVar296 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  undefined1 auVar309 [16];
  float fVar313;
  float fVar314;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  undefined1 auVar317 [64];
  float fVar325;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [16];
  float fVar333;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar334;
  float fVar338;
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar343;
  float fVar344;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  bool local_855;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  uint local_820;
  undefined4 uStack_81c;
  undefined8 local_800;
  undefined8 uStack_7f8;
  ulong local_7e8;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [48];
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 (*local_6a0) [16];
  Precalculations *local_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  undefined8 uStack_618;
  undefined1 auStack_610 [8];
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [16];
  LinearSpace3fa *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar172 [24];
  
  PVar12 = prim[1];
  uVar129 = (ulong)(byte)PVar12;
  lVar21 = uVar129 * 0x25;
  auVar226 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar226 = vinsertps_avx(auVar226,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar245 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar245 = vinsertps_avx(auVar245,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar185 = *(float *)(prim + lVar21 + 0x12);
  auVar226 = vsubps_avx(auVar226,*(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar163._0_4_ = fVar185 * auVar226._0_4_;
  auVar163._4_4_ = fVar185 * auVar226._4_4_;
  auVar163._8_4_ = fVar185 * auVar226._8_4_;
  auVar163._12_4_ = fVar185 * auVar226._12_4_;
  auVar270._0_4_ = fVar185 * auVar245._0_4_;
  auVar270._4_4_ = fVar185 * auVar245._4_4_;
  auVar270._8_4_ = fVar185 * auVar245._8_4_;
  auVar270._12_4_ = fVar185 * auVar245._12_4_;
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 4 + 6)));
  auVar226 = vcvtdq2ps_avx(auVar226);
  auVar245 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 5 + 6)));
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar202 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 6 + 6)));
  auVar202 = vcvtdq2ps_avx(auVar202);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0xf + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar129 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1b + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar129 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vshufps_avx(auVar270,auVar270,0);
  auVar30 = vshufps_avx(auVar270,auVar270,0x55);
  auVar31 = vshufps_avx(auVar270,auVar270,0xaa);
  fVar185 = auVar31._0_4_;
  fVar338 = auVar31._4_4_;
  fVar197 = auVar31._8_4_;
  fVar256 = auVar31._12_4_;
  fVar220 = auVar30._0_4_;
  fVar232 = auVar30._4_4_;
  fVar235 = auVar30._8_4_;
  fVar238 = auVar30._12_4_;
  fVar198 = auVar29._0_4_;
  fVar210 = auVar29._4_4_;
  fVar213 = auVar29._8_4_;
  fVar215 = auVar29._12_4_;
  auVar326._0_4_ = fVar198 * auVar226._0_4_ + fVar220 * auVar245._0_4_ + fVar185 * auVar202._0_4_;
  auVar326._4_4_ = fVar210 * auVar226._4_4_ + fVar232 * auVar245._4_4_ + fVar338 * auVar202._4_4_;
  auVar326._8_4_ = fVar213 * auVar226._8_4_ + fVar235 * auVar245._8_4_ + fVar197 * auVar202._8_4_;
  auVar326._12_4_ =
       fVar215 * auVar226._12_4_ + fVar238 * auVar245._12_4_ + fVar256 * auVar202._12_4_;
  auVar335._0_4_ = fVar198 * auVar190._0_4_ + fVar220 * auVar24._0_4_ + auVar25._0_4_ * fVar185;
  auVar335._4_4_ = fVar210 * auVar190._4_4_ + fVar232 * auVar24._4_4_ + auVar25._4_4_ * fVar338;
  auVar335._8_4_ = fVar213 * auVar190._8_4_ + fVar235 * auVar24._8_4_ + auVar25._8_4_ * fVar197;
  auVar335._12_4_ = fVar215 * auVar190._12_4_ + fVar238 * auVar24._12_4_ + auVar25._12_4_ * fVar256;
  auVar271._0_4_ = fVar198 * auVar26._0_4_ + fVar220 * auVar27._0_4_ + auVar28._0_4_ * fVar185;
  auVar271._4_4_ = fVar210 * auVar26._4_4_ + fVar232 * auVar27._4_4_ + auVar28._4_4_ * fVar338;
  auVar271._8_4_ = fVar213 * auVar26._8_4_ + fVar235 * auVar27._8_4_ + auVar28._8_4_ * fVar197;
  auVar271._12_4_ = fVar215 * auVar26._12_4_ + fVar238 * auVar27._12_4_ + auVar28._12_4_ * fVar256;
  auVar29 = vshufps_avx(auVar163,auVar163,0);
  auVar30 = vshufps_avx(auVar163,auVar163,0x55);
  auVar31 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar185 = auVar31._0_4_;
  fVar338 = auVar31._4_4_;
  fVar197 = auVar31._8_4_;
  fVar256 = auVar31._12_4_;
  fVar220 = auVar30._0_4_;
  fVar232 = auVar30._4_4_;
  fVar235 = auVar30._8_4_;
  fVar238 = auVar30._12_4_;
  fVar198 = auVar29._0_4_;
  fVar210 = auVar29._4_4_;
  fVar213 = auVar29._8_4_;
  fVar215 = auVar29._12_4_;
  auVar187._0_4_ = fVar198 * auVar226._0_4_ + fVar220 * auVar245._0_4_ + fVar185 * auVar202._0_4_;
  auVar187._4_4_ = fVar210 * auVar226._4_4_ + fVar232 * auVar245._4_4_ + fVar338 * auVar202._4_4_;
  auVar187._8_4_ = fVar213 * auVar226._8_4_ + fVar235 * auVar245._8_4_ + fVar197 * auVar202._8_4_;
  auVar187._12_4_ =
       fVar215 * auVar226._12_4_ + fVar238 * auVar245._12_4_ + fVar256 * auVar202._12_4_;
  auVar164._0_4_ = fVar198 * auVar190._0_4_ + auVar25._0_4_ * fVar185 + fVar220 * auVar24._0_4_;
  auVar164._4_4_ = fVar210 * auVar190._4_4_ + auVar25._4_4_ * fVar338 + fVar232 * auVar24._4_4_;
  auVar164._8_4_ = fVar213 * auVar190._8_4_ + auVar25._8_4_ * fVar197 + fVar235 * auVar24._8_4_;
  auVar164._12_4_ = fVar215 * auVar190._12_4_ + auVar25._12_4_ * fVar256 + fVar238 * auVar24._12_4_;
  auVar138._0_4_ = fVar198 * auVar26._0_4_ + fVar220 * auVar27._0_4_ + auVar28._0_4_ * fVar185;
  auVar138._4_4_ = fVar210 * auVar26._4_4_ + fVar232 * auVar27._4_4_ + auVar28._4_4_ * fVar338;
  auVar138._8_4_ = fVar213 * auVar26._8_4_ + fVar235 * auVar27._8_4_ + auVar28._8_4_ * fVar197;
  auVar138._12_4_ = fVar215 * auVar26._12_4_ + fVar238 * auVar27._12_4_ + auVar28._12_4_ * fVar256;
  auVar259._8_4_ = 0x7fffffff;
  auVar259._0_8_ = 0x7fffffff7fffffff;
  auVar259._12_4_ = 0x7fffffff;
  auVar226 = vandps_avx(auVar326,auVar259);
  auVar223._8_4_ = 0x219392ef;
  auVar223._0_8_ = 0x219392ef219392ef;
  auVar223._12_4_ = 0x219392ef;
  auVar226 = vcmpps_avx(auVar226,auVar223,1);
  auVar245 = vblendvps_avx(auVar326,auVar223,auVar226);
  auVar226 = vandps_avx(auVar335,auVar259);
  auVar226 = vcmpps_avx(auVar226,auVar223,1);
  auVar202 = vblendvps_avx(auVar335,auVar223,auVar226);
  auVar226 = vandps_avx(auVar271,auVar259);
  auVar226 = vcmpps_avx(auVar226,auVar223,1);
  auVar226 = vblendvps_avx(auVar271,auVar223,auVar226);
  auVar190 = vrcpps_avx(auVar245);
  fVar198 = auVar190._0_4_;
  auVar199._0_4_ = fVar198 * auVar245._0_4_;
  fVar210 = auVar190._4_4_;
  auVar199._4_4_ = fVar210 * auVar245._4_4_;
  fVar213 = auVar190._8_4_;
  auVar199._8_4_ = fVar213 * auVar245._8_4_;
  fVar215 = auVar190._12_4_;
  auVar199._12_4_ = fVar215 * auVar245._12_4_;
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = &DAT_3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar245 = vsubps_avx(auVar272,auVar199);
  fVar198 = fVar198 + fVar198 * auVar245._0_4_;
  fVar210 = fVar210 + fVar210 * auVar245._4_4_;
  fVar213 = fVar213 + fVar213 * auVar245._8_4_;
  fVar215 = fVar215 + fVar215 * auVar245._12_4_;
  auVar245 = vrcpps_avx(auVar202);
  fVar220 = auVar245._0_4_;
  auVar244._0_4_ = fVar220 * auVar202._0_4_;
  fVar232 = auVar245._4_4_;
  auVar244._4_4_ = fVar232 * auVar202._4_4_;
  fVar235 = auVar245._8_4_;
  auVar244._8_4_ = fVar235 * auVar202._8_4_;
  fVar238 = auVar245._12_4_;
  auVar244._12_4_ = fVar238 * auVar202._12_4_;
  auVar245 = vsubps_avx(auVar272,auVar244);
  fVar220 = fVar220 + fVar220 * auVar245._0_4_;
  fVar232 = fVar232 + fVar232 * auVar245._4_4_;
  fVar235 = fVar235 + fVar235 * auVar245._8_4_;
  fVar238 = fVar238 + fVar238 * auVar245._12_4_;
  auVar245 = vrcpps_avx(auVar226);
  fVar243 = auVar245._0_4_;
  auVar260._0_4_ = fVar243 * auVar226._0_4_;
  fVar253 = auVar245._4_4_;
  auVar260._4_4_ = fVar253 * auVar226._4_4_;
  fVar254 = auVar245._8_4_;
  auVar260._8_4_ = fVar254 * auVar226._8_4_;
  fVar255 = auVar245._12_4_;
  auVar260._12_4_ = fVar255 * auVar226._12_4_;
  auVar226 = vsubps_avx(auVar272,auVar260);
  fVar243 = fVar243 + fVar243 * auVar226._0_4_;
  fVar253 = fVar253 + fVar253 * auVar226._4_4_;
  fVar254 = fVar254 + fVar254 * auVar226._8_4_;
  fVar255 = fVar255 + fVar255 * auVar226._12_4_;
  auVar226 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar21 + 0x16)) *
                           *(float *)(prim + lVar21 + 0x1a)));
  auVar202 = vshufps_avx(auVar226,auVar226,0);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar129 * 7 + 6);
  auVar226 = vpmovsxwd_avx(auVar226);
  auVar226 = vcvtdq2ps_avx(auVar226);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *(ulong *)(prim + uVar129 * 0xb + 6);
  auVar245 = vpmovsxwd_avx(auVar245);
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar245 = vsubps_avx(auVar245,auVar226);
  fVar185 = auVar202._0_4_;
  fVar338 = auVar202._4_4_;
  fVar197 = auVar202._8_4_;
  fVar256 = auVar202._12_4_;
  auVar273._0_4_ = auVar245._0_4_ * fVar185 + auVar226._0_4_;
  auVar273._4_4_ = auVar245._4_4_ * fVar338 + auVar226._4_4_;
  auVar273._8_4_ = auVar245._8_4_ * fVar197 + auVar226._8_4_;
  auVar273._12_4_ = auVar245._12_4_ * fVar256 + auVar226._12_4_;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar129 * 9 + 6);
  auVar226 = vpmovsxwd_avx(auVar202);
  auVar226 = vcvtdq2ps_avx(auVar226);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar129 * 0xd + 6);
  auVar245 = vpmovsxwd_avx(auVar190);
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar245 = vsubps_avx(auVar245,auVar226);
  auVar290._0_4_ = auVar245._0_4_ * fVar185 + auVar226._0_4_;
  auVar290._4_4_ = auVar245._4_4_ * fVar338 + auVar226._4_4_;
  auVar290._8_4_ = auVar245._8_4_ * fVar197 + auVar226._8_4_;
  auVar290._12_4_ = auVar245._12_4_ * fVar256 + auVar226._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar129 * 0x12 + 6);
  auVar226 = vpmovsxwd_avx(auVar24);
  auVar226 = vcvtdq2ps_avx(auVar226);
  uVar133 = (ulong)(uint)((int)(uVar129 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar129 * 2 + uVar133 + 6);
  auVar245 = vpmovsxwd_avx(auVar25);
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar245 = vsubps_avx(auVar245,auVar226);
  auVar296._0_4_ = auVar245._0_4_ * fVar185 + auVar226._0_4_;
  auVar296._4_4_ = auVar245._4_4_ * fVar338 + auVar226._4_4_;
  auVar296._8_4_ = auVar245._8_4_ * fVar197 + auVar226._8_4_;
  auVar296._12_4_ = auVar245._12_4_ * fVar256 + auVar226._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar133 + 6);
  auVar226 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar129 * 0x18 + 6);
  auVar245 = vpmovsxwd_avx(auVar27);
  auVar226 = vcvtdq2ps_avx(auVar226);
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar245 = vsubps_avx(auVar245,auVar226);
  auVar309._0_4_ = auVar245._0_4_ * fVar185 + auVar226._0_4_;
  auVar309._4_4_ = auVar245._4_4_ * fVar338 + auVar226._4_4_;
  auVar309._8_4_ = auVar245._8_4_ * fVar197 + auVar226._8_4_;
  auVar309._12_4_ = auVar245._12_4_ * fVar256 + auVar226._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar129 * 0x1d + 6);
  auVar226 = vpmovsxwd_avx(auVar28);
  auVar226 = vcvtdq2ps_avx(auVar226);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar129 + (ulong)(byte)PVar12 * 0x20 + 6);
  auVar245 = vpmovsxwd_avx(auVar29);
  auVar245 = vcvtdq2ps_avx(auVar245);
  auVar202 = vsubps_avx(auVar245,auVar226);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar12 * 0x20 - uVar129) + 6);
  auVar245 = vpmovsxwd_avx(auVar30);
  auVar315._0_4_ = auVar202._0_4_ * fVar185 + auVar226._0_4_;
  auVar315._4_4_ = auVar202._4_4_ * fVar338 + auVar226._4_4_;
  auVar315._8_4_ = auVar202._8_4_ * fVar197 + auVar226._8_4_;
  auVar315._12_4_ = auVar202._12_4_ * fVar256 + auVar226._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar129 * 0x23 + 6);
  auVar202 = vpmovsxwd_avx(auVar31);
  auVar226 = vcvtdq2ps_avx(auVar245);
  auVar245 = vcvtdq2ps_avx(auVar202);
  auVar245 = vsubps_avx(auVar245,auVar226);
  auVar261._0_4_ = auVar226._0_4_ + auVar245._0_4_ * fVar185;
  auVar261._4_4_ = auVar226._4_4_ + auVar245._4_4_ * fVar338;
  auVar261._8_4_ = auVar226._8_4_ + auVar245._8_4_ * fVar197;
  auVar261._12_4_ = auVar226._12_4_ + auVar245._12_4_ * fVar256;
  auVar226 = vsubps_avx(auVar273,auVar187);
  auVar274._0_4_ = fVar198 * auVar226._0_4_;
  auVar274._4_4_ = fVar210 * auVar226._4_4_;
  auVar274._8_4_ = fVar213 * auVar226._8_4_;
  auVar274._12_4_ = fVar215 * auVar226._12_4_;
  auVar226 = vsubps_avx(auVar290,auVar187);
  auVar188._0_4_ = fVar198 * auVar226._0_4_;
  auVar188._4_4_ = fVar210 * auVar226._4_4_;
  auVar188._8_4_ = fVar213 * auVar226._8_4_;
  auVar188._12_4_ = fVar215 * auVar226._12_4_;
  auVar226 = vsubps_avx(auVar296,auVar164);
  auVar200._0_4_ = fVar220 * auVar226._0_4_;
  auVar200._4_4_ = fVar232 * auVar226._4_4_;
  auVar200._8_4_ = fVar235 * auVar226._8_4_;
  auVar200._12_4_ = fVar238 * auVar226._12_4_;
  auVar226 = vsubps_avx(auVar309,auVar164);
  auVar165._0_4_ = fVar220 * auVar226._0_4_;
  auVar165._4_4_ = fVar232 * auVar226._4_4_;
  auVar165._8_4_ = fVar235 * auVar226._8_4_;
  auVar165._12_4_ = fVar238 * auVar226._12_4_;
  auVar226 = vsubps_avx(auVar315,auVar138);
  auVar224._0_4_ = fVar243 * auVar226._0_4_;
  auVar224._4_4_ = fVar253 * auVar226._4_4_;
  auVar224._8_4_ = fVar254 * auVar226._8_4_;
  auVar224._12_4_ = fVar255 * auVar226._12_4_;
  auVar226 = vsubps_avx(auVar261,auVar138);
  auVar139._0_4_ = fVar243 * auVar226._0_4_;
  auVar139._4_4_ = fVar253 * auVar226._4_4_;
  auVar139._8_4_ = fVar254 * auVar226._8_4_;
  auVar139._12_4_ = fVar255 * auVar226._12_4_;
  auVar226 = vpminsd_avx(auVar274,auVar188);
  auVar245 = vpminsd_avx(auVar200,auVar165);
  auVar226 = vmaxps_avx(auVar226,auVar245);
  auVar245 = vpminsd_avx(auVar224,auVar139);
  uVar289 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar291._4_4_ = uVar289;
  auVar291._0_4_ = uVar289;
  auVar291._8_4_ = uVar289;
  auVar291._12_4_ = uVar289;
  auVar245 = vmaxps_avx(auVar245,auVar291);
  auVar226 = vmaxps_avx(auVar226,auVar245);
  local_2f0._0_4_ = auVar226._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar226._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar226._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar226._12_4_ * 0.99999964;
  auVar226 = vpmaxsd_avx(auVar274,auVar188);
  auVar245 = vpmaxsd_avx(auVar200,auVar165);
  auVar226 = vminps_avx(auVar226,auVar245);
  auVar245 = vpmaxsd_avx(auVar224,auVar139);
  uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar189._4_4_ = uVar289;
  auVar189._0_4_ = uVar289;
  auVar189._8_4_ = uVar289;
  auVar189._12_4_ = uVar289;
  auVar245 = vminps_avx(auVar245,auVar189);
  auVar226 = vminps_avx(auVar226,auVar245);
  auVar140._0_4_ = auVar226._0_4_ * 1.0000004;
  auVar140._4_4_ = auVar226._4_4_ * 1.0000004;
  auVar140._8_4_ = auVar226._8_4_ * 1.0000004;
  auVar140._12_4_ = auVar226._12_4_ * 1.0000004;
  auVar226 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar245 = vpcmpgtd_avx(auVar226,_DAT_01ff0cf0);
  auVar226 = vcmpps_avx(local_2f0,auVar140,2);
  auVar226 = vandps_avx(auVar226,auVar245);
  uVar127 = vmovmskps_avx(auVar226);
  local_855 = uVar127 != 0;
  if (local_855) {
    uVar127 = uVar127 & 0xff;
    local_4e0 = mm_lookupmask_ps._16_8_;
    uStack_4d8 = mm_lookupmask_ps._24_8_;
    uStack_4d0 = mm_lookupmask_ps._16_8_;
    uStack_4c8 = mm_lookupmask_ps._24_8_;
    local_4e8 = pre->ray_space + k;
    local_6a0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_698 = pre;
    do {
      lVar21 = 0;
      if (uVar127 != 0) {
        for (; (uVar127 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar13 = *(uint *)(prim + 2);
      local_7e8 = (ulong)uVar13;
      uVar14 = *(uint *)(prim + lVar21 * 4 + 6);
      pGVar16 = (context->scene->geometries).items[local_7e8].ptr;
      local_5e0._0_8_ = CONCAT44(0,uVar14);
      uVar129 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                                CONCAT44(0,uVar14) *
                                pGVar16[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar185 = (pGVar16->time_range).lower;
      fVar185 = pGVar16->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar185) /
                ((pGVar16->time_range).upper - fVar185));
      auVar226 = vroundss_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),9);
      auVar226 = vminss_avx(auVar226,ZEXT416((uint)(pGVar16->fnumTimeSegments + -1.0)));
      auVar226 = vmaxss_avx(ZEXT816(0) << 0x20,auVar226);
      fVar185 = fVar185 - auVar226._0_4_;
      _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar132 = (long)(int)auVar226._0_4_ * 0x38;
      lVar135 = *(long *)(_Var17 + 0x10 + lVar132);
      lVar18 = *(long *)(_Var17 + 0x38 + lVar132);
      lVar19 = *(long *)(_Var17 + 0x48 + lVar132);
      auVar226 = vshufps_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),0);
      pfVar1 = (float *)(lVar18 + lVar19 * uVar129);
      fVar338 = auVar226._0_4_;
      fVar197 = auVar226._4_4_;
      fVar256 = auVar226._8_4_;
      fVar198 = auVar226._12_4_;
      lVar21 = uVar129 + 1;
      pfVar2 = (float *)(lVar18 + lVar19 * lVar21);
      p_Var20 = pGVar16[4].occlusionFilterN;
      auVar226 = vshufps_avx(ZEXT416((uint)(1.0 - fVar185)),ZEXT416((uint)(1.0 - fVar185)),0);
      pfVar3 = (float *)(*(long *)(_Var17 + lVar132) + lVar135 * uVar129);
      fVar185 = auVar226._0_4_;
      fVar210 = auVar226._4_4_;
      fVar213 = auVar226._8_4_;
      fVar215 = auVar226._12_4_;
      pfVar4 = (float *)(*(long *)(_Var17 + lVar132) + lVar135 * lVar21);
      pfVar5 = (float *)(*(long *)(p_Var20 + lVar132 + 0x38) +
                        uVar129 * *(long *)(p_Var20 + lVar132 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var20 + lVar132 + 0x38) +
                        *(long *)(p_Var20 + lVar132 + 0x48) * lVar21);
      uVar133 = *(long *)(p_Var20 + lVar132 + 0x10) * lVar21;
      pfVar7 = (float *)(*(long *)(p_Var20 + lVar132) +
                        *(long *)(p_Var20 + lVar132 + 0x10) * uVar129);
      pfVar8 = (float *)(*(long *)(p_Var20 + lVar132) + uVar133);
      uVar15 = (uint)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar15 * 0x44;
      fVar220 = fVar185 * *pfVar3 + fVar338 * *pfVar1;
      fVar232 = fVar210 * pfVar3[1] + fVar197 * pfVar1[1];
      local_6b0 = (undefined1  [8])CONCAT44(fVar232,fVar220);
      uStack_6a8._0_4_ = fVar213 * pfVar3[2] + fVar256 * pfVar1[2];
      uStack_6a8._4_4_ = fVar215 * pfVar3[3] + fVar198 * pfVar1[3];
      local_490._0_8_ =
           CONCAT44(fVar210 * pfVar4[1] + fVar197 * pfVar2[1],fVar185 * *pfVar4 + fVar338 * *pfVar2)
      ;
      local_490._8_4_ = fVar213 * pfVar4[2] + fVar256 * pfVar2[2];
      local_490._12_4_ = fVar215 * pfVar4[3] + fVar198 * pfVar2[3];
      auVar226 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar190 = vinsertps_avx(auVar226,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      local_500._0_8_ =
           CONCAT44(fVar232 + (fVar210 * pfVar7[1] + fVar197 * pfVar5[1]) * 0.33333334,
                    fVar220 + (fVar185 * *pfVar7 + fVar338 * *pfVar5) * 0.33333334);
      local_500._8_4_ = (float)uStack_6a8 + (fVar213 * pfVar7[2] + fVar256 * pfVar5[2]) * 0.33333334
      ;
      local_500._12_4_ = uStack_6a8._4_4_ + (fVar215 * pfVar7[3] + fVar198 * pfVar5[3]) * 0.33333334
      ;
      auVar166._0_4_ = (fVar185 * *pfVar8 + fVar338 * *pfVar6) * 0.33333334;
      auVar166._4_4_ = (fVar210 * pfVar8[1] + fVar197 * pfVar6[1]) * 0.33333334;
      auVar166._8_4_ = (fVar213 * pfVar8[2] + fVar256 * pfVar6[2]) * 0.33333334;
      auVar166._12_4_ = (fVar215 * pfVar8[3] + fVar198 * pfVar6[3]) * 0.33333334;
      local_4a0 = vsubps_avx(local_490,auVar166);
      auVar202 = vsubps_avx(_local_6b0,auVar190);
      auVar226 = vshufps_avx(auVar202,auVar202,0);
      auVar245 = vshufps_avx(auVar202,auVar202,0x55);
      auVar202 = vshufps_avx(auVar202,auVar202,0xaa);
      fVar185 = (local_4e8->vx).field_0.m128[0];
      fVar338 = (local_4e8->vx).field_0.m128[1];
      fVar197 = (local_4e8->vx).field_0.m128[2];
      fVar256 = (local_4e8->vx).field_0.m128[3];
      fVar198 = (local_4e8->vy).field_0.m128[0];
      fVar210 = (local_4e8->vy).field_0.m128[1];
      fVar213 = (local_4e8->vy).field_0.m128[2];
      fVar215 = (local_4e8->vy).field_0.m128[3];
      fVar220 = (local_4e8->vz).field_0.m128[0];
      fVar232 = (local_4e8->vz).field_0.m128[1];
      fVar235 = (local_4e8->vz).field_0.m128[2];
      fVar238 = (local_4e8->vz).field_0.m128[3];
      auVar201._0_8_ =
           CONCAT44(auVar226._4_4_ * fVar338 + auVar245._4_4_ * fVar210 + fVar232 * auVar202._4_4_,
                    auVar226._0_4_ * fVar185 + auVar245._0_4_ * fVar198 + fVar220 * auVar202._0_4_);
      auVar201._8_4_ =
           auVar226._8_4_ * fVar197 + auVar245._8_4_ * fVar213 + fVar235 * auVar202._8_4_;
      auVar201._12_4_ =
           auVar226._12_4_ * fVar256 + auVar245._12_4_ * fVar215 + fVar238 * auVar202._12_4_;
      auVar226 = vblendps_avx(auVar201,_local_6b0,8);
      auVar24 = vsubps_avx(local_500,auVar190);
      auVar245 = vshufps_avx(auVar24,auVar24,0);
      auVar202 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar275._0_4_ = auVar245._0_4_ * fVar185 + auVar202._0_4_ * fVar198 + fVar220 * auVar24._0_4_
      ;
      auVar275._4_4_ = auVar245._4_4_ * fVar338 + auVar202._4_4_ * fVar210 + fVar232 * auVar24._4_4_
      ;
      auVar275._8_4_ = auVar245._8_4_ * fVar197 + auVar202._8_4_ * fVar213 + fVar235 * auVar24._8_4_
      ;
      auVar275._12_4_ =
           auVar245._12_4_ * fVar256 + auVar202._12_4_ * fVar215 + fVar238 * auVar24._12_4_;
      auVar245 = vblendps_avx(auVar275,local_500,8);
      auVar25 = vsubps_avx(local_4a0,auVar190);
      auVar202 = vshufps_avx(auVar25,auVar25,0);
      auVar24 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar292._0_4_ = auVar202._0_4_ * fVar185 + auVar24._0_4_ * fVar198 + auVar25._0_4_ * fVar220;
      auVar292._4_4_ = auVar202._4_4_ * fVar338 + auVar24._4_4_ * fVar210 + auVar25._4_4_ * fVar232;
      auVar292._8_4_ = auVar202._8_4_ * fVar197 + auVar24._8_4_ * fVar213 + auVar25._8_4_ * fVar235;
      auVar292._12_4_ =
           auVar202._12_4_ * fVar256 + auVar24._12_4_ * fVar215 + auVar25._12_4_ * fVar238;
      auVar202 = vblendps_avx(auVar292,local_4a0,8);
      auVar25 = vsubps_avx(local_490,auVar190);
      auVar190 = vshufps_avx(auVar25,auVar25,0);
      auVar24 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar167._0_4_ = auVar190._0_4_ * fVar185 + auVar24._0_4_ * fVar198 + fVar220 * auVar25._0_4_;
      auVar167._4_4_ = auVar190._4_4_ * fVar338 + auVar24._4_4_ * fVar210 + fVar232 * auVar25._4_4_;
      auVar167._8_4_ = auVar190._8_4_ * fVar197 + auVar24._8_4_ * fVar213 + fVar235 * auVar25._8_4_;
      auVar167._12_4_ =
           auVar190._12_4_ * fVar256 + auVar24._12_4_ * fVar215 + fVar238 * auVar25._12_4_;
      auVar190 = vblendps_avx(auVar167,local_490,8);
      auVar225._8_4_ = 0x7fffffff;
      auVar225._0_8_ = 0x7fffffff7fffffff;
      auVar225._12_4_ = 0x7fffffff;
      auVar226 = vandps_avx(auVar226,auVar225);
      auVar245 = vandps_avx(auVar245,auVar225);
      auVar24 = vmaxps_avx(auVar226,auVar245);
      auVar226 = vandps_avx(auVar202,auVar225);
      auVar245 = vandps_avx(auVar190,auVar225);
      auVar226 = vmaxps_avx(auVar226,auVar245);
      auVar226 = vmaxps_avx(auVar24,auVar226);
      auVar245 = vmovshdup_avx(auVar226);
      auVar245 = vmaxss_avx(auVar245,auVar226);
      auVar226 = vshufpd_avx(auVar226,auVar226,1);
      auVar226 = vmaxss_avx(auVar226,auVar245);
      fVar254 = *(float *)(bezier_basis0 + lVar21 + 0x908);
      fVar255 = *(float *)(bezier_basis0 + lVar21 + 0x90c);
      fVar313 = *(float *)(bezier_basis0 + lVar21 + 0x910);
      fVar343 = *(float *)(bezier_basis0 + lVar21 + 0x914);
      fVar344 = *(float *)(bezier_basis0 + lVar21 + 0x918);
      fVar218 = *(float *)(bezier_basis0 + lVar21 + 0x91c);
      fVar314 = *(float *)(bezier_basis0 + lVar21 + 0x920);
      local_780._0_16_ = auVar292;
      auVar245 = vshufps_avx(auVar292,auVar292,0);
      register0x00001250 = auVar245;
      _local_600 = auVar245;
      auVar202 = vshufps_avx(auVar292,auVar292,0x55);
      register0x00001310 = auVar202;
      _local_5c0 = auVar202;
      fVar185 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      fVar338 = *(float *)(bezier_basis0 + lVar21 + 0xd90);
      fVar197 = *(float *)(bezier_basis0 + lVar21 + 0xd94);
      fVar256 = *(float *)(bezier_basis0 + lVar21 + 0xd98);
      fVar198 = *(float *)(bezier_basis0 + lVar21 + 0xd9c);
      fVar210 = *(float *)(bezier_basis0 + lVar21 + 0xda0);
      fVar213 = *(float *)(bezier_basis0 + lVar21 + 0xda4);
      auVar120 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0xd8c);
      auVar190 = vshufps_avx(auVar167,auVar167,0);
      register0x00001550 = auVar190;
      _local_480 = auVar190;
      fVar334 = auVar190._0_4_;
      fVar269 = auVar190._4_4_;
      fVar280 = auVar190._8_4_;
      fVar282 = auVar190._12_4_;
      fVar162 = auVar245._0_4_;
      fVar180 = auVar245._4_4_;
      fVar181 = auVar245._8_4_;
      fVar183 = auVar245._12_4_;
      auVar245 = vshufps_avx(auVar167,auVar167,0x55);
      register0x00001250 = auVar245;
      _local_7c0 = auVar245;
      fVar160 = auVar245._0_4_;
      fVar241 = auVar245._4_4_;
      fVar182 = auVar245._8_4_;
      fVar184 = auVar245._12_4_;
      fVar221 = auVar202._0_4_;
      fVar233 = auVar202._4_4_;
      fVar236 = auVar202._8_4_;
      fVar239 = auVar202._12_4_;
      auVar245 = vshufps_avx(local_4a0,local_4a0,0xff);
      register0x000014d0 = auVar245;
      _local_80 = auVar245;
      auVar202 = vshufps_avx(local_490,local_490,0xff);
      register0x00001590 = auVar202;
      _local_a0 = auVar202;
      fVar284 = auVar202._0_4_;
      fVar285 = auVar202._4_4_;
      fVar286 = auVar202._8_4_;
      fVar287 = auVar202._12_4_;
      fVar281 = auVar245._0_4_;
      fVar283 = auVar245._4_4_;
      fVar319 = auVar245._8_4_;
      auVar202 = vshufps_avx(auVar275,auVar275,0);
      register0x000015d0 = auVar202;
      _local_580 = auVar202;
      fVar215 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x484);
      fVar220 = *(float *)(bezier_basis0 + lVar21 + 0x488);
      fVar232 = *(float *)(bezier_basis0 + lVar21 + 0x48c);
      fVar235 = *(float *)(bezier_basis0 + lVar21 + 0x490);
      fVar238 = *(float *)(bezier_basis0 + lVar21 + 0x494);
      fVar243 = *(float *)(bezier_basis0 + lVar21 + 0x498);
      fVar253 = *(float *)(bezier_basis0 + lVar21 + 0x49c);
      auVar121 = *(undefined1 (*) [28])(bezier_basis0 + lVar21 + 0x484);
      fVar137 = *(float *)(bezier_basis0 + lVar21 + 0x4a0);
      fVar295 = auVar202._0_4_;
      fVar303 = auVar202._4_4_;
      fVar304 = auVar202._8_4_;
      fVar305 = auVar202._12_4_;
      auVar202 = vshufps_avx(auVar275,auVar275,0x55);
      register0x00001210 = auVar202;
      _local_520 = auVar202;
      fVar136 = auVar202._0_4_;
      fVar150 = auVar202._4_4_;
      fVar152 = auVar202._8_4_;
      fVar258 = auVar202._12_4_;
      auVar24 = vpermilps_avx(local_500,0xff);
      register0x00001310 = auVar24;
      _local_c0 = auVar24;
      fVar222 = auVar24._0_4_;
      fVar234 = auVar24._4_4_;
      fVar237 = auVar24._8_4_;
      auVar111._8_4_ = auVar201._8_4_;
      auVar111._0_8_ = auVar201._0_8_;
      auVar111._12_4_ = auVar201._12_4_;
      auVar202 = vshufps_avx(auVar111,auVar111,0);
      register0x00001510 = auVar202;
      _local_340 = auVar202;
      pauVar9 = (undefined1 (*) [16])(bezier_basis0 + lVar21);
      fVar151 = *(float *)*pauVar9;
      fVar153 = *(float *)(bezier_basis0 + lVar21 + 4);
      fVar154 = *(float *)(bezier_basis0 + lVar21 + 8);
      auVar122 = *(undefined1 (*) [12])*pauVar9;
      fVar156 = *(float *)(bezier_basis0 + lVar21 + 0xc);
      fStack_370 = *(float *)(bezier_basis0 + lVar21 + 0x10);
      fStack_36c = *(float *)(bezier_basis0 + lVar21 + 0x14);
      fStack_368 = *(float *)(bezier_basis0 + lVar21 + 0x18);
      uStack_364 = *(undefined4 *)(bezier_basis0 + lVar21 + 0x1c);
      fVar325 = auVar202._0_4_;
      fVar331 = auVar202._4_4_;
      fVar332 = auVar202._8_4_;
      fVar333 = auVar202._12_4_;
      auVar276._0_4_ = fVar325 * fVar151 + fVar295 * fVar215 + fVar162 * fVar254 + fVar334 * fVar185
      ;
      auVar276._4_4_ = fVar331 * fVar153 + fVar303 * fVar220 + fVar180 * fVar255 + fVar269 * fVar338
      ;
      auVar276._8_4_ = fVar332 * fVar154 + fVar304 * fVar232 + fVar181 * fVar313 + fVar280 * fVar197
      ;
      auVar276._12_4_ =
           fVar333 * fVar156 + fVar305 * fVar235 + fVar183 * fVar343 + fVar282 * fVar256;
      auVar276._16_4_ =
           fVar325 * fStack_370 + fVar295 * fVar238 + fVar162 * fVar344 + fVar334 * fVar198;
      auVar276._20_4_ =
           fVar331 * fStack_36c + fVar303 * fVar243 + fVar180 * fVar218 + fVar269 * fVar210;
      auVar276._24_4_ =
           fVar332 * fStack_368 + fVar304 * fVar253 + fVar181 * fVar314 + fVar280 * fVar213;
      auVar276._28_4_ = fVar137 + fVar183 + 0.0 + 0.0;
      auVar190 = vshufps_avx(auVar111,auVar111,0x55);
      register0x00001410 = auVar190;
      _local_360 = auVar190;
      fVar288 = auVar190._0_4_;
      fVar161 = auVar190._4_4_;
      fVar186 = auVar190._8_4_;
      fVar267 = auVar190._12_4_;
      auVar297._0_4_ = fVar288 * fVar151 + fVar136 * fVar215 + fVar221 * fVar254 + fVar160 * fVar185
      ;
      auVar297._4_4_ = fVar161 * fVar153 + fVar150 * fVar220 + fVar233 * fVar255 + fVar241 * fVar338
      ;
      auVar297._8_4_ = fVar186 * fVar154 + fVar152 * fVar232 + fVar236 * fVar313 + fVar182 * fVar197
      ;
      auVar297._12_4_ =
           fVar267 * fVar156 + fVar258 * fVar235 + fVar239 * fVar343 + fVar184 * fVar256;
      auVar297._16_4_ =
           fVar288 * fStack_370 + fVar136 * fVar238 + fVar221 * fVar344 + fVar160 * fVar198;
      auVar297._20_4_ =
           fVar161 * fStack_36c + fVar150 * fVar243 + fVar233 * fVar218 + fVar241 * fVar210;
      auVar297._24_4_ =
           fVar186 * fStack_368 + fVar152 * fVar253 + fVar236 * fVar314 + fVar182 * fVar213;
      auVar297._28_4_ = fVar258 + fVar184 + 0.0 + 0.0;
      auVar190 = vpermilps_avx(_local_6b0,0xff);
      register0x00001490 = auVar190;
      _local_e0 = auVar190;
      fVar240 = auVar190._0_4_;
      fVar268 = auVar190._4_4_;
      fVar279 = auVar190._8_4_;
      local_840._0_4_ =
           fVar240 * fVar151 + fVar222 * fVar215 + fVar281 * fVar254 + fVar284 * fVar185;
      local_840._4_4_ =
           fVar268 * fVar153 + fVar234 * fVar220 + fVar283 * fVar255 + fVar285 * fVar338;
      fStack_838 = fVar279 * fVar154 + fVar237 * fVar232 + fVar319 * fVar313 + fVar286 * fVar197;
      fStack_834 = auVar190._12_4_ * fVar156 +
                   auVar24._12_4_ * fVar235 + auVar245._12_4_ * fVar343 + fVar287 * fVar256;
      fStack_830 = fVar240 * fStack_370 + fVar222 * fVar238 + fVar281 * fVar344 + fVar284 * fVar198;
      fStack_82c = fVar268 * fStack_36c + fVar234 * fVar243 + fVar283 * fVar218 + fVar285 * fVar210;
      fStack_828 = fVar279 * fStack_368 + fVar237 * fVar253 + fVar319 * fVar314 + fVar286 * fVar213;
      fStack_824 = *(float *)(bezier_basis0 + lVar21 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar151 = *(float *)(bezier_basis1 + lVar21 + 0x908);
      fVar153 = *(float *)(bezier_basis1 + lVar21 + 0x90c);
      fVar154 = *(float *)(bezier_basis1 + lVar21 + 0x910);
      fVar157 = *(float *)(bezier_basis1 + lVar21 + 0x914);
      fVar159 = *(float *)(bezier_basis1 + lVar21 + 0x918);
      fVar242 = *(float *)(bezier_basis1 + lVar21 + 0x91c);
      fVar212 = *(float *)(bezier_basis1 + lVar21 + 0x920);
      fVar185 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar21 + 0xd8c);
      fVar338 = *(float *)(bezier_basis1 + lVar21 + 0xd90);
      fVar197 = *(float *)(bezier_basis1 + lVar21 + 0xd94);
      fVar256 = *(float *)(bezier_basis1 + lVar21 + 0xd98);
      fVar198 = *(float *)(bezier_basis1 + lVar21 + 0xd9c);
      fVar210 = *(float *)(bezier_basis1 + lVar21 + 0xda0);
      fVar213 = *(float *)(bezier_basis1 + lVar21 + 0xda4);
      auVar123 = *(undefined1 (*) [28])(bezier_basis1 + lVar21 + 0xd8c);
      fVar318 = *(float *)(bezier_basis1 + lVar21 + 0x484);
      fVar217 = *(float *)(bezier_basis1 + lVar21 + 0x488);
      fVar320 = *(float *)(bezier_basis1 + lVar21 + 0x48c);
      fVar219 = *(float *)(bezier_basis1 + lVar21 + 0x490);
      fVar321 = *(float *)(bezier_basis1 + lVar21 + 0x494);
      fVar257 = *(float *)(bezier_basis1 + lVar21 + 0x498);
      fVar322 = *(float *)(bezier_basis1 + lVar21 + 0x49c);
      fVar215 = fVar282 + fVar137 + 0.0;
      fVar155 = *(float *)(bezier_basis1 + lVar21);
      fVar323 = *(float *)(bezier_basis1 + lVar21 + 4);
      fVar158 = *(float *)(bezier_basis1 + lVar21 + 8);
      fVar324 = *(float *)(bezier_basis1 + lVar21 + 0xc);
      fVar211 = *(float *)(bezier_basis1 + lVar21 + 0x10);
      fVar214 = *(float *)(bezier_basis1 + lVar21 + 0x14);
      fVar216 = *(float *)(bezier_basis1 + lVar21 + 0x18);
      auVar227._0_4_ = fVar325 * fVar155 + fVar295 * fVar318 + fVar151 * fVar162 + fVar334 * fVar185
      ;
      auVar227._4_4_ = fVar331 * fVar323 + fVar303 * fVar217 + fVar153 * fVar180 + fVar269 * fVar338
      ;
      auVar227._8_4_ = fVar332 * fVar158 + fVar304 * fVar320 + fVar154 * fVar181 + fVar280 * fVar197
      ;
      auVar227._12_4_ =
           fVar333 * fVar324 + fVar305 * fVar219 + fVar157 * fVar183 + fVar282 * fVar256;
      auVar227._16_4_ =
           fVar325 * fVar211 + fVar295 * fVar321 + fVar159 * fVar162 + fVar334 * fVar198;
      auVar227._20_4_ =
           fVar331 * fVar214 + fVar303 * fVar257 + fVar242 * fVar180 + fVar269 * fVar210;
      auVar227._24_4_ =
           fVar332 * fVar216 + fVar304 * fVar322 + fVar212 * fVar181 + fVar280 * fVar213;
      auVar227._28_4_ = fVar287 + fVar215;
      auVar203._0_4_ = fVar288 * fVar155 + fVar136 * fVar318 + fVar221 * fVar151 + fVar185 * fVar160
      ;
      auVar203._4_4_ = fVar161 * fVar323 + fVar150 * fVar217 + fVar233 * fVar153 + fVar338 * fVar241
      ;
      auVar203._8_4_ = fVar186 * fVar158 + fVar152 * fVar320 + fVar236 * fVar154 + fVar197 * fVar182
      ;
      auVar203._12_4_ =
           fVar267 * fVar324 + fVar258 * fVar219 + fVar239 * fVar157 + fVar256 * fVar184;
      auVar203._16_4_ =
           fVar288 * fVar211 + fVar136 * fVar321 + fVar221 * fVar159 + fVar198 * fVar160;
      auVar203._20_4_ =
           fVar161 * fVar214 + fVar150 * fVar257 + fVar233 * fVar242 + fVar210 * fVar241;
      auVar203._24_4_ =
           fVar186 * fVar216 + fVar152 * fVar322 + fVar236 * fVar212 + fVar213 * fVar182;
      auVar203._28_4_ = fVar215 + fVar282 + fVar137 + 0.0;
      local_7a0._0_4_ =
           fVar222 * fVar318 + fVar281 * fVar151 + fVar284 * fVar185 + fVar240 * fVar155;
      local_7a0._4_4_ =
           fVar234 * fVar217 + fVar283 * fVar153 + fVar285 * fVar338 + fVar268 * fVar323;
      local_7a0._8_4_ =
           fVar237 * fVar320 + fVar319 * fVar154 + fVar286 * fVar197 + fVar279 * fVar158;
      local_7a0._12_4_ =
           auVar24._12_4_ * fVar219 + auVar245._12_4_ * fVar157 + fVar287 * fVar256 +
           auVar190._12_4_ * fVar324;
      local_7a0._16_4_ =
           fVar222 * fVar321 + fVar281 * fVar159 + fVar284 * fVar198 + fVar240 * fVar211;
      local_7a0._20_4_ =
           fVar234 * fVar257 + fVar283 * fVar242 + fVar285 * fVar210 + fVar268 * fVar214;
      local_7a0._24_4_ =
           fVar237 * fVar322 + fVar319 * fVar212 + fVar286 * fVar213 + fVar279 * fVar216;
      local_7a0._28_4_ = fVar282 + fVar239 + fVar137 + fVar215;
      auVar32 = vsubps_avx(auVar227,auVar276);
      auVar33 = vsubps_avx(auVar203,auVar297);
      fVar185 = auVar32._0_4_;
      fVar197 = auVar32._4_4_;
      auVar250._4_4_ = auVar297._4_4_ * fVar197;
      auVar250._0_4_ = auVar297._0_4_ * fVar185;
      fVar198 = auVar32._8_4_;
      auVar250._8_4_ = auVar297._8_4_ * fVar198;
      fVar213 = auVar32._12_4_;
      auVar250._12_4_ = auVar297._12_4_ * fVar213;
      fVar220 = auVar32._16_4_;
      auVar250._16_4_ = auVar297._16_4_ * fVar220;
      fVar235 = auVar32._20_4_;
      auVar250._20_4_ = auVar297._20_4_ * fVar235;
      fVar243 = auVar32._24_4_;
      auVar250._24_4_ = auVar297._24_4_ * fVar243;
      auVar250._28_4_ = fVar215;
      fVar338 = auVar33._0_4_;
      fVar256 = auVar33._4_4_;
      auVar178._4_4_ = auVar276._4_4_ * fVar256;
      auVar178._0_4_ = auVar276._0_4_ * fVar338;
      fVar210 = auVar33._8_4_;
      auVar178._8_4_ = auVar276._8_4_ * fVar210;
      fVar215 = auVar33._12_4_;
      auVar178._12_4_ = auVar276._12_4_ * fVar215;
      fVar232 = auVar33._16_4_;
      auVar178._16_4_ = auVar276._16_4_ * fVar232;
      fVar238 = auVar33._20_4_;
      auVar178._20_4_ = auVar276._20_4_ * fVar238;
      fVar253 = auVar33._24_4_;
      auVar178._24_4_ = auVar276._24_4_ * fVar253;
      auVar178._28_4_ = auVar203._28_4_;
      auVar178 = vsubps_avx(auVar250,auVar178);
      auVar250 = vmaxps_avx(_local_840,local_7a0);
      auVar39._4_4_ = auVar250._4_4_ * auVar250._4_4_ * (fVar197 * fVar197 + fVar256 * fVar256);
      auVar39._0_4_ = auVar250._0_4_ * auVar250._0_4_ * (fVar185 * fVar185 + fVar338 * fVar338);
      auVar39._8_4_ = auVar250._8_4_ * auVar250._8_4_ * (fVar198 * fVar198 + fVar210 * fVar210);
      auVar39._12_4_ = auVar250._12_4_ * auVar250._12_4_ * (fVar213 * fVar213 + fVar215 * fVar215);
      auVar39._16_4_ = auVar250._16_4_ * auVar250._16_4_ * (fVar220 * fVar220 + fVar232 * fVar232);
      auVar39._20_4_ = auVar250._20_4_ * auVar250._20_4_ * (fVar235 * fVar235 + fVar238 * fVar238);
      auVar39._24_4_ = auVar250._24_4_ * auVar250._24_4_ * (fVar243 * fVar243 + fVar253 * fVar253);
      auVar39._28_4_ = auVar227._28_4_ + auVar203._28_4_;
      auVar22._4_4_ = auVar178._4_4_ * auVar178._4_4_;
      auVar22._0_4_ = auVar178._0_4_ * auVar178._0_4_;
      auVar22._8_4_ = auVar178._8_4_ * auVar178._8_4_;
      auVar22._12_4_ = auVar178._12_4_ * auVar178._12_4_;
      auVar22._16_4_ = auVar178._16_4_ * auVar178._16_4_;
      auVar22._20_4_ = auVar178._20_4_ * auVar178._20_4_;
      auVar22._24_4_ = auVar178._24_4_ * auVar178._24_4_;
      auVar22._28_4_ = auVar178._28_4_;
      auVar250 = vcmpps_avx(auVar22,auVar39,2);
      local_5d0._0_4_ = (undefined4)(int)uVar15;
      local_5d0._4_12_ = auVar202._4_12_;
      auVar245 = vshufps_avx(local_5d0,local_5d0,0);
      auVar204._16_16_ = auVar245;
      auVar204._0_16_ = auVar245;
      auVar178 = vcmpps_avx(_DAT_02020f40,auVar204,1);
      auVar209 = ZEXT3264(auVar178);
      auVar112._8_4_ = auVar201._8_4_;
      auVar112._0_8_ = auVar201._0_8_;
      auVar112._12_4_ = auVar201._12_4_;
      auVar245 = vpermilps_avx(auVar112,0xaa);
      register0x000013d0 = auVar245;
      _local_160 = auVar245;
      auVar202 = vpermilps_avx(auVar275,0xaa);
      register0x00001550 = auVar202;
      _local_320 = auVar202;
      auVar190 = vpermilps_avx(auVar292,0xaa);
      register0x00001590 = auVar190;
      _local_100 = auVar190;
      auVar24 = vpermilps_avx(auVar167,0xaa);
      register0x00001310 = auVar24;
      _local_660 = auVar24;
      auVar39 = auVar178 & auVar250;
      uVar131 = *(uint *)(ray + k * 4 + 0x30);
      auVar226 = ZEXT416((uint)(auVar226._0_4_ * 4.7683716e-07));
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0x7f,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar39 >> 0xbf,0) == '\0') &&
          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar39[0x1f])
      {
        uVar133 = 0;
        auVar317 = ZEXT3264(_local_7c0);
      }
      else {
        auVar250 = vandps_avx(auVar250,auVar178);
        fVar268 = auVar245._0_4_;
        fVar279 = auVar245._4_4_;
        fVar281 = auVar245._8_4_;
        fVar283 = auVar245._12_4_;
        fVar319 = auVar202._0_4_;
        fVar284 = auVar202._4_4_;
        fVar285 = auVar202._8_4_;
        fVar286 = auVar202._12_4_;
        fVar287 = auVar190._0_4_;
        fVar306 = auVar190._4_4_;
        fVar307 = auVar190._8_4_;
        fVar308 = auVar190._12_4_;
        local_4c0._0_4_ = auVar123._0_4_;
        local_4c0._4_4_ = auVar123._4_4_;
        fStack_4b8 = auVar123._8_4_;
        fStack_4b4 = auVar123._12_4_;
        fStack_4b0 = auVar123._16_4_;
        fStack_4ac = auVar123._20_4_;
        fStack_4a8 = auVar123._24_4_;
        fVar222 = auVar24._0_4_;
        fVar234 = auVar24._4_4_;
        fVar237 = auVar24._8_4_;
        fVar240 = auVar24._12_4_;
        fVar185 = auVar178._28_4_ +
                  *(float *)(bezier_basis1 + lVar21 + 0x924) +
                  *(float *)(bezier_basis1 + lVar21 + 0x4a0);
        local_780._0_16_ = auVar226;
        local_4c0._0_4_ =
             fVar268 * fVar155 +
             fVar319 * fVar318 + fVar287 * fVar151 + fVar222 * (float)local_4c0._0_4_;
        local_4c0._4_4_ =
             fVar279 * fVar323 +
             fVar284 * fVar217 + fVar306 * fVar153 + fVar234 * (float)local_4c0._4_4_;
        fStack_4b8 = fVar281 * fVar158 +
                     fVar285 * fVar320 + fVar307 * fVar154 + fVar237 * fStack_4b8;
        fStack_4b4 = fVar283 * fVar324 +
                     fVar286 * fVar219 + fVar308 * fVar157 + fVar240 * fStack_4b4;
        fStack_4b0 = fVar268 * fVar211 +
                     fVar319 * fVar321 + fVar287 * fVar159 + fVar222 * fStack_4b0;
        fStack_4ac = fVar279 * fVar214 +
                     fVar284 * fVar257 + fVar306 * fVar242 + fVar234 * fStack_4ac;
        fStack_4a8 = fVar281 * fVar216 +
                     fVar285 * fVar322 + fVar307 * fVar212 + fVar237 * fStack_4a8;
        fStack_4a4 = auVar250._28_4_ + fVar185;
        local_380._0_4_ = auVar122._0_4_;
        local_380._4_4_ = auVar122._4_4_;
        fStack_378 = auVar122._8_4_;
        local_5a0._0_4_ = auVar121._0_4_;
        local_5a0._4_4_ = auVar121._4_4_;
        fStack_598 = auVar121._8_4_;
        fStack_594 = auVar121._12_4_;
        fStack_590 = auVar121._16_4_;
        fStack_58c = auVar121._20_4_;
        fStack_588 = auVar121._24_4_;
        local_760._0_4_ = auVar120._0_4_;
        local_760._4_4_ = auVar120._4_4_;
        uStack_758._0_4_ = auVar120._8_4_;
        uStack_758._4_4_ = auVar120._12_4_;
        fStack_750 = auVar120._16_4_;
        fStack_74c = auVar120._20_4_;
        fStack_748 = auVar120._24_4_;
        fVar212 = fVar268 * (float)local_380._0_4_ +
                  fVar319 * (float)local_5a0._0_4_ +
                  fVar287 * fVar254 + fVar222 * (float)local_760._0_4_;
        fVar217 = fVar279 * (float)local_380._4_4_ +
                  fVar284 * (float)local_5a0._4_4_ +
                  fVar306 * fVar255 + fVar234 * (float)local_760._4_4_;
        fVar219 = fVar281 * fStack_378 +
                  fVar285 * fStack_598 + fVar307 * fVar313 + fVar237 * (float)uStack_758;
        fVar257 = fVar283 * fVar156 +
                  fVar286 * fStack_594 + fVar308 * fVar343 + fVar240 * uStack_758._4_4_;
        fStack_730 = fVar268 * fStack_370 +
                     fVar319 * fStack_590 + fVar287 * fVar344 + fVar222 * fStack_750;
        fStack_72c = fVar279 * fStack_36c +
                     fVar284 * fStack_58c + fVar306 * fVar218 + fVar234 * fStack_74c;
        fStack_728 = fVar281 * fStack_368 +
                     fVar285 * fStack_588 + fVar307 * fVar314 + fVar237 * fStack_748;
        fStack_724 = fStack_4a4 + fVar185 + auVar250._28_4_ + auVar178._28_4_;
        fVar185 = *(float *)(bezier_basis0 + lVar21 + 0x1210);
        fVar338 = *(float *)(bezier_basis0 + lVar21 + 0x1214);
        fVar197 = *(float *)(bezier_basis0 + lVar21 + 0x1218);
        fVar256 = *(float *)(bezier_basis0 + lVar21 + 0x121c);
        fVar198 = *(float *)(bezier_basis0 + lVar21 + 0x1220);
        fVar210 = *(float *)(bezier_basis0 + lVar21 + 0x1224);
        fVar213 = *(float *)(bezier_basis0 + lVar21 + 0x1228);
        fVar215 = *(float *)(bezier_basis0 + lVar21 + 0x1694);
        fVar220 = *(float *)(bezier_basis0 + lVar21 + 0x1698);
        fVar232 = *(float *)(bezier_basis0 + lVar21 + 0x169c);
        fVar235 = *(float *)(bezier_basis0 + lVar21 + 0x16a0);
        fVar238 = *(float *)(bezier_basis0 + lVar21 + 0x16a4);
        fVar243 = *(float *)(bezier_basis0 + lVar21 + 0x16a8);
        fVar253 = *(float *)(bezier_basis0 + lVar21 + 0x16ac);
        fVar254 = *(float *)(bezier_basis0 + lVar21 + 0x1b18);
        fVar255 = *(float *)(bezier_basis0 + lVar21 + 0x1b1c);
        fVar313 = *(float *)(bezier_basis0 + lVar21 + 0x1b20);
        fVar343 = *(float *)(bezier_basis0 + lVar21 + 0x1b24);
        fVar344 = *(float *)(bezier_basis0 + lVar21 + 0x1b28);
        fVar218 = *(float *)(bezier_basis0 + lVar21 + 0x1b2c);
        fVar314 = *(float *)(bezier_basis0 + lVar21 + 0x1b30);
        fVar137 = *(float *)(bezier_basis0 + lVar21 + 0x1f9c);
        fVar151 = *(float *)(bezier_basis0 + lVar21 + 0x1fa0);
        fVar153 = *(float *)(bezier_basis0 + lVar21 + 0x1fa4);
        fVar154 = *(float *)(bezier_basis0 + lVar21 + 0x1fa8);
        fVar156 = *(float *)(bezier_basis0 + lVar21 + 0x1fac);
        fVar157 = *(float *)(bezier_basis0 + lVar21 + 0x1fb0);
        fVar159 = *(float *)(bezier_basis0 + lVar21 + 0x1fb4);
        fVar318 = auVar297._28_4_ + *(float *)(bezier_basis1 + lVar21 + 0x4a0);
        fVar242 = *(float *)(bezier_basis0 + lVar21 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar21 + 0x1fb8);
        fVar320 = *(float *)(bezier_basis0 + lVar21 + 0x16b0) + fVar242;
        local_5a0._4_4_ =
             fVar331 * fVar338 + fVar303 * fVar220 + fVar180 * fVar255 + fVar269 * fVar151;
        local_5a0._0_4_ =
             fVar325 * fVar185 + fVar295 * fVar215 + fVar162 * fVar254 + fVar334 * fVar137;
        fStack_598 = fVar332 * fVar197 + fVar304 * fVar232 + fVar181 * fVar313 + fVar280 * fVar153;
        fStack_594 = fVar333 * fVar256 + fVar305 * fVar235 + fVar183 * fVar343 + fVar282 * fVar154;
        fStack_590 = fVar325 * fVar198 + fVar295 * fVar238 + fVar162 * fVar344 + fVar334 * fVar156;
        fStack_58c = fVar331 * fVar210 + fVar303 * fVar243 + fVar180 * fVar218 + fVar269 * fVar157;
        fStack_588 = fVar332 * fVar213 + fVar304 * fVar253 + fVar181 * fVar314 + fVar280 * fVar159;
        fStack_584 = *(float *)(bezier_basis0 + lVar21 + 0x16b0) +
                     *(float *)(bezier_basis0 + lVar21 + 0x1fb8) + fVar318;
        auVar173._0_4_ =
             fVar288 * fVar185 + fVar136 * fVar215 + fVar221 * fVar254 + fVar160 * fVar137;
        auVar173._4_4_ =
             fVar161 * fVar338 + fVar150 * fVar220 + fVar233 * fVar255 + fVar241 * fVar151;
        auVar173._8_4_ =
             fVar186 * fVar197 + fVar152 * fVar232 + fVar236 * fVar313 + fVar182 * fVar153;
        auVar173._12_4_ =
             fVar267 * fVar256 + fVar258 * fVar235 + fVar239 * fVar343 + fVar184 * fVar154;
        auVar173._16_4_ =
             fVar288 * fVar198 + fVar136 * fVar238 + fVar221 * fVar344 + fVar160 * fVar156;
        auVar173._20_4_ =
             fVar161 * fVar210 + fVar150 * fVar243 + fVar233 * fVar218 + fVar241 * fVar157;
        auVar173._24_4_ =
             fVar186 * fVar213 + fVar152 * fVar253 + fVar236 * fVar314 + fVar182 * fVar159;
        auVar173._28_4_ =
             fVar242 + fVar318 + auVar297._28_4_ + *(float *)(bezier_basis1 + lVar21 + 0x1c);
        auVar246._0_4_ =
             fVar268 * fVar185 + fVar319 * fVar215 + fVar287 * fVar254 + fVar222 * fVar137;
        auVar246._4_4_ =
             fVar279 * fVar338 + fVar284 * fVar220 + fVar306 * fVar255 + fVar234 * fVar151;
        auVar246._8_4_ =
             fVar281 * fVar197 + fVar285 * fVar232 + fVar307 * fVar313 + fVar237 * fVar153;
        auVar246._12_4_ =
             fVar283 * fVar256 + fVar286 * fVar235 + fVar308 * fVar343 + fVar240 * fVar154;
        auVar246._16_4_ =
             fVar268 * fVar198 + fVar319 * fVar238 + fVar287 * fVar344 + fVar222 * fVar156;
        auVar246._20_4_ =
             fVar279 * fVar210 + fVar284 * fVar243 + fVar306 * fVar218 + fVar234 * fVar157;
        auVar246._24_4_ =
             fVar281 * fVar213 + fVar285 * fVar253 + fVar307 * fVar314 + fVar237 * fVar159;
        auVar246._28_4_ = *(float *)(bezier_basis0 + lVar21 + 0x122c) + fVar320;
        fVar185 = *(float *)(bezier_basis1 + lVar21 + 0x1b18);
        fVar338 = *(float *)(bezier_basis1 + lVar21 + 0x1b1c);
        fVar197 = *(float *)(bezier_basis1 + lVar21 + 0x1b20);
        fVar256 = *(float *)(bezier_basis1 + lVar21 + 0x1b24);
        fVar198 = *(float *)(bezier_basis1 + lVar21 + 0x1b28);
        fVar210 = *(float *)(bezier_basis1 + lVar21 + 0x1b2c);
        fVar213 = *(float *)(bezier_basis1 + lVar21 + 0x1b30);
        fVar215 = *(float *)(bezier_basis1 + lVar21 + 0x1f9c);
        fVar220 = *(float *)(bezier_basis1 + lVar21 + 0x1fa0);
        fVar232 = *(float *)(bezier_basis1 + lVar21 + 0x1fa4);
        fVar235 = *(float *)(bezier_basis1 + lVar21 + 0x1fa8);
        fVar238 = *(float *)(bezier_basis1 + lVar21 + 0x1fac);
        fVar243 = *(float *)(bezier_basis1 + lVar21 + 0x1fb0);
        fVar253 = *(float *)(bezier_basis1 + lVar21 + 0x1fb4);
        fVar254 = *(float *)(bezier_basis1 + lVar21 + 0x1694);
        fVar255 = *(float *)(bezier_basis1 + lVar21 + 0x1698);
        fVar313 = *(float *)(bezier_basis1 + lVar21 + 0x169c);
        fVar343 = *(float *)(bezier_basis1 + lVar21 + 0x16a0);
        fVar344 = *(float *)(bezier_basis1 + lVar21 + 0x16a4);
        fVar218 = *(float *)(bezier_basis1 + lVar21 + 0x16a8);
        fVar314 = *(float *)(bezier_basis1 + lVar21 + 0x16ac);
        fVar137 = *(float *)(bezier_basis1 + lVar21 + 0x1210);
        fVar151 = *(float *)(bezier_basis1 + lVar21 + 0x1214);
        fVar153 = *(float *)(bezier_basis1 + lVar21 + 0x1218);
        fVar154 = *(float *)(bezier_basis1 + lVar21 + 0x121c);
        fVar156 = *(float *)(bezier_basis1 + lVar21 + 0x1220);
        fVar157 = *(float *)(bezier_basis1 + lVar21 + 0x1224);
        fVar159 = *(float *)(bezier_basis1 + lVar21 + 0x1228);
        auVar262._0_4_ =
             fVar137 * fVar325 + fVar295 * fVar254 + fVar162 * fVar185 + fVar334 * fVar215;
        auVar262._4_4_ =
             fVar151 * fVar331 + fVar303 * fVar255 + fVar180 * fVar338 + fVar269 * fVar220;
        auVar262._8_4_ =
             fVar153 * fVar332 + fVar304 * fVar313 + fVar181 * fVar197 + fVar280 * fVar232;
        auVar262._12_4_ =
             fVar154 * fVar333 + fVar305 * fVar343 + fVar183 * fVar256 + fVar282 * fVar235;
        auVar262._16_4_ =
             fVar156 * fVar325 + fVar295 * fVar344 + fVar162 * fVar198 + fVar334 * fVar238;
        auVar262._20_4_ =
             fVar157 * fVar331 + fVar303 * fVar218 + fVar180 * fVar210 + fVar269 * fVar243;
        auVar262._24_4_ =
             fVar159 * fVar332 + fVar304 * fVar314 + fVar181 * fVar213 + fVar280 * fVar253;
        auVar262._28_4_ = fVar183 + fVar183 + fVar333 + fVar320;
        auVar298._0_4_ =
             fVar288 * fVar137 + fVar136 * fVar254 + fVar221 * fVar185 + fVar160 * fVar215;
        auVar298._4_4_ =
             fVar161 * fVar151 + fVar150 * fVar255 + fVar233 * fVar338 + fVar241 * fVar220;
        auVar298._8_4_ =
             fVar186 * fVar153 + fVar152 * fVar313 + fVar236 * fVar197 + fVar182 * fVar232;
        auVar298._12_4_ =
             fVar267 * fVar154 + fVar258 * fVar343 + fVar239 * fVar256 + fVar184 * fVar235;
        auVar298._16_4_ =
             fVar288 * fVar156 + fVar136 * fVar344 + fVar221 * fVar198 + fVar160 * fVar238;
        auVar298._20_4_ =
             fVar161 * fVar157 + fVar150 * fVar218 + fVar233 * fVar210 + fVar241 * fVar243;
        auVar298._24_4_ =
             fVar186 * fVar159 + fVar152 * fVar314 + fVar236 * fVar213 + fVar182 * fVar253;
        auVar298._28_4_ = fVar183 + fVar183 + fVar183 + fVar333;
        auVar196._0_4_ =
             fVar268 * fVar137 + fVar319 * fVar254 + fVar287 * fVar185 + fVar215 * fVar222;
        auVar196._4_4_ =
             fVar279 * fVar151 + fVar284 * fVar255 + fVar306 * fVar338 + fVar220 * fVar234;
        auVar196._8_4_ =
             fVar281 * fVar153 + fVar285 * fVar313 + fVar307 * fVar197 + fVar232 * fVar237;
        auVar196._12_4_ =
             fVar283 * fVar154 + fVar286 * fVar343 + fVar308 * fVar256 + fVar235 * fVar240;
        auVar196._16_4_ =
             fVar268 * fVar156 + fVar319 * fVar344 + fVar287 * fVar198 + fVar238 * fVar222;
        auVar196._20_4_ =
             fVar279 * fVar157 + fVar284 * fVar218 + fVar306 * fVar210 + fVar243 * fVar234;
        auVar196._24_4_ =
             fVar281 * fVar159 + fVar285 * fVar314 + fVar307 * fVar213 + fVar253 * fVar237;
        auVar196._28_4_ =
             *(float *)(bezier_basis1 + lVar21 + 0x122c) +
             *(float *)(bezier_basis1 + lVar21 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar21 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar21 + 0x1fb8);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar178 = vandps_avx(_local_5a0,auVar228);
        auVar39 = vandps_avx(auVar173,auVar228);
        auVar39 = vmaxps_avx(auVar178,auVar39);
        auVar178 = vandps_avx(auVar246,auVar228);
        auVar178 = vmaxps_avx(auVar39,auVar178);
        auVar226 = vpermilps_avx(auVar226,0);
        auVar247._16_16_ = auVar226;
        auVar247._0_16_ = auVar226;
        auVar178 = vcmpps_avx(auVar178,auVar247,1);
        auVar22 = vblendvps_avx(_local_5a0,auVar32,auVar178);
        auVar204 = vblendvps_avx(auVar173,auVar33,auVar178);
        auVar178 = vandps_avx(auVar262,auVar228);
        auVar39 = vandps_avx(auVar298,auVar228);
        auVar23 = vmaxps_avx(auVar178,auVar39);
        auVar178 = vandps_avx(auVar196,auVar228);
        auVar178 = vmaxps_avx(auVar23,auVar178);
        auVar23 = vcmpps_avx(auVar178,auVar247,1);
        auVar178 = vblendvps_avx(auVar262,auVar32,auVar23);
        auVar32 = vblendvps_avx(auVar298,auVar33,auVar23);
        fVar318 = auVar22._0_4_;
        fVar320 = auVar22._4_4_;
        fVar321 = auVar22._8_4_;
        fVar322 = auVar22._12_4_;
        fVar155 = auVar22._16_4_;
        fVar323 = auVar22._20_4_;
        fVar158 = auVar22._24_4_;
        fVar258 = -auVar22._28_4_;
        fVar324 = auVar178._0_4_;
        fVar211 = auVar178._4_4_;
        fVar214 = auVar178._8_4_;
        fVar216 = auVar178._12_4_;
        fVar136 = auVar178._16_4_;
        fVar150 = auVar178._20_4_;
        fVar152 = auVar178._24_4_;
        fVar185 = auVar204._0_4_;
        fVar198 = auVar204._4_4_;
        fVar220 = auVar204._8_4_;
        fVar243 = auVar204._12_4_;
        fVar313 = auVar204._16_4_;
        fVar314 = auVar204._20_4_;
        fVar154 = auVar204._24_4_;
        auVar143._0_4_ = fVar185 * fVar185 + fVar318 * fVar318;
        auVar143._4_4_ = fVar198 * fVar198 + fVar320 * fVar320;
        auVar143._8_4_ = fVar220 * fVar220 + fVar321 * fVar321;
        auVar143._12_4_ = fVar243 * fVar243 + fVar322 * fVar322;
        auVar143._16_4_ = fVar313 * fVar313 + fVar155 * fVar155;
        auVar143._20_4_ = fVar314 * fVar314 + fVar323 * fVar323;
        auVar143._24_4_ = fVar154 * fVar154 + fVar158 * fVar158;
        auVar143._28_4_ = auVar298._28_4_ + auVar22._28_4_;
        auVar33 = vrsqrtps_avx(auVar143);
        fVar338 = auVar33._0_4_;
        fVar197 = auVar33._4_4_;
        auVar23._4_4_ = fVar197 * 1.5;
        auVar23._0_4_ = fVar338 * 1.5;
        fVar256 = auVar33._8_4_;
        auVar23._8_4_ = fVar256 * 1.5;
        fVar210 = auVar33._12_4_;
        auVar23._12_4_ = fVar210 * 1.5;
        fVar213 = auVar33._16_4_;
        auVar23._16_4_ = fVar213 * 1.5;
        fVar215 = auVar33._20_4_;
        auVar23._20_4_ = fVar215 * 1.5;
        fVar232 = auVar33._24_4_;
        fVar242 = auVar39._28_4_;
        auVar23._24_4_ = fVar232 * 1.5;
        auVar23._28_4_ = fVar242;
        auVar33._4_4_ = fVar197 * fVar197 * fVar197 * auVar143._4_4_ * 0.5;
        auVar33._0_4_ = fVar338 * fVar338 * fVar338 * auVar143._0_4_ * 0.5;
        auVar33._8_4_ = fVar256 * fVar256 * fVar256 * auVar143._8_4_ * 0.5;
        auVar33._12_4_ = fVar210 * fVar210 * fVar210 * auVar143._12_4_ * 0.5;
        auVar33._16_4_ = fVar213 * fVar213 * fVar213 * auVar143._16_4_ * 0.5;
        auVar33._20_4_ = fVar215 * fVar215 * fVar215 * auVar143._20_4_ * 0.5;
        auVar33._24_4_ = fVar232 * fVar232 * fVar232 * auVar143._24_4_ * 0.5;
        auVar33._28_4_ = auVar143._28_4_;
        auVar33 = vsubps_avx(auVar23,auVar33);
        fVar338 = auVar33._0_4_;
        fVar210 = auVar33._4_4_;
        fVar232 = auVar33._8_4_;
        fVar253 = auVar33._12_4_;
        fVar343 = auVar33._16_4_;
        fVar137 = auVar33._20_4_;
        fVar156 = auVar33._24_4_;
        fVar197 = auVar32._0_4_;
        fVar213 = auVar32._4_4_;
        fVar235 = auVar32._8_4_;
        fVar254 = auVar32._12_4_;
        fVar344 = auVar32._16_4_;
        fVar151 = auVar32._20_4_;
        fVar157 = auVar32._24_4_;
        auVar144._0_4_ = fVar197 * fVar197 + fVar324 * fVar324;
        auVar144._4_4_ = fVar213 * fVar213 + fVar211 * fVar211;
        auVar144._8_4_ = fVar235 * fVar235 + fVar214 * fVar214;
        auVar144._12_4_ = fVar254 * fVar254 + fVar216 * fVar216;
        auVar144._16_4_ = fVar344 * fVar344 + fVar136 * fVar136;
        auVar144._20_4_ = fVar151 * fVar151 + fVar150 * fVar150;
        auVar144._24_4_ = fVar157 * fVar157 + fVar152 * fVar152;
        auVar144._28_4_ = auVar178._28_4_ + auVar33._28_4_;
        auVar178 = vrsqrtps_avx(auVar144);
        fVar256 = auVar178._0_4_;
        fVar215 = auVar178._4_4_;
        auVar34._4_4_ = fVar215 * 1.5;
        auVar34._0_4_ = fVar256 * 1.5;
        fVar238 = auVar178._8_4_;
        auVar34._8_4_ = fVar238 * 1.5;
        fVar255 = auVar178._12_4_;
        auVar34._12_4_ = fVar255 * 1.5;
        fVar218 = auVar178._16_4_;
        auVar34._16_4_ = fVar218 * 1.5;
        fVar153 = auVar178._20_4_;
        auVar34._20_4_ = fVar153 * 1.5;
        fVar159 = auVar178._24_4_;
        auVar34._24_4_ = fVar159 * 1.5;
        auVar34._28_4_ = fVar242;
        auVar35._4_4_ = fVar215 * fVar215 * fVar215 * auVar144._4_4_ * 0.5;
        auVar35._0_4_ = fVar256 * fVar256 * fVar256 * auVar144._0_4_ * 0.5;
        auVar35._8_4_ = fVar238 * fVar238 * fVar238 * auVar144._8_4_ * 0.5;
        auVar35._12_4_ = fVar255 * fVar255 * fVar255 * auVar144._12_4_ * 0.5;
        auVar35._16_4_ = fVar218 * fVar218 * fVar218 * auVar144._16_4_ * 0.5;
        auVar35._20_4_ = fVar153 * fVar153 * fVar153 * auVar144._20_4_ * 0.5;
        auVar35._24_4_ = fVar159 * fVar159 * fVar159 * auVar144._24_4_ * 0.5;
        auVar35._28_4_ = auVar144._28_4_;
        auVar178 = vsubps_avx(auVar34,auVar35);
        fVar256 = auVar178._0_4_;
        fVar215 = auVar178._4_4_;
        fVar238 = auVar178._8_4_;
        fVar255 = auVar178._12_4_;
        fVar218 = auVar178._16_4_;
        fVar153 = auVar178._20_4_;
        fVar159 = auVar178._24_4_;
        fVar185 = (float)local_840._0_4_ * fVar185 * fVar338;
        fVar198 = (float)local_840._4_4_ * fVar198 * fVar210;
        auVar36._4_4_ = fVar198;
        auVar36._0_4_ = fVar185;
        fVar220 = fStack_838 * fVar220 * fVar232;
        auVar36._8_4_ = fVar220;
        fVar243 = fStack_834 * fVar243 * fVar253;
        auVar36._12_4_ = fVar243;
        fVar313 = fStack_830 * fVar313 * fVar343;
        auVar36._16_4_ = fVar313;
        fVar314 = fStack_82c * fVar314 * fVar137;
        auVar36._20_4_ = fVar314;
        fVar154 = fStack_828 * fVar154 * fVar156;
        auVar36._24_4_ = fVar154;
        auVar36._28_4_ = fVar242;
        local_760._4_4_ = fVar198 + auVar276._4_4_;
        local_760._0_4_ = fVar185 + auVar276._0_4_;
        uStack_758._0_4_ = fVar220 + auVar276._8_4_;
        uStack_758._4_4_ = fVar243 + auVar276._12_4_;
        fStack_750 = fVar313 + auVar276._16_4_;
        fStack_74c = fVar314 + auVar276._20_4_;
        fStack_748 = fVar154 + auVar276._24_4_;
        fStack_744 = fVar242 + auVar276._28_4_;
        fVar185 = (float)local_840._0_4_ * fVar338 * -fVar318;
        fVar198 = (float)local_840._4_4_ * fVar210 * -fVar320;
        auVar37._4_4_ = fVar198;
        auVar37._0_4_ = fVar185;
        fVar220 = fStack_838 * fVar232 * -fVar321;
        auVar37._8_4_ = fVar220;
        fVar243 = fStack_834 * fVar253 * -fVar322;
        auVar37._12_4_ = fVar243;
        fVar313 = fStack_830 * fVar343 * -fVar155;
        auVar37._16_4_ = fVar313;
        fVar314 = fStack_82c * fVar137 * -fVar323;
        auVar37._20_4_ = fVar314;
        fVar154 = fStack_828 * fVar156 * -fVar158;
        auVar37._24_4_ = fVar154;
        auVar37._28_4_ = fVar258;
        local_640._4_4_ = auVar297._4_4_ + fVar198;
        local_640._0_4_ = auVar297._0_4_ + fVar185;
        uStack_638._0_4_ = auVar297._8_4_ + fVar220;
        uStack_638._4_4_ = auVar297._12_4_ + fVar243;
        fStack_630 = auVar297._16_4_ + fVar313;
        fStack_62c = auVar297._20_4_ + fVar314;
        fStack_628 = auVar297._24_4_ + fVar154;
        fStack_624 = auVar297._28_4_ + fVar258;
        fVar185 = fVar338 * 0.0 * (float)local_840._0_4_;
        fVar338 = fVar210 * 0.0 * (float)local_840._4_4_;
        auVar38._4_4_ = fVar338;
        auVar38._0_4_ = fVar185;
        fVar198 = fVar232 * 0.0 * fStack_838;
        auVar38._8_4_ = fVar198;
        fVar210 = fVar253 * 0.0 * fStack_834;
        auVar38._12_4_ = fVar210;
        fVar220 = fVar343 * 0.0 * fStack_830;
        auVar38._16_4_ = fVar220;
        fVar232 = fVar137 * 0.0 * fStack_82c;
        auVar38._20_4_ = fVar232;
        fVar243 = fVar156 * 0.0 * fStack_828;
        auVar38._24_4_ = fVar243;
        auVar38._28_4_ = fVar286;
        auVar118._4_4_ = fVar217;
        auVar118._0_4_ = fVar212;
        auVar118._8_4_ = fVar219;
        auVar118._12_4_ = fVar257;
        auVar118._16_4_ = fStack_730;
        auVar118._20_4_ = fStack_72c;
        auVar118._24_4_ = fStack_728;
        auVar118._28_4_ = fStack_724;
        auVar263._0_4_ = fVar212 + fVar185;
        auVar263._4_4_ = fVar217 + fVar338;
        auVar263._8_4_ = fVar219 + fVar198;
        auVar263._12_4_ = fVar257 + fVar210;
        auVar263._16_4_ = fStack_730 + fVar220;
        auVar263._20_4_ = fStack_72c + fVar232;
        auVar263._24_4_ = fStack_728 + fVar243;
        auVar263._28_4_ = fStack_724 + fVar286;
        fVar185 = local_7a0._0_4_ * fVar197 * fVar256;
        fVar338 = local_7a0._4_4_ * fVar213 * fVar215;
        auVar40._4_4_ = fVar338;
        auVar40._0_4_ = fVar185;
        fVar197 = local_7a0._8_4_ * fVar235 * fVar238;
        auVar40._8_4_ = fVar197;
        fVar198 = local_7a0._12_4_ * fVar254 * fVar255;
        auVar40._12_4_ = fVar198;
        fVar210 = local_7a0._16_4_ * fVar344 * fVar218;
        auVar40._16_4_ = fVar210;
        fVar213 = local_7a0._20_4_ * fVar151 * fVar153;
        auVar40._20_4_ = fVar213;
        fVar220 = local_7a0._24_4_ * fVar157 * fVar159;
        auVar40._24_4_ = fVar220;
        auVar40._28_4_ = auVar32._28_4_;
        auVar204 = vsubps_avx(auVar276,auVar36);
        auVar310._0_4_ = auVar227._0_4_ + fVar185;
        auVar310._4_4_ = auVar227._4_4_ + fVar338;
        auVar310._8_4_ = auVar227._8_4_ + fVar197;
        auVar310._12_4_ = auVar227._12_4_ + fVar198;
        auVar310._16_4_ = auVar227._16_4_ + fVar210;
        auVar310._20_4_ = auVar227._20_4_ + fVar213;
        auVar310._24_4_ = auVar227._24_4_ + fVar220;
        auVar310._28_4_ = auVar227._28_4_ + auVar32._28_4_;
        fVar185 = local_7a0._0_4_ * fVar256 * -fVar324;
        fVar338 = local_7a0._4_4_ * fVar215 * -fVar211;
        auVar32._4_4_ = fVar338;
        auVar32._0_4_ = fVar185;
        fVar197 = local_7a0._8_4_ * fVar238 * -fVar214;
        auVar32._8_4_ = fVar197;
        fVar198 = local_7a0._12_4_ * fVar255 * -fVar216;
        auVar32._12_4_ = fVar198;
        fVar210 = local_7a0._16_4_ * fVar218 * -fVar136;
        auVar32._16_4_ = fVar210;
        fVar213 = local_7a0._20_4_ * fVar153 * -fVar150;
        auVar32._20_4_ = fVar213;
        fVar220 = local_7a0._24_4_ * fVar159 * -fVar152;
        auVar32._24_4_ = fVar220;
        auVar32._28_4_ = fVar308;
        auVar276 = vsubps_avx(auVar297,auVar37);
        auVar316._0_4_ = fVar185 + auVar203._0_4_;
        auVar316._4_4_ = fVar338 + auVar203._4_4_;
        auVar316._8_4_ = fVar197 + auVar203._8_4_;
        auVar316._12_4_ = fVar198 + auVar203._12_4_;
        auVar316._16_4_ = fVar210 + auVar203._16_4_;
        auVar316._20_4_ = fVar213 + auVar203._20_4_;
        auVar316._24_4_ = fVar220 + auVar203._24_4_;
        auVar316._28_4_ = fVar308 + auVar203._28_4_;
        fVar185 = fVar256 * 0.0 * local_7a0._0_4_;
        fVar338 = fVar215 * 0.0 * local_7a0._4_4_;
        auVar41._4_4_ = fVar338;
        auVar41._0_4_ = fVar185;
        fVar197 = fVar238 * 0.0 * local_7a0._8_4_;
        auVar41._8_4_ = fVar197;
        fVar256 = fVar255 * 0.0 * local_7a0._12_4_;
        auVar41._12_4_ = fVar256;
        fVar198 = fVar218 * 0.0 * local_7a0._16_4_;
        auVar41._16_4_ = fVar198;
        fVar210 = fVar153 * 0.0 * local_7a0._20_4_;
        auVar41._20_4_ = fVar210;
        fVar213 = fVar159 * 0.0 * local_7a0._24_4_;
        auVar41._24_4_ = fVar213;
        auVar41._28_4_ = fVar258;
        auVar23 = vsubps_avx(auVar118,auVar38);
        auVar341._0_4_ = (float)local_4c0._0_4_ + fVar185;
        auVar341._4_4_ = (float)local_4c0._4_4_ + fVar338;
        auVar341._8_4_ = fStack_4b8 + fVar197;
        auVar341._12_4_ = fStack_4b4 + fVar256;
        auVar341._16_4_ = fStack_4b0 + fVar198;
        auVar341._20_4_ = fStack_4ac + fVar210;
        auVar341._24_4_ = fStack_4a8 + fVar213;
        auVar341._28_4_ = fStack_4a4 + fVar258;
        auVar178 = vsubps_avx(auVar227,auVar40);
        auVar32 = vsubps_avx(auVar203,auVar32);
        auVar33 = vsubps_avx(_local_4c0,auVar41);
        auVar39 = vsubps_avx(auVar316,auVar276);
        auVar22 = vsubps_avx(auVar341,auVar23);
        auVar42._4_4_ = auVar23._4_4_ * auVar39._4_4_;
        auVar42._0_4_ = auVar23._0_4_ * auVar39._0_4_;
        auVar42._8_4_ = auVar23._8_4_ * auVar39._8_4_;
        auVar42._12_4_ = auVar23._12_4_ * auVar39._12_4_;
        auVar42._16_4_ = auVar23._16_4_ * auVar39._16_4_;
        auVar42._20_4_ = auVar23._20_4_ * auVar39._20_4_;
        auVar42._24_4_ = auVar23._24_4_ * auVar39._24_4_;
        auVar42._28_4_ = fVar308;
        auVar43._4_4_ = auVar276._4_4_ * auVar22._4_4_;
        auVar43._0_4_ = auVar276._0_4_ * auVar22._0_4_;
        auVar43._8_4_ = auVar276._8_4_ * auVar22._8_4_;
        auVar43._12_4_ = auVar276._12_4_ * auVar22._12_4_;
        auVar43._16_4_ = auVar276._16_4_ * auVar22._16_4_;
        auVar43._20_4_ = auVar276._20_4_ * auVar22._20_4_;
        auVar43._24_4_ = auVar276._24_4_ * auVar22._24_4_;
        auVar43._28_4_ = auVar203._28_4_;
        auVar297 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar204._4_4_ * auVar22._4_4_;
        auVar44._0_4_ = auVar204._0_4_ * auVar22._0_4_;
        auVar44._8_4_ = auVar204._8_4_ * auVar22._8_4_;
        auVar44._12_4_ = auVar204._12_4_ * auVar22._12_4_;
        auVar44._16_4_ = auVar204._16_4_ * auVar22._16_4_;
        auVar44._20_4_ = auVar204._20_4_ * auVar22._20_4_;
        auVar44._24_4_ = auVar204._24_4_ * auVar22._24_4_;
        auVar44._28_4_ = auVar22._28_4_;
        auVar34 = vsubps_avx(auVar310,auVar204);
        auVar45._4_4_ = auVar23._4_4_ * auVar34._4_4_;
        auVar45._0_4_ = auVar23._0_4_ * auVar34._0_4_;
        auVar45._8_4_ = auVar23._8_4_ * auVar34._8_4_;
        auVar45._12_4_ = auVar23._12_4_ * auVar34._12_4_;
        auVar45._16_4_ = auVar23._16_4_ * auVar34._16_4_;
        auVar45._20_4_ = auVar23._20_4_ * auVar34._20_4_;
        auVar45._24_4_ = auVar23._24_4_ * auVar34._24_4_;
        auVar45._28_4_ = auVar227._28_4_;
        auVar35 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar34._4_4_ * auVar276._4_4_;
        auVar46._0_4_ = auVar34._0_4_ * auVar276._0_4_;
        auVar46._8_4_ = auVar34._8_4_ * auVar276._8_4_;
        auVar46._12_4_ = auVar34._12_4_ * auVar276._12_4_;
        auVar46._16_4_ = auVar34._16_4_ * auVar276._16_4_;
        auVar46._20_4_ = auVar34._20_4_ * auVar276._20_4_;
        auVar46._24_4_ = auVar34._24_4_ * auVar276._24_4_;
        auVar46._28_4_ = auVar22._28_4_;
        auVar47._4_4_ = auVar204._4_4_ * auVar39._4_4_;
        auVar47._0_4_ = auVar204._0_4_ * auVar39._0_4_;
        auVar47._8_4_ = auVar204._8_4_ * auVar39._8_4_;
        auVar47._12_4_ = auVar204._12_4_ * auVar39._12_4_;
        auVar47._16_4_ = auVar204._16_4_ * auVar39._16_4_;
        auVar47._20_4_ = auVar204._20_4_ * auVar39._20_4_;
        auVar47._24_4_ = auVar204._24_4_ * auVar39._24_4_;
        auVar47._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar47,auVar46);
        auVar145._0_4_ = auVar297._0_4_ * 0.0 + auVar39._0_4_ + auVar35._0_4_ * 0.0;
        auVar145._4_4_ = auVar297._4_4_ * 0.0 + auVar39._4_4_ + auVar35._4_4_ * 0.0;
        auVar145._8_4_ = auVar297._8_4_ * 0.0 + auVar39._8_4_ + auVar35._8_4_ * 0.0;
        auVar145._12_4_ = auVar297._12_4_ * 0.0 + auVar39._12_4_ + auVar35._12_4_ * 0.0;
        auVar145._16_4_ = auVar297._16_4_ * 0.0 + auVar39._16_4_ + auVar35._16_4_ * 0.0;
        auVar145._20_4_ = auVar297._20_4_ * 0.0 + auVar39._20_4_ + auVar35._20_4_ * 0.0;
        auVar145._24_4_ = auVar297._24_4_ * 0.0 + auVar39._24_4_ + auVar35._24_4_ * 0.0;
        auVar145._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar35._28_4_;
        auVar297 = vcmpps_avx(auVar145,ZEXT432(0) << 0x20,2);
        local_6e0._0_32_ = vblendvps_avx(auVar178,_local_760,auVar297);
        auVar178 = vblendvps_avx(auVar32,_local_640,auVar297);
        auVar32 = vblendvps_avx(auVar33,auVar263,auVar297);
        auVar33 = vblendvps_avx(auVar204,auVar310,auVar297);
        auVar39 = vblendvps_avx(auVar276,auVar316,auVar297);
        auVar22 = vblendvps_avx(auVar23,auVar341,auVar297);
        auVar204 = vblendvps_avx(auVar310,auVar204,auVar297);
        auVar276 = vblendvps_avx(auVar316,auVar276,auVar297);
        local_7e0 = vpackssdw_avx(auVar250._0_16_,auVar250._16_16_);
        auStack_7d0 = auVar250._16_16_;
        auVar250 = vblendvps_avx(auVar341,auVar23,auVar297);
        auVar204 = vsubps_avx(auVar204,local_6e0._0_32_);
        auVar23 = vsubps_avx(auVar276,auVar178);
        auVar34 = vsubps_avx(auVar250,auVar32);
        auVar250 = vsubps_avx(auVar178,auVar39);
        fVar185 = auVar23._0_4_;
        fVar257 = auVar32._0_4_;
        fVar210 = auVar23._4_4_;
        fVar322 = auVar32._4_4_;
        auVar48._4_4_ = fVar322 * fVar210;
        auVar48._0_4_ = fVar257 * fVar185;
        fVar235 = auVar23._8_4_;
        fVar155 = auVar32._8_4_;
        auVar48._8_4_ = fVar155 * fVar235;
        fVar255 = auVar23._12_4_;
        fVar323 = auVar32._12_4_;
        auVar48._12_4_ = fVar323 * fVar255;
        fVar314 = auVar23._16_4_;
        fVar158 = auVar32._16_4_;
        auVar48._16_4_ = fVar158 * fVar314;
        fVar156 = auVar23._20_4_;
        fVar324 = auVar32._20_4_;
        auVar48._20_4_ = fVar324 * fVar156;
        fVar318 = auVar23._24_4_;
        fVar211 = auVar32._24_4_;
        auVar48._24_4_ = fVar211 * fVar318;
        auVar48._28_4_ = auVar276._28_4_;
        fVar338 = auVar178._0_4_;
        fVar160 = auVar34._0_4_;
        fVar213 = auVar178._4_4_;
        fVar180 = auVar34._4_4_;
        auVar49._4_4_ = fVar180 * fVar213;
        auVar49._0_4_ = fVar160 * fVar338;
        fVar238 = auVar178._8_4_;
        fVar241 = auVar34._8_4_;
        auVar49._8_4_ = fVar241 * fVar238;
        fVar313 = auVar178._12_4_;
        fVar181 = auVar34._12_4_;
        auVar49._12_4_ = fVar181 * fVar313;
        fVar137 = auVar178._16_4_;
        fVar182 = auVar34._16_4_;
        auVar49._16_4_ = fVar182 * fVar137;
        fVar157 = auVar178._20_4_;
        fVar183 = auVar34._20_4_;
        auVar49._20_4_ = fVar183 * fVar157;
        fVar217 = auVar178._24_4_;
        fVar184 = auVar34._24_4_;
        auVar49._24_4_ = fVar184 * fVar217;
        auVar49._28_4_ = auVar316._28_4_;
        auVar276 = vsubps_avx(auVar49,auVar48);
        fVar197 = local_6e0._0_4_;
        fVar215 = local_6e0._4_4_;
        auVar50._4_4_ = fVar180 * fVar215;
        auVar50._0_4_ = fVar160 * fVar197;
        fVar243 = local_6e0._8_4_;
        auVar50._8_4_ = fVar241 * fVar243;
        fVar343 = local_6e0._12_4_;
        auVar50._12_4_ = fVar181 * fVar343;
        fVar151 = local_6e0._16_4_;
        auVar50._16_4_ = fVar182 * fVar151;
        fVar159 = local_6e0._20_4_;
        auVar50._20_4_ = fVar183 * fVar159;
        fVar320 = local_6e0._24_4_;
        auVar50._24_4_ = fVar184 * fVar320;
        auVar50._28_4_ = auVar316._28_4_;
        fVar256 = auVar204._0_4_;
        auVar339._0_4_ = fVar257 * fVar256;
        fVar220 = auVar204._4_4_;
        auVar339._4_4_ = fVar322 * fVar220;
        fVar253 = auVar204._8_4_;
        auVar339._8_4_ = fVar155 * fVar253;
        fVar344 = auVar204._12_4_;
        auVar339._12_4_ = fVar323 * fVar344;
        fVar153 = auVar204._16_4_;
        auVar339._16_4_ = fVar158 * fVar153;
        fVar242 = auVar204._20_4_;
        auVar339._20_4_ = fVar324 * fVar242;
        fVar219 = auVar204._24_4_;
        auVar339._24_4_ = fVar211 * fVar219;
        auVar339._28_4_ = 0;
        auVar35 = vsubps_avx(auVar339,auVar50);
        auVar51._4_4_ = fVar213 * fVar220;
        auVar51._0_4_ = fVar338 * fVar256;
        auVar51._8_4_ = fVar238 * fVar253;
        auVar51._12_4_ = fVar313 * fVar344;
        auVar51._16_4_ = fVar137 * fVar153;
        auVar51._20_4_ = fVar157 * fVar242;
        auVar51._24_4_ = fVar217 * fVar219;
        auVar51._28_4_ = auVar316._28_4_;
        auVar52._4_4_ = fVar215 * fVar210;
        auVar52._0_4_ = fVar197 * fVar185;
        auVar52._8_4_ = fVar243 * fVar235;
        auVar52._12_4_ = fVar343 * fVar255;
        auVar52._16_4_ = fVar151 * fVar314;
        auVar52._20_4_ = fVar159 * fVar156;
        auVar52._24_4_ = fVar320 * fVar318;
        auVar52._28_4_ = auVar341._28_4_;
        auVar36 = vsubps_avx(auVar52,auVar51);
        auVar37 = vsubps_avx(auVar32,auVar22);
        fVar198 = auVar36._28_4_ + auVar35._28_4_;
        auVar174._0_4_ = auVar36._0_4_ + auVar35._0_4_ * 0.0 + auVar276._0_4_ * 0.0;
        auVar174._4_4_ = auVar36._4_4_ + auVar35._4_4_ * 0.0 + auVar276._4_4_ * 0.0;
        auVar174._8_4_ = auVar36._8_4_ + auVar35._8_4_ * 0.0 + auVar276._8_4_ * 0.0;
        auVar174._12_4_ = auVar36._12_4_ + auVar35._12_4_ * 0.0 + auVar276._12_4_ * 0.0;
        auVar174._16_4_ = auVar36._16_4_ + auVar35._16_4_ * 0.0 + auVar276._16_4_ * 0.0;
        auVar174._20_4_ = auVar36._20_4_ + auVar35._20_4_ * 0.0 + auVar276._20_4_ * 0.0;
        auVar174._24_4_ = auVar36._24_4_ + auVar35._24_4_ * 0.0 + auVar276._24_4_ * 0.0;
        auVar174._28_4_ = fVar198 + auVar276._28_4_;
        fVar214 = auVar250._0_4_;
        fVar216 = auVar250._4_4_;
        auVar53._4_4_ = fVar216 * auVar22._4_4_;
        auVar53._0_4_ = fVar214 * auVar22._0_4_;
        fVar136 = auVar250._8_4_;
        auVar53._8_4_ = fVar136 * auVar22._8_4_;
        fVar150 = auVar250._12_4_;
        auVar53._12_4_ = fVar150 * auVar22._12_4_;
        fVar152 = auVar250._16_4_;
        auVar53._16_4_ = fVar152 * auVar22._16_4_;
        fVar258 = auVar250._20_4_;
        auVar53._20_4_ = fVar258 * auVar22._20_4_;
        fVar162 = auVar250._24_4_;
        auVar53._24_4_ = fVar162 * auVar22._24_4_;
        auVar53._28_4_ = fVar198;
        fVar198 = auVar37._0_4_;
        fVar232 = auVar37._4_4_;
        auVar54._4_4_ = auVar39._4_4_ * fVar232;
        auVar54._0_4_ = auVar39._0_4_ * fVar198;
        fVar254 = auVar37._8_4_;
        auVar54._8_4_ = auVar39._8_4_ * fVar254;
        fVar218 = auVar37._12_4_;
        auVar54._12_4_ = auVar39._12_4_ * fVar218;
        fVar154 = auVar37._16_4_;
        auVar54._16_4_ = auVar39._16_4_ * fVar154;
        fVar212 = auVar37._20_4_;
        auVar54._20_4_ = auVar39._20_4_ * fVar212;
        fVar321 = auVar37._24_4_;
        auVar54._24_4_ = auVar39._24_4_ * fVar321;
        auVar54._28_4_ = auVar36._28_4_;
        auVar250 = vsubps_avx(auVar54,auVar53);
        auVar35 = vsubps_avx(local_6e0._0_32_,auVar33);
        fVar221 = auVar35._0_4_;
        fVar222 = auVar35._4_4_;
        auVar55._4_4_ = fVar222 * auVar22._4_4_;
        auVar55._0_4_ = fVar221 * auVar22._0_4_;
        fVar233 = auVar35._8_4_;
        auVar55._8_4_ = fVar233 * auVar22._8_4_;
        fVar234 = auVar35._12_4_;
        auVar55._12_4_ = fVar234 * auVar22._12_4_;
        fVar236 = auVar35._16_4_;
        auVar55._16_4_ = fVar236 * auVar22._16_4_;
        fVar237 = auVar35._20_4_;
        auVar55._20_4_ = fVar237 * auVar22._20_4_;
        fVar239 = auVar35._24_4_;
        auVar55._24_4_ = fVar239 * auVar22._24_4_;
        auVar55._28_4_ = auVar22._28_4_;
        auVar56._4_4_ = auVar33._4_4_ * fVar232;
        auVar56._0_4_ = auVar33._0_4_ * fVar198;
        auVar56._8_4_ = auVar33._8_4_ * fVar254;
        auVar56._12_4_ = auVar33._12_4_ * fVar218;
        auVar56._16_4_ = auVar33._16_4_ * fVar154;
        auVar56._20_4_ = auVar33._20_4_ * fVar212;
        auVar56._24_4_ = auVar33._24_4_ * fVar321;
        auVar56._28_4_ = auVar276._28_4_;
        auVar276 = vsubps_avx(auVar55,auVar56);
        auVar57._4_4_ = auVar39._4_4_ * fVar222;
        auVar57._0_4_ = auVar39._0_4_ * fVar221;
        auVar57._8_4_ = auVar39._8_4_ * fVar233;
        auVar57._12_4_ = auVar39._12_4_ * fVar234;
        auVar57._16_4_ = auVar39._16_4_ * fVar236;
        auVar57._20_4_ = auVar39._20_4_ * fVar237;
        auVar57._24_4_ = auVar39._24_4_ * fVar239;
        auVar57._28_4_ = auVar22._28_4_;
        auVar58._4_4_ = auVar33._4_4_ * fVar216;
        auVar58._0_4_ = auVar33._0_4_ * fVar214;
        auVar58._8_4_ = auVar33._8_4_ * fVar136;
        auVar58._12_4_ = auVar33._12_4_ * fVar150;
        auVar58._16_4_ = auVar33._16_4_ * fVar152;
        auVar58._20_4_ = auVar33._20_4_ * fVar258;
        auVar58._24_4_ = auVar33._24_4_ * fVar162;
        auVar58._28_4_ = auVar33._28_4_;
        auVar33 = vsubps_avx(auVar58,auVar57);
        auVar179 = ZEXT864(0) << 0x20;
        auVar229._0_4_ = auVar250._0_4_ * 0.0 + auVar33._0_4_ + auVar276._0_4_ * 0.0;
        auVar229._4_4_ = auVar250._4_4_ * 0.0 + auVar33._4_4_ + auVar276._4_4_ * 0.0;
        auVar229._8_4_ = auVar250._8_4_ * 0.0 + auVar33._8_4_ + auVar276._8_4_ * 0.0;
        auVar229._12_4_ = auVar250._12_4_ * 0.0 + auVar33._12_4_ + auVar276._12_4_ * 0.0;
        auVar229._16_4_ = auVar250._16_4_ * 0.0 + auVar33._16_4_ + auVar276._16_4_ * 0.0;
        auVar229._20_4_ = auVar250._20_4_ * 0.0 + auVar33._20_4_ + auVar276._20_4_ * 0.0;
        auVar229._24_4_ = auVar250._24_4_ * 0.0 + auVar33._24_4_ + auVar276._24_4_ * 0.0;
        auVar229._28_4_ = auVar33._28_4_ + auVar33._28_4_ + auVar276._28_4_;
        auVar250 = vmaxps_avx(auVar174,auVar229);
        auVar250 = vcmpps_avx(auVar250,ZEXT832(0) << 0x20,2);
        auVar226 = vpackssdw_avx(auVar250._0_16_,auVar250._16_16_);
        auVar226 = vpand_avx(auVar226,local_7e0);
        auVar245 = vpmovsxwd_avx(auVar226);
        auVar202 = vpunpckhwd_avx(auVar226,auVar226);
        auVar205._16_16_ = auVar202;
        auVar205._0_16_ = auVar245;
        if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar205 >> 0x7f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar202 >> 0x3f,0) == '\0') &&
            (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar202[0xf]) {
LAB_01051d06:
          auVar149 = ZEXT3264(CONCAT824(uStack_4c8,
                                        CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
          auVar209 = ZEXT3264(auVar205);
          auVar278 = ZEXT3264(local_540);
          auVar302 = ZEXT3264(local_560);
        }
        else {
          auVar59._4_4_ = fVar232 * fVar210;
          auVar59._0_4_ = fVar198 * fVar185;
          auVar59._8_4_ = fVar254 * fVar235;
          auVar59._12_4_ = fVar218 * fVar255;
          auVar59._16_4_ = fVar154 * fVar314;
          auVar59._20_4_ = fVar212 * fVar156;
          auVar59._24_4_ = fVar321 * fVar318;
          auVar59._28_4_ = auVar202._12_4_;
          auVar327._0_4_ = fVar214 * fVar160;
          auVar327._4_4_ = fVar216 * fVar180;
          auVar327._8_4_ = fVar136 * fVar241;
          auVar327._12_4_ = fVar150 * fVar181;
          auVar327._16_4_ = fVar152 * fVar182;
          auVar327._20_4_ = fVar258 * fVar183;
          auVar327._24_4_ = fVar162 * fVar184;
          auVar327._28_4_ = 0;
          auVar250 = vsubps_avx(auVar327,auVar59);
          auVar60._4_4_ = fVar222 * fVar180;
          auVar60._0_4_ = fVar221 * fVar160;
          auVar60._8_4_ = fVar233 * fVar241;
          auVar60._12_4_ = fVar234 * fVar181;
          auVar60._16_4_ = fVar236 * fVar182;
          auVar60._20_4_ = fVar237 * fVar183;
          auVar60._24_4_ = fVar239 * fVar184;
          auVar60._28_4_ = auVar34._28_4_;
          auVar61._4_4_ = fVar232 * fVar220;
          auVar61._0_4_ = fVar198 * fVar256;
          auVar61._8_4_ = fVar254 * fVar253;
          auVar61._12_4_ = fVar218 * fVar344;
          auVar61._16_4_ = fVar154 * fVar153;
          auVar61._20_4_ = fVar212 * fVar242;
          auVar61._24_4_ = fVar321 * fVar219;
          auVar61._28_4_ = auVar37._28_4_;
          auVar39 = vsubps_avx(auVar61,auVar60);
          auVar62._4_4_ = fVar216 * fVar220;
          auVar62._0_4_ = fVar214 * fVar256;
          auVar62._8_4_ = fVar136 * fVar253;
          auVar62._12_4_ = fVar150 * fVar344;
          auVar62._16_4_ = fVar152 * fVar153;
          auVar62._20_4_ = fVar258 * fVar242;
          auVar62._24_4_ = fVar162 * fVar219;
          auVar62._28_4_ = auVar174._28_4_;
          auVar63._4_4_ = fVar222 * fVar210;
          auVar63._0_4_ = fVar221 * fVar185;
          auVar63._8_4_ = fVar233 * fVar235;
          auVar63._12_4_ = fVar234 * fVar255;
          auVar63._16_4_ = fVar236 * fVar314;
          auVar63._20_4_ = fVar237 * fVar156;
          auVar63._24_4_ = fVar239 * fVar318;
          auVar63._28_4_ = auVar23._28_4_;
          auVar22 = vsubps_avx(auVar63,auVar62);
          auVar277._0_4_ = auVar250._0_4_ * 0.0 + auVar22._0_4_ + auVar39._0_4_ * 0.0;
          auVar277._4_4_ = auVar250._4_4_ * 0.0 + auVar22._4_4_ + auVar39._4_4_ * 0.0;
          auVar277._8_4_ = auVar250._8_4_ * 0.0 + auVar22._8_4_ + auVar39._8_4_ * 0.0;
          auVar277._12_4_ = auVar250._12_4_ * 0.0 + auVar22._12_4_ + auVar39._12_4_ * 0.0;
          auVar277._16_4_ = auVar250._16_4_ * 0.0 + auVar22._16_4_ + auVar39._16_4_ * 0.0;
          auVar277._20_4_ = auVar250._20_4_ * 0.0 + auVar22._20_4_ + auVar39._20_4_ * 0.0;
          auVar277._24_4_ = auVar250._24_4_ * 0.0 + auVar22._24_4_ + auVar39._24_4_ * 0.0;
          auVar277._28_4_ = auVar23._28_4_ + auVar22._28_4_ + auVar174._28_4_;
          auVar33 = vrcpps_avx(auVar277);
          fVar185 = auVar33._0_4_;
          fVar256 = auVar33._4_4_;
          auVar64._4_4_ = auVar277._4_4_ * fVar256;
          auVar64._0_4_ = auVar277._0_4_ * fVar185;
          fVar198 = auVar33._8_4_;
          auVar64._8_4_ = auVar277._8_4_ * fVar198;
          fVar210 = auVar33._12_4_;
          auVar64._12_4_ = auVar277._12_4_ * fVar210;
          fVar220 = auVar33._16_4_;
          auVar64._16_4_ = auVar277._16_4_ * fVar220;
          fVar232 = auVar33._20_4_;
          auVar64._20_4_ = auVar277._20_4_ * fVar232;
          fVar235 = auVar33._24_4_;
          auVar64._24_4_ = auVar277._24_4_ * fVar235;
          auVar64._28_4_ = auVar37._28_4_;
          auVar328._8_4_ = 0x3f800000;
          auVar328._0_8_ = &DAT_3f8000003f800000;
          auVar328._12_4_ = 0x3f800000;
          auVar328._16_4_ = 0x3f800000;
          auVar328._20_4_ = 0x3f800000;
          auVar328._24_4_ = 0x3f800000;
          auVar328._28_4_ = 0x3f800000;
          auVar276 = vsubps_avx(auVar328,auVar64);
          fVar185 = auVar276._0_4_ * fVar185 + fVar185;
          fVar256 = auVar276._4_4_ * fVar256 + fVar256;
          fVar198 = auVar276._8_4_ * fVar198 + fVar198;
          fVar210 = auVar276._12_4_ * fVar210 + fVar210;
          fVar220 = auVar276._16_4_ * fVar220 + fVar220;
          fVar232 = auVar276._20_4_ * fVar232 + fVar232;
          fVar235 = auVar276._24_4_ * fVar235 + fVar235;
          auVar65._4_4_ =
               (auVar250._4_4_ * fVar215 + auVar39._4_4_ * fVar213 + auVar22._4_4_ * fVar322) *
               fVar256;
          auVar65._0_4_ =
               (auVar250._0_4_ * fVar197 + auVar39._0_4_ * fVar338 + auVar22._0_4_ * fVar257) *
               fVar185;
          auVar65._8_4_ =
               (auVar250._8_4_ * fVar243 + auVar39._8_4_ * fVar238 + auVar22._8_4_ * fVar155) *
               fVar198;
          auVar65._12_4_ =
               (auVar250._12_4_ * fVar343 + auVar39._12_4_ * fVar313 + auVar22._12_4_ * fVar323) *
               fVar210;
          auVar65._16_4_ =
               (auVar250._16_4_ * fVar151 + auVar39._16_4_ * fVar137 + auVar22._16_4_ * fVar158) *
               fVar220;
          auVar65._20_4_ =
               (auVar250._20_4_ * fVar159 + auVar39._20_4_ * fVar157 + auVar22._20_4_ * fVar324) *
               fVar232;
          auVar65._24_4_ =
               (auVar250._24_4_ * fVar320 + auVar39._24_4_ * fVar217 + auVar22._24_4_ * fVar211) *
               fVar235;
          auVar65._28_4_ = local_6e0._28_4_ + auVar204._28_4_ + auVar32._28_4_;
          auVar245 = vpermilps_avx(ZEXT416(uVar131),0);
          auVar206._16_16_ = auVar245;
          auVar206._0_16_ = auVar245;
          auVar250 = vcmpps_avx(auVar206,auVar65,2);
          uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar248._4_4_ = uVar289;
          auVar248._0_4_ = uVar289;
          auVar248._8_4_ = uVar289;
          auVar248._12_4_ = uVar289;
          auVar248._16_4_ = uVar289;
          auVar248._20_4_ = uVar289;
          auVar248._24_4_ = uVar289;
          auVar248._28_4_ = uVar289;
          auVar32 = vcmpps_avx(auVar65,auVar248,2);
          auVar250 = vandps_avx(auVar32,auVar250);
          auVar245 = vpackssdw_avx(auVar250._0_16_,auVar250._16_16_);
          auVar226 = vpand_avx(auVar226,auVar245);
          auVar245 = vpmovsxwd_avx(auVar226);
          auVar202 = vpshufd_avx(auVar226,0xee);
          auVar202 = vpmovsxwd_avx(auVar202);
          auVar205._16_16_ = auVar202;
          auVar205._0_16_ = auVar245;
          if ((((((((auVar205 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar205 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar205 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar205 >> 0x7f,0) == '\0') &&
                (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar202 >> 0x3f,0) == '\0') &&
              (auVar205 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar202[0xf]) goto LAB_01051d06;
          auVar250 = vcmpps_avx(ZEXT832(0) << 0x20,auVar277,4);
          auVar245 = vpackssdw_avx(auVar250._0_16_,auVar250._16_16_);
          auVar226 = vpand_avx(auVar226,auVar245);
          auVar245 = vpmovsxwd_avx(auVar226);
          auVar226 = vpunpckhwd_avx(auVar226,auVar226);
          auVar209 = ZEXT1664(auVar226);
          auVar264._16_16_ = auVar226;
          auVar264._0_16_ = auVar245;
          auVar149 = ZEXT3264(CONCAT824(uStack_4c8,
                                        CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
          auVar278 = ZEXT3264(local_540);
          auVar302 = ZEXT3264(local_560);
          if ((((((((auVar264 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar264 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar264 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar264 >> 0x7f,0) != '\0') ||
                (auVar264 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar226 >> 0x3f,0) != '\0') ||
              (auVar264 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar226[0xf] < '\0') {
            auVar207._0_4_ = auVar174._0_4_ * fVar185;
            auVar207._4_4_ = auVar174._4_4_ * fVar256;
            auVar207._8_4_ = auVar174._8_4_ * fVar198;
            auVar207._12_4_ = auVar174._12_4_ * fVar210;
            auVar207._16_4_ = auVar174._16_4_ * fVar220;
            auVar207._20_4_ = auVar174._20_4_ * fVar232;
            auVar207._24_4_ = auVar174._24_4_ * fVar235;
            auVar207._28_4_ = 0;
            auVar66._4_4_ = auVar229._4_4_ * fVar256;
            auVar66._0_4_ = auVar229._0_4_ * fVar185;
            auVar66._8_4_ = auVar229._8_4_ * fVar198;
            auVar66._12_4_ = auVar229._12_4_ * fVar210;
            auVar66._16_4_ = auVar229._16_4_ * fVar220;
            auVar66._20_4_ = auVar229._20_4_ * fVar232;
            auVar66._24_4_ = auVar229._24_4_ * fVar235;
            auVar66._28_4_ = auVar276._28_4_ + auVar33._28_4_;
            auVar249._8_4_ = 0x3f800000;
            auVar249._0_8_ = &DAT_3f8000003f800000;
            auVar249._12_4_ = 0x3f800000;
            auVar249._16_4_ = 0x3f800000;
            auVar249._20_4_ = 0x3f800000;
            auVar249._24_4_ = 0x3f800000;
            auVar249._28_4_ = 0x3f800000;
            auVar250 = vsubps_avx(auVar249,auVar207);
            auVar250 = vblendvps_avx(auVar250,auVar207,auVar297);
            auVar278 = ZEXT3264(auVar250);
            auVar250 = vsubps_avx(auVar249,auVar66);
            auVar209 = ZEXT3264(auVar250);
            _local_3a0 = vblendvps_avx(auVar250,auVar66,auVar297);
            auVar149 = ZEXT3264(auVar264);
            auVar302 = ZEXT3264(auVar65);
          }
        }
        auVar317 = ZEXT3264(_local_7c0);
        local_540 = auVar278._0_32_;
        local_560 = auVar302._0_32_;
        auVar250 = auVar149._0_32_;
        if ((((((((auVar250 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar250 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar250 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar250 >> 0x7f,0) == '\0') &&
              (auVar149 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar250 >> 0xbf,0) == '\0') &&
            (auVar149 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar149[0x1f]) {
          uVar133 = 0;
        }
        else {
          auVar32 = vsubps_avx(local_7a0,_local_840);
          local_840._0_4_ = (float)local_840._0_4_ + auVar32._0_4_ * auVar278._0_4_;
          local_840._4_4_ = (float)local_840._4_4_ + auVar32._4_4_ * auVar278._4_4_;
          fStack_838 = fStack_838 + auVar32._8_4_ * auVar278._8_4_;
          fStack_834 = fStack_834 + auVar32._12_4_ * auVar278._12_4_;
          fStack_830 = fStack_830 + auVar32._16_4_ * auVar278._16_4_;
          fStack_82c = fStack_82c + auVar32._20_4_ * auVar278._20_4_;
          fStack_828 = fStack_828 + auVar32._24_4_ * auVar278._24_4_;
          fStack_824 = fStack_824 + auVar32._28_4_;
          fVar185 = *(float *)((long)local_698->ray_space + k * 4 + -0x10);
          auVar67._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar185;
          auVar67._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar185;
          auVar67._8_4_ = (fStack_838 + fStack_838) * fVar185;
          auVar67._12_4_ = (fStack_834 + fStack_834) * fVar185;
          auVar67._16_4_ = (fStack_830 + fStack_830) * fVar185;
          auVar67._20_4_ = (fStack_82c + fStack_82c) * fVar185;
          auVar67._24_4_ = (fStack_828 + fStack_828) * fVar185;
          auVar67._28_4_ = fStack_824 + fStack_824;
          auVar32 = vcmpps_avx(local_560,auVar67,6);
          auVar33 = auVar250 & auVar32;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar33 >> 0x7f,0) != '\0') ||
                (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0xbf,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar33[0x1f] < '\0') {
            local_220 = vandps_avx(auVar32,auVar250);
            local_2c0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_2c0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_2b8 = (float)uStack_398 + (float)uStack_398 + -1.0;
            fStack_2b4 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
            fStack_2b0 = (float)uStack_390 + (float)uStack_390 + -1.0;
            fStack_2ac = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
            fStack_2a8 = (float)uStack_388 + (float)uStack_388 + -1.0;
            fStack_2a4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
            local_280 = 0;
            uStack_268 = uStack_6a8;
            uStack_258 = local_500._8_8_;
            local_250 = local_4a0._0_8_;
            uStack_248 = local_4a0._8_8_;
            uStack_238 = local_490._8_8_;
            local_3a0._4_4_ = local_2c0._4_4_;
            local_3a0._0_4_ = local_2c0._0_4_;
            uStack_398._0_4_ = fStack_2b8;
            uStack_398._4_4_ = fStack_2b4;
            uStack_390._0_4_ = fStack_2b0;
            uStack_390._4_4_ = fStack_2ac;
            auVar172 = _local_3a0;
            uStack_388._0_4_ = fStack_2a8;
            uStack_388._4_4_ = fStack_2a4;
            auVar250 = _local_3a0;
            if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar133 = CONCAT71((int7)(uVar133 >> 8),1),
                 pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar193._0_4_ = 1.0 / (float)local_5d0._0_4_;
                auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar226 = vshufps_avx(auVar193,auVar193,0);
                local_200[0] = auVar226._0_4_ * (auVar278._0_4_ + 0.0);
                local_200[1] = auVar226._4_4_ * (auVar278._4_4_ + 1.0);
                local_200[2] = auVar226._8_4_ * (auVar278._8_4_ + 2.0);
                local_200[3] = auVar226._12_4_ * (auVar278._12_4_ + 3.0);
                fStack_1f0 = auVar226._0_4_ * (auVar278._16_4_ + 4.0);
                fStack_1ec = auVar226._4_4_ * (auVar278._20_4_ + 5.0);
                fStack_1e8 = auVar226._8_4_ * (auVar278._24_4_ + 6.0);
                fStack_1e4 = auVar278._28_4_ + 7.0;
                uStack_390 = auVar172._16_8_;
                uStack_388 = auVar250._24_8_;
                local_1e0 = local_3a0;
                uStack_1d8 = uStack_398;
                uStack_1d0 = uStack_390;
                uStack_1c8 = uStack_388;
                local_1c0 = local_560;
                iVar128 = vmovmskps_avx(local_220);
                uVar134 = CONCAT44((int)((ulong)p_Var20 >> 0x20),iVar128);
                uVar129 = 0;
                if (uVar134 != 0) {
                  for (; (uVar134 >> uVar129 & 1) == 0; uVar129 = uVar129 + 1) {
                  }
                }
                uVar133 = CONCAT71((int7)(uVar133 >> 8),iVar128 != 0);
                auVar32 = local_560;
                auVar33 = local_540;
                _local_3a0 = auVar250;
                if (iVar128 != 0) {
                  _local_700 = vshufps_avx(ZEXT416(uVar13),ZEXT416(uVar13),0);
                  _auStack_6f0 = auVar178._16_16_;
                  _local_620 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
                  _auStack_610 = auVar227._16_16_;
                  _auStack_710 = auVar203._16_16_;
                  uStack_718 = local_500._8_8_;
                  local_720 = (undefined1  [8])local_500._0_8_;
                  local_740 = local_4a0._0_4_;
                  fStack_73c = local_4a0._4_4_;
                  fStack_738 = local_4a0._8_4_;
                  fStack_734 = local_4a0._12_4_;
                  uStack_758 = local_490._8_8_;
                  local_760 = (undefined1  [8])local_490._0_8_;
                  _local_640 = *local_6a0;
                  _local_380 = *pauVar9;
                  local_2e0 = local_540;
                  local_2a0 = local_560;
                  local_27c = uVar15;
                  local_270 = local_6b0;
                  local_260 = local_500._0_8_;
                  local_240 = local_490._0_8_;
                  do {
                    uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_420 = local_200[uVar129];
                    local_410 = *(undefined4 *)((long)&local_1e0 + uVar129 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar129 * 4);
                    fVar338 = 1.0 - local_420;
                    fVar185 = local_420 * fVar338 + local_420 * fVar338;
                    auVar226 = ZEXT416((uint)(local_420 * local_420 * 3.0));
                    auVar226 = vshufps_avx(auVar226,auVar226,0);
                    auVar245 = ZEXT416((uint)((fVar185 - local_420 * local_420) * 3.0));
                    auVar245 = vshufps_avx(auVar245,auVar245,0);
                    auVar202 = ZEXT416((uint)((fVar338 * fVar338 - fVar185) * 3.0));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    local_690.context = context->user;
                    auVar190 = ZEXT416((uint)(fVar338 * fVar338 * -3.0));
                    auVar190 = vshufps_avx(auVar190,auVar190,0);
                    auVar194._0_4_ =
                         auVar190._0_4_ * (float)local_6b0._0_4_ +
                         auVar202._0_4_ * (float)local_720._0_4_ +
                         auVar226._0_4_ * (float)local_760._0_4_ + auVar245._0_4_ * local_740;
                    auVar194._4_4_ =
                         auVar190._4_4_ * (float)local_6b0._4_4_ +
                         auVar202._4_4_ * (float)local_720._4_4_ +
                         auVar226._4_4_ * (float)local_760._4_4_ + auVar245._4_4_ * fStack_73c;
                    auVar194._8_4_ =
                         auVar190._8_4_ * (float)uStack_6a8 +
                         auVar202._8_4_ * (float)uStack_718 +
                         auVar226._8_4_ * (float)uStack_758 + auVar245._8_4_ * fStack_738;
                    auVar194._12_4_ =
                         auVar190._12_4_ * uStack_6a8._4_4_ +
                         auVar202._12_4_ * uStack_718._4_4_ +
                         auVar226._12_4_ * uStack_758._4_4_ + auVar245._12_4_ * fStack_734;
                    local_450 = (RTCHitN  [16])vshufps_avx(auVar194,auVar194,0);
                    local_440 = vshufps_avx(auVar194,auVar194,0x55);
                    auVar209 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar194,auVar194,0xaa);
                    local_400 = local_620;
                    uStack_3f8 = uStack_618;
                    local_3f0 = local_700;
                    uStack_3e8 = uStack_6f8;
                    vcmpps_avx(auVar179._0_32_,auVar179._0_32_,0xf);
                    uStack_3dc = (local_690.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_690.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_800 = local_640;
                    uStack_7f8 = uStack_638;
                    local_690.valid = (int *)&local_800;
                    local_690.geometryUserPtr = pGVar16->userPtr;
                    local_690.hit = local_450;
                    local_690.N = 4;
                    local_7e0._0_4_ = (int)uVar133;
                    local_7a0._0_8_ = uVar134;
                    local_6e0._0_4_ = uVar289;
                    local_690.ray = (RTCRayN *)ray;
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar209 = ZEXT1664(local_440);
                      (*pGVar16->occlusionFilterN)(&local_690);
                      uVar133 = (ulong)(uint)local_7e0._0_4_;
                      auVar317 = ZEXT3264(_local_7c0);
                      auVar302 = ZEXT3264(local_560);
                      auVar278 = ZEXT3264(local_540);
                      auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar134 = local_7a0._0_8_;
                      uVar289 = local_6e0._0_4_;
                    }
                    auVar116._8_8_ = uStack_7f8;
                    auVar116._0_8_ = local_800;
                    if (auVar116 == (undefined1  [16])0x0) {
                      auVar226 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar226 = auVar226 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var20 = context->args->filter;
                      if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (*p_Var20)(&local_690);
                        uVar133 = (ulong)(uint)local_7e0._0_4_;
                        auVar317 = ZEXT3264(_local_7c0);
                        auVar302 = ZEXT3264(local_560);
                        auVar278 = ZEXT3264(local_540);
                        auVar179 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar134 = local_7a0._0_8_;
                        uVar289 = local_6e0._0_4_;
                      }
                      auVar117._8_8_ = uStack_7f8;
                      auVar117._0_8_ = local_800;
                      auVar245 = vpcmpeqd_avx((undefined1  [16])0x0,auVar117);
                      auVar226 = auVar245 ^ _DAT_01febe20;
                      auVar195._8_4_ = 0xff800000;
                      auVar195._0_8_ = 0xff800000ff800000;
                      auVar195._12_4_ = 0xff800000;
                      auVar245 = vblendvps_avx(auVar195,*(undefined1 (*) [16])(local_690.ray + 0x80)
                                               ,auVar245);
                      *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar245;
                    }
                    auVar171._8_8_ = 0x100000001;
                    auVar171._0_8_ = 0x100000001;
                    auVar32 = auVar302._0_32_;
                    auVar33 = auVar278._0_32_;
                    if ((auVar171 & auVar226) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar289;
                    uVar134 = uVar134 ^ 1L << (uVar129 & 0x3f);
                    uVar129 = 0;
                    if (uVar134 != 0) {
                      for (; (uVar134 >> uVar129 & 1) == 0; uVar129 = uVar129 + 1) {
                      }
                    }
                    uVar133 = CONCAT71((int7)(uVar133 >> 8),uVar134 != 0);
                  } while (uVar134 != 0);
                }
                local_540 = auVar33;
                local_560 = auVar32;
                uVar133 = uVar133 & 0xffffffffffffff01;
              }
              goto LAB_01050db7;
            }
          }
          uVar133 = 0;
        }
LAB_01050db7:
        auVar226 = local_780._0_16_;
      }
      auVar179 = ZEXT1664(auVar226);
      if (8 < (int)uVar15) {
        _local_380 = vpshufd_avx(ZEXT416(uVar15),0);
        auVar226 = vshufps_avx(auVar226,auVar226,0);
        register0x00001210 = auVar226;
        _local_4c0 = auVar226;
        auVar226 = vpermilps_avx(ZEXT416(uVar131),0);
        local_120._16_16_ = auVar226;
        local_120._0_16_ = auVar226;
        auVar142._0_4_ = 1.0 / (float)local_5d0._0_4_;
        auVar142._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar226 = vshufps_avx(auVar142,auVar142,0);
        register0x00001210 = auVar226;
        _local_140 = auVar226;
        local_5d0 = vshufps_avx(ZEXT416((uint)local_7e8),ZEXT416((uint)local_7e8),0);
        local_5e0 = vshufps_avx(ZEXT416((uint)local_5e0._0_4_),ZEXT416((uint)local_5e0._0_4_),0);
        auVar149 = ZEXT1664(local_5e0);
        lVar135 = 8;
        fVar185 = (float)local_600._0_4_;
        fVar338 = (float)local_600._4_4_;
        fVar197 = fStack_5f8;
        fVar256 = fStack_5f4;
        fVar198 = fStack_5f0;
        fVar210 = fStack_5ec;
        fVar213 = fStack_5e8;
        fVar215 = (float)local_520._0_4_;
        fVar220 = (float)local_520._4_4_;
        fVar232 = fStack_518;
        fVar235 = fStack_514;
        fVar238 = fStack_510;
        fVar243 = fStack_50c;
        fVar253 = fStack_508;
        fVar254 = (float)local_580._0_4_;
        fVar255 = (float)local_580._4_4_;
        fVar313 = fStack_578;
        fVar343 = fStack_574;
        fVar344 = fStack_570;
        fVar218 = fStack_56c;
        fVar314 = fStack_568;
        do {
          pauVar10 = (undefined1 (*) [28])(bezier_basis0 + lVar135 * 4 + lVar21);
          fVar137 = *(float *)*pauVar10;
          fVar151 = *(float *)(*pauVar10 + 4);
          fVar153 = *(float *)(*pauVar10 + 8);
          fVar154 = *(float *)(*pauVar10 + 0xc);
          fVar156 = *(float *)(*pauVar10 + 0x10);
          fVar157 = *(float *)(*pauVar10 + 0x14);
          fVar159 = *(float *)(*pauVar10 + 0x18);
          auVar123 = *pauVar10;
          pauVar11 = (undefined1 (*) [28])(lVar21 + 0x2227768 + lVar135 * 4);
          fVar242 = *(float *)*pauVar11;
          fVar212 = *(float *)(*pauVar11 + 4);
          fVar318 = *(float *)(*pauVar11 + 8);
          fVar217 = *(float *)(*pauVar11 + 0xc);
          fVar320 = *(float *)(*pauVar11 + 0x10);
          fVar219 = *(float *)(*pauVar11 + 0x14);
          fVar321 = *(float *)(*pauVar11 + 0x18);
          auVar121 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar21 + 0x2227bec + lVar135 * 4);
          fVar257 = *(float *)*pauVar11;
          fVar322 = *(float *)(*pauVar11 + 4);
          fVar155 = *(float *)(*pauVar11 + 8);
          fVar323 = *(float *)(*pauVar11 + 0xc);
          fVar158 = *(float *)(*pauVar11 + 0x10);
          fVar324 = *(float *)(*pauVar11 + 0x14);
          fVar211 = *(float *)(*pauVar11 + 0x18);
          auVar120 = *pauVar11;
          pfVar1 = (float *)(lVar21 + 0x2228070 + lVar135 * 4);
          fVar214 = *pfVar1;
          fVar216 = pfVar1[1];
          fVar136 = pfVar1[2];
          fVar150 = pfVar1[3];
          fVar152 = pfVar1[4];
          fVar258 = pfVar1[5];
          fVar162 = pfVar1[6];
          fVar180 = auVar209._28_4_;
          fVar160 = fVar180 + fVar180 + auVar149._28_4_;
          fVar241 = fVar180 + fVar180 + pfVar1[7];
          auVar299._0_4_ =
               (float)local_340._0_4_ * fVar137 +
               fVar254 * fVar242 + fVar185 * fVar257 + (float)local_480._0_4_ * fVar214;
          auVar299._4_4_ =
               (float)local_340._4_4_ * fVar151 +
               fVar255 * fVar212 + fVar338 * fVar322 + (float)local_480._4_4_ * fVar216;
          auVar299._8_4_ =
               fStack_338 * fVar153 + fVar313 * fVar318 + fVar197 * fVar155 + fStack_478 * fVar136;
          auVar299._12_4_ =
               fStack_334 * fVar154 + fVar343 * fVar217 + fVar256 * fVar323 + fStack_474 * fVar150;
          auVar299._16_4_ =
               fStack_330 * fVar156 + fVar344 * fVar320 + fVar198 * fVar158 + fStack_470 * fVar152;
          auVar299._20_4_ =
               fStack_32c * fVar157 + fVar218 * fVar219 + fVar210 * fVar324 + fStack_46c * fVar258;
          auVar299._24_4_ =
               fStack_328 * fVar159 + fVar314 * fVar321 + fVar213 * fVar211 + fStack_468 * fVar162;
          auVar299._28_4_ = fVar180 + pfVar1[7] + fVar160;
          local_780._0_4_ =
               (float)local_360._0_4_ * fVar137 +
               fVar215 * fVar242 + (float)local_5c0._0_4_ * fVar257 + auVar317._0_4_ * fVar214;
          local_780._4_4_ =
               (float)local_360._4_4_ * fVar151 +
               fVar220 * fVar212 + (float)local_5c0._4_4_ * fVar322 + auVar317._4_4_ * fVar216;
          local_780._8_4_ =
               fStack_358 * fVar153 +
               fVar232 * fVar318 + fStack_5b8 * fVar155 + auVar317._8_4_ * fVar136;
          local_780._12_4_ =
               fStack_354 * fVar154 +
               fVar235 * fVar217 + fStack_5b4 * fVar323 + auVar317._12_4_ * fVar150;
          local_780._16_4_ =
               fStack_350 * fVar156 +
               fVar238 * fVar320 + fStack_5b0 * fVar158 + auVar317._16_4_ * fVar152;
          local_780._20_4_ =
               fStack_34c * fVar157 +
               fVar243 * fVar219 + fStack_5ac * fVar324 + auVar317._20_4_ * fVar258;
          local_780._24_4_ =
               fStack_348 * fVar159 +
               fVar253 * fVar321 + fStack_5a8 * fVar211 + auVar317._24_4_ * fVar162;
          local_780._28_4_ = fVar160 + fVar180 + fVar180 + auVar179._28_4_;
          fVar137 = (float)local_e0._0_4_ * fVar137 +
                    (float)local_c0._0_4_ * fVar242 +
                    (float)local_80._0_4_ * fVar257 + (float)local_a0._0_4_ * fVar214;
          fVar151 = (float)local_e0._4_4_ * fVar151 +
                    (float)local_c0._4_4_ * fVar212 +
                    (float)local_80._4_4_ * fVar322 + (float)local_a0._4_4_ * fVar216;
          fVar153 = fStack_d8 * fVar153 +
                    fStack_b8 * fVar318 + fStack_78 * fVar155 + fStack_98 * fVar136;
          fVar154 = fStack_d4 * fVar154 +
                    fStack_b4 * fVar217 + fStack_74 * fVar323 + fStack_94 * fVar150;
          fVar156 = fStack_d0 * fVar156 +
                    fStack_b0 * fVar320 + fStack_70 * fVar158 + fStack_90 * fVar152;
          fVar157 = fStack_cc * fVar157 +
                    fStack_ac * fVar219 + fStack_6c * fVar324 + fStack_8c * fVar258;
          fVar159 = fStack_c8 * fVar159 +
                    fStack_a8 * fVar321 + fStack_68 * fVar211 + fStack_88 * fVar162;
          fVar160 = fVar160 + fVar241;
          auVar172 = *(undefined1 (*) [24])(bezier_basis1 + lVar135 * 4 + lVar21);
          pauVar11 = (undefined1 (*) [28])(lVar21 + 0x2229b88 + lVar135 * 4);
          fVar185 = *(float *)*pauVar11;
          fVar338 = *(float *)(*pauVar11 + 4);
          fVar197 = *(float *)(*pauVar11 + 8);
          fVar256 = *(float *)(*pauVar11 + 0xc);
          fVar198 = *(float *)(*pauVar11 + 0x10);
          fVar210 = *(float *)(*pauVar11 + 0x14);
          fVar213 = *(float *)(*pauVar11 + 0x18);
          auVar126 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar21 + 0x222a00c + lVar135 * 4);
          fVar215 = *(float *)*pauVar11;
          fVar220 = *(float *)(*pauVar11 + 4);
          fVar232 = *(float *)(*pauVar11 + 8);
          fVar235 = *(float *)(*pauVar11 + 0xc);
          fVar238 = *(float *)(*pauVar11 + 0x10);
          fVar243 = *(float *)(*pauVar11 + 0x14);
          fVar253 = *(float *)(*pauVar11 + 0x18);
          auVar125 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar21 + 0x222a490 + lVar135 * 4);
          fVar254 = *(float *)*pauVar11;
          fVar255 = *(float *)(*pauVar11 + 4);
          fVar313 = *(float *)(*pauVar11 + 8);
          fVar343 = *(float *)(*pauVar11 + 0xc);
          fVar344 = *(float *)(*pauVar11 + 0x10);
          fVar218 = *(float *)(*pauVar11 + 0x14);
          fVar314 = *(float *)(*pauVar11 + 0x18);
          auVar124 = *pauVar11;
          fVar242 = fStack_464 + fStack_464 + fVar241;
          local_840._0_4_ = auVar172._0_4_;
          local_840._4_4_ = auVar172._4_4_;
          fStack_838 = auVar172._8_4_;
          fStack_834 = auVar172._12_4_;
          fStack_830 = auVar172._16_4_;
          fStack_82c = auVar172._20_4_;
          fStack_828 = (float)*(undefined8 *)
                               ((undefined1 (*) [24])(bezier_basis1 + lVar135 * 4 + lVar21))[1];
          auVar265._0_4_ =
               (float)local_340._0_4_ * (float)local_840._0_4_ +
               (float)local_580._0_4_ * fVar185 +
               fVar215 * (float)local_600._0_4_ + (float)local_480._0_4_ * fVar254;
          auVar265._4_4_ =
               (float)local_340._4_4_ * (float)local_840._4_4_ +
               (float)local_580._4_4_ * fVar338 +
               fVar220 * (float)local_600._4_4_ + (float)local_480._4_4_ * fVar255;
          auVar265._8_4_ =
               fStack_338 * fStack_838 +
               fStack_578 * fVar197 + fVar232 * fStack_5f8 + fStack_478 * fVar313;
          auVar265._12_4_ =
               fStack_334 * fStack_834 +
               fStack_574 * fVar256 + fVar235 * fStack_5f4 + fStack_474 * fVar343;
          auVar265._16_4_ =
               fStack_330 * fStack_830 +
               fStack_570 * fVar198 + fVar238 * fStack_5f0 + fStack_470 * fVar344;
          auVar265._20_4_ =
               fStack_32c * fStack_82c +
               fStack_56c * fVar210 + fVar243 * fStack_5ec + fStack_46c * fVar218;
          auVar265._24_4_ =
               fStack_328 * fStack_828 +
               fStack_568 * fVar213 + fVar253 * fStack_5e8 + fStack_468 * fVar314;
          auVar265._28_4_ = fStack_464 + fStack_84 + fVar242;
          auVar251._0_4_ =
               (float)local_360._0_4_ * (float)local_840._0_4_ +
               (float)local_520._0_4_ * fVar185 +
               (float)local_5c0._0_4_ * fVar215 + auVar317._0_4_ * fVar254;
          auVar251._4_4_ =
               (float)local_360._4_4_ * (float)local_840._4_4_ +
               (float)local_520._4_4_ * fVar338 +
               (float)local_5c0._4_4_ * fVar220 + auVar317._4_4_ * fVar255;
          auVar251._8_4_ =
               fStack_358 * fStack_838 +
               fStack_518 * fVar197 + fStack_5b8 * fVar232 + auVar317._8_4_ * fVar313;
          auVar251._12_4_ =
               fStack_354 * fStack_834 +
               fStack_514 * fVar256 + fStack_5b4 * fVar235 + auVar317._12_4_ * fVar343;
          auVar251._16_4_ =
               fStack_350 * fStack_830 +
               fStack_510 * fVar198 + fStack_5b0 * fVar238 + auVar317._16_4_ * fVar344;
          auVar251._20_4_ =
               fStack_34c * fStack_82c +
               fStack_50c * fVar210 + fStack_5ac * fVar243 + auVar317._20_4_ * fVar218;
          auVar251._24_4_ =
               fStack_348 * fStack_828 +
               fStack_508 * fVar213 + fStack_5a8 * fVar253 + auVar317._24_4_ * fVar314;
          auVar251._28_4_ = fVar242 + fStack_464 + fStack_464 + *(float *)pauVar10[1];
          auVar340._0_4_ =
               (float)local_c0._0_4_ * fVar185 +
               (float)local_80._0_4_ * fVar215 + (float)local_a0._0_4_ * fVar254 +
               (float)local_e0._0_4_ * (float)local_840._0_4_;
          auVar340._4_4_ =
               (float)local_c0._4_4_ * fVar338 +
               (float)local_80._4_4_ * fVar220 + (float)local_a0._4_4_ * fVar255 +
               (float)local_e0._4_4_ * (float)local_840._4_4_;
          auVar340._8_4_ =
               fStack_b8 * fVar197 + fStack_78 * fVar232 + fStack_98 * fVar313 +
               fStack_d8 * fStack_838;
          auVar340._12_4_ =
               fStack_b4 * fVar256 + fStack_74 * fVar235 + fStack_94 * fVar343 +
               fStack_d4 * fStack_834;
          auVar340._16_4_ =
               fStack_b0 * fVar198 + fStack_70 * fVar238 + fStack_90 * fVar344 +
               fStack_d0 * fStack_830;
          auVar340._20_4_ =
               fStack_ac * fVar210 + fStack_6c * fVar243 + fStack_8c * fVar218 +
               fStack_cc * fStack_82c;
          auVar340._24_4_ =
               fStack_a8 * fVar213 + fStack_68 * fVar253 + fStack_88 * fVar314 +
               fStack_c8 * fStack_828;
          auVar340._28_4_ = fStack_464 + fStack_464 + fStack_84 + fVar242;
          auVar149 = ZEXT3264(auVar317._0_32_);
          auVar178 = vsubps_avx(auVar265,auVar299);
          auVar32 = vsubps_avx(auVar251,local_780);
          fVar215 = auVar178._0_4_;
          fVar220 = auVar178._4_4_;
          auVar68._4_4_ = fVar220 * local_780._4_4_;
          auVar68._0_4_ = fVar215 * (float)local_780._0_4_;
          fVar232 = auVar178._8_4_;
          auVar68._8_4_ = fVar232 * local_780._8_4_;
          fVar235 = auVar178._12_4_;
          auVar68._12_4_ = fVar235 * local_780._12_4_;
          fVar238 = auVar178._16_4_;
          auVar68._16_4_ = fVar238 * local_780._16_4_;
          fVar243 = auVar178._20_4_;
          auVar68._20_4_ = fVar243 * local_780._20_4_;
          fVar253 = auVar178._24_4_;
          auVar68._24_4_ = fVar253 * local_780._24_4_;
          auVar68._28_4_ = fVar242;
          fVar185 = auVar32._0_4_;
          fVar338 = auVar32._4_4_;
          auVar69._4_4_ = auVar299._4_4_ * fVar338;
          auVar69._0_4_ = auVar299._0_4_ * fVar185;
          fVar197 = auVar32._8_4_;
          auVar69._8_4_ = auVar299._8_4_ * fVar197;
          fVar256 = auVar32._12_4_;
          auVar69._12_4_ = auVar299._12_4_ * fVar256;
          fVar198 = auVar32._16_4_;
          auVar69._16_4_ = auVar299._16_4_ * fVar198;
          fVar210 = auVar32._20_4_;
          auVar69._20_4_ = auVar299._20_4_ * fVar210;
          fVar213 = auVar32._24_4_;
          auVar69._24_4_ = auVar299._24_4_ * fVar213;
          auVar69._28_4_ = auVar251._28_4_;
          auVar33 = vsubps_avx(auVar68,auVar69);
          auVar113._4_4_ = fVar151;
          auVar113._0_4_ = fVar137;
          auVar113._8_4_ = fVar153;
          auVar113._12_4_ = fVar154;
          auVar113._16_4_ = fVar156;
          auVar113._20_4_ = fVar157;
          auVar113._24_4_ = fVar159;
          auVar113._28_4_ = fVar160;
          auVar179 = ZEXT3264(auVar113);
          auVar250 = vmaxps_avx(auVar113,auVar340);
          auVar70._4_4_ = auVar250._4_4_ * auVar250._4_4_ * (fVar220 * fVar220 + fVar338 * fVar338);
          auVar70._0_4_ = auVar250._0_4_ * auVar250._0_4_ * (fVar215 * fVar215 + fVar185 * fVar185);
          auVar70._8_4_ = auVar250._8_4_ * auVar250._8_4_ * (fVar232 * fVar232 + fVar197 * fVar197);
          auVar70._12_4_ =
               auVar250._12_4_ * auVar250._12_4_ * (fVar235 * fVar235 + fVar256 * fVar256);
          auVar70._16_4_ =
               auVar250._16_4_ * auVar250._16_4_ * (fVar238 * fVar238 + fVar198 * fVar198);
          auVar70._20_4_ =
               auVar250._20_4_ * auVar250._20_4_ * (fVar243 * fVar243 + fVar210 * fVar210);
          auVar70._24_4_ =
               auVar250._24_4_ * auVar250._24_4_ * (fVar253 * fVar253 + fVar213 * fVar213);
          auVar70._28_4_ = auVar265._28_4_ + auVar251._28_4_;
          auVar71._4_4_ = auVar33._4_4_ * auVar33._4_4_;
          auVar71._0_4_ = auVar33._0_4_ * auVar33._0_4_;
          auVar71._8_4_ = auVar33._8_4_ * auVar33._8_4_;
          auVar71._12_4_ = auVar33._12_4_ * auVar33._12_4_;
          auVar71._16_4_ = auVar33._16_4_ * auVar33._16_4_;
          auVar71._20_4_ = auVar33._20_4_ * auVar33._20_4_;
          auVar71._24_4_ = auVar33._24_4_ * auVar33._24_4_;
          auVar71._28_4_ = auVar33._28_4_;
          auVar250 = vcmpps_avx(auVar71,auVar70,2);
          local_280 = (uint)lVar135;
          auVar245 = vpshufd_avx(ZEXT416(local_280),0);
          auVar226 = vpor_avx(auVar245,_DAT_01ff0cf0);
          auVar245 = vpor_avx(auVar245,_DAT_02020ea0);
          auVar226 = vpcmpgtd_avx(_local_380,auVar226);
          auVar245 = vpcmpgtd_avx(_local_380,auVar245);
          auVar208._16_16_ = auVar245;
          auVar208._0_16_ = auVar226;
          auVar209 = ZEXT3264(auVar208);
          auVar33 = auVar208 & auVar250;
          fVar185 = (float)local_600._0_4_;
          fVar338 = (float)local_600._4_4_;
          fVar197 = fStack_5f8;
          fVar256 = fStack_5f4;
          fVar198 = fStack_5f0;
          fVar210 = fStack_5ec;
          fVar213 = fStack_5e8;
          fVar215 = (float)local_520._0_4_;
          fVar220 = (float)local_520._4_4_;
          fVar232 = fStack_518;
          fVar235 = fStack_514;
          fVar238 = fStack_510;
          fVar243 = fStack_50c;
          fVar253 = fStack_508;
          fVar254 = (float)local_580._0_4_;
          fVar255 = (float)local_580._4_4_;
          fVar313 = fStack_578;
          fVar343 = fStack_574;
          fVar344 = fStack_570;
          fVar218 = fStack_56c;
          fVar314 = fStack_568;
          if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar33 >> 0x7f,0) == '\0') &&
                (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar33 >> 0xbf,0) == '\0') &&
              (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar33[0x1f]) {
            auVar317 = ZEXT3264(auVar317._0_32_);
          }
          else {
            local_760._0_4_ = auVar126._0_4_;
            local_760._4_4_ = auVar126._4_4_;
            uStack_758._0_4_ = auVar126._8_4_;
            uStack_758._4_4_ = auVar126._12_4_;
            fStack_750 = auVar126._16_4_;
            fStack_74c = auVar126._20_4_;
            fStack_748 = auVar126._24_4_;
            local_640._0_4_ = auVar125._0_4_;
            local_640._4_4_ = auVar125._4_4_;
            uStack_638._0_4_ = auVar125._8_4_;
            uStack_638._4_4_ = auVar125._12_4_;
            fStack_630 = auVar125._16_4_;
            fStack_62c = auVar125._20_4_;
            fStack_628 = auVar125._24_4_;
            local_5a0._0_4_ = auVar124._0_4_;
            local_5a0._4_4_ = auVar124._4_4_;
            fStack_598 = auVar124._8_4_;
            fStack_594 = auVar124._12_4_;
            fStack_590 = auVar124._16_4_;
            fStack_58c = auVar124._20_4_;
            fStack_588 = auVar124._24_4_;
            local_640._0_4_ =
                 (float)local_840._0_4_ * (float)local_160._0_4_ +
                 (float)local_320._0_4_ * (float)local_760._0_4_ +
                 (float)local_100._0_4_ * (float)local_640._0_4_ +
                 (float)local_660._0_4_ * (float)local_5a0._0_4_;
            local_640._4_4_ =
                 (float)local_840._4_4_ * (float)local_160._4_4_ +
                 (float)local_320._4_4_ * (float)local_760._4_4_ +
                 (float)local_100._4_4_ * (float)local_640._4_4_ +
                 (float)local_660._4_4_ * (float)local_5a0._4_4_;
            uStack_638._0_4_ =
                 fStack_838 * fStack_158 +
                 fStack_318 * (float)uStack_758 +
                 fStack_f8 * (float)uStack_638 + fStack_658 * fStack_598;
            uStack_638._4_4_ =
                 fStack_834 * fStack_154 +
                 fStack_314 * uStack_758._4_4_ +
                 fStack_f4 * uStack_638._4_4_ + fStack_654 * fStack_594;
            fStack_630 = fStack_830 * fStack_150 +
                         fStack_310 * fStack_750 + fStack_f0 * fStack_630 + fStack_650 * fStack_590;
            fStack_62c = fStack_82c * fStack_14c +
                         fStack_30c * fStack_74c + fStack_ec * fStack_62c + fStack_64c * fStack_58c;
            fStack_628 = fStack_828 * fStack_148 +
                         fStack_308 * fStack_748 + fStack_e8 * fStack_628 + fStack_648 * fStack_588;
            fStack_624 = auVar299._28_4_ + auVar317._28_4_ + fVar160 + 0.0;
            local_620._0_4_ = auVar121._0_4_;
            local_620._4_4_ = auVar121._4_4_;
            uStack_618._0_4_ = auVar121._8_4_;
            uStack_618._4_4_ = auVar121._12_4_;
            auStack_610._0_4_ = auVar121._16_4_;
            auStack_610._4_4_ = auVar121._20_4_;
            fStack_608 = auVar121._24_4_;
            local_720._0_4_ = auVar120._0_4_;
            local_720._4_4_ = auVar120._4_4_;
            uStack_718._0_4_ = auVar120._8_4_;
            uStack_718._4_4_ = auVar120._12_4_;
            auStack_710._0_4_ = auVar120._16_4_;
            auStack_710._4_4_ = auVar120._20_4_;
            fStack_708 = auVar120._24_4_;
            pfVar1 = (float *)(lVar21 + 0x2228dfc + lVar135 * 4);
            fVar242 = *pfVar1;
            fVar212 = pfVar1[1];
            fVar318 = pfVar1[2];
            fVar217 = pfVar1[3];
            fVar320 = pfVar1[4];
            fVar219 = pfVar1[5];
            fVar321 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x2229280 + lVar135 * 4);
            fVar257 = *pfVar2;
            fVar322 = pfVar2[1];
            fVar155 = pfVar2[2];
            fVar323 = pfVar2[3];
            fVar158 = pfVar2[4];
            fVar324 = pfVar2[5];
            fVar211 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x2228978 + lVar135 * 4);
            fVar180 = *pfVar3;
            fVar241 = pfVar3[1];
            fVar181 = pfVar3[2];
            fVar182 = pfVar3[3];
            fVar183 = pfVar3[4];
            fVar184 = pfVar3[5];
            fVar221 = pfVar3[6];
            fVar161 = pfVar1[7] + pfVar2[7];
            fVar186 = pfVar2[7] + auVar340._28_4_ + 0.0;
            fVar267 = auVar340._28_4_ + fStack_344 + auVar340._28_4_ + 0.0;
            pfVar1 = (float *)(lVar21 + 0x22284f4 + lVar135 * 4);
            fVar222 = *pfVar1;
            fVar233 = pfVar1[1];
            fVar234 = pfVar1[2];
            fVar236 = pfVar1[3];
            fVar237 = pfVar1[4];
            fVar239 = pfVar1[5];
            fVar288 = pfVar1[6];
            fStack_730 = fVar237 * fStack_330 +
                         fStack_570 * fVar183 + fStack_5f0 * fVar320 + fStack_470 * fVar158;
            fStack_72c = fVar239 * fStack_32c +
                         fStack_56c * fVar184 + fStack_5ec * fVar219 + fStack_46c * fVar324;
            fStack_728 = fVar288 * fStack_328 +
                         fStack_568 * fVar221 + fStack_5e8 * fVar321 + fStack_468 * fVar211;
            fStack_724 = fVar161 + fVar186;
            auVar175._0_4_ =
                 (float)local_360._0_4_ * fVar222 +
                 (float)local_5c0._0_4_ * fVar242 + fVar257 * (float)local_7c0._0_4_ +
                 fVar180 * (float)local_520._0_4_;
            auVar175._4_4_ =
                 (float)local_360._4_4_ * fVar233 +
                 (float)local_5c0._4_4_ * fVar212 + fVar322 * (float)local_7c0._4_4_ +
                 fVar241 * (float)local_520._4_4_;
            auVar175._8_4_ =
                 fStack_358 * fVar234 +
                 fStack_5b8 * fVar318 + fVar155 * fStack_7b8 + fVar181 * fStack_518;
            auVar175._12_4_ =
                 fStack_354 * fVar236 +
                 fStack_5b4 * fVar217 + fVar323 * fStack_7b4 + fVar182 * fStack_514;
            auVar175._16_4_ =
                 fStack_350 * fVar237 +
                 fStack_5b0 * fVar320 + fVar158 * fStack_7b0 + fVar183 * fStack_510;
            auVar175._20_4_ =
                 fStack_34c * fVar239 +
                 fStack_5ac * fVar219 + fVar324 * fStack_7ac + fVar184 * fStack_50c;
            auVar175._24_4_ =
                 fStack_348 * fVar288 +
                 fStack_5a8 * fVar321 + fVar211 * fStack_7a8 + fVar221 * fStack_508;
            auVar175._28_4_ = fVar186 + fVar267;
            auVar336._0_4_ =
                 fVar180 * (float)local_320._0_4_ +
                 (float)local_100._0_4_ * fVar242 + (float)local_660._0_4_ * fVar257 +
                 fVar222 * (float)local_160._0_4_;
            auVar336._4_4_ =
                 fVar241 * (float)local_320._4_4_ +
                 (float)local_100._4_4_ * fVar212 + (float)local_660._4_4_ * fVar322 +
                 fVar233 * (float)local_160._4_4_;
            auVar336._8_4_ =
                 fVar181 * fStack_318 + fStack_f8 * fVar318 + fStack_658 * fVar155 +
                 fVar234 * fStack_158;
            auVar336._12_4_ =
                 fVar182 * fStack_314 + fStack_f4 * fVar217 + fStack_654 * fVar323 +
                 fVar236 * fStack_154;
            auVar336._16_4_ =
                 fVar183 * fStack_310 + fStack_f0 * fVar320 + fStack_650 * fVar158 +
                 fVar237 * fStack_150;
            auVar336._20_4_ =
                 fVar184 * fStack_30c + fStack_ec * fVar219 + fStack_64c * fVar324 +
                 fVar239 * fStack_14c;
            auVar336._24_4_ =
                 fVar221 * fStack_308 + fStack_e8 * fVar321 + fStack_648 * fVar211 +
                 fVar288 * fStack_148;
            auVar336._28_4_ = pfVar3[7] + fVar161 + fVar267;
            pfVar1 = (float *)(lVar21 + 0x222b21c + lVar135 * 4);
            fVar320 = *pfVar1;
            fVar219 = pfVar1[1];
            fVar321 = pfVar1[2];
            fVar158 = pfVar1[3];
            fVar324 = pfVar1[4];
            fVar211 = pfVar1[5];
            fVar183 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x222b6a0 + lVar135 * 4);
            fVar184 = *pfVar2;
            fVar221 = pfVar2[1];
            fVar237 = pfVar2[2];
            fVar239 = pfVar2[3];
            fVar288 = pfVar2[4];
            fVar161 = pfVar2[5];
            fVar186 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x222ad98 + lVar135 * 4);
            fVar267 = *pfVar3;
            fVar240 = pfVar3[1];
            fVar268 = pfVar3[2];
            fVar279 = pfVar3[3];
            fVar281 = pfVar3[4];
            fVar283 = pfVar3[5];
            fVar319 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x222a914 + lVar135 * 4);
            fVar325 = *pfVar4;
            fVar331 = pfVar4[1];
            fVar332 = pfVar4[2];
            fVar333 = pfVar4[3];
            fVar334 = pfVar4[4];
            fVar269 = pfVar4[5];
            fVar280 = pfVar4[6];
            auVar300._0_4_ =
                 fVar325 * (float)local_340._0_4_ +
                 (float)local_580._0_4_ * fVar267 +
                 (float)local_600._0_4_ * fVar320 + (float)local_480._0_4_ * fVar184;
            auVar300._4_4_ =
                 fVar331 * (float)local_340._4_4_ +
                 (float)local_580._4_4_ * fVar240 +
                 (float)local_600._4_4_ * fVar219 + (float)local_480._4_4_ * fVar221;
            auVar300._8_4_ =
                 fVar332 * fStack_338 +
                 fStack_578 * fVar268 + fStack_5f8 * fVar321 + fStack_478 * fVar237;
            auVar300._12_4_ =
                 fVar333 * fStack_334 +
                 fStack_574 * fVar279 + fStack_5f4 * fVar158 + fStack_474 * fVar239;
            auVar300._16_4_ =
                 fVar334 * fStack_330 +
                 fStack_570 * fVar281 + fStack_5f0 * fVar324 + fStack_470 * fVar288;
            auVar300._20_4_ =
                 fVar269 * fStack_32c +
                 fStack_56c * fVar283 + fStack_5ec * fVar211 + fStack_46c * fVar161;
            auVar300._24_4_ =
                 fVar280 * fStack_328 +
                 fStack_568 * fVar319 + fStack_5e8 * fVar183 + fStack_468 * fVar186;
            auVar300._28_4_ = fStack_344 + fStack_344 + fStack_464 + fStack_344;
            auVar329._0_4_ =
                 fVar325 * (float)local_360._0_4_ +
                 fVar267 * (float)local_520._0_4_ +
                 (float)local_5c0._0_4_ * fVar320 + fVar184 * (float)local_7c0._0_4_;
            auVar329._4_4_ =
                 fVar331 * (float)local_360._4_4_ +
                 fVar240 * (float)local_520._4_4_ +
                 (float)local_5c0._4_4_ * fVar219 + fVar221 * (float)local_7c0._4_4_;
            auVar329._8_4_ =
                 fVar332 * fStack_358 +
                 fVar268 * fStack_518 + fStack_5b8 * fVar321 + fVar237 * fStack_7b8;
            auVar329._12_4_ =
                 fVar333 * fStack_354 +
                 fVar279 * fStack_514 + fStack_5b4 * fVar158 + fVar239 * fStack_7b4;
            auVar329._16_4_ =
                 fVar334 * fStack_350 +
                 fVar281 * fStack_510 + fStack_5b0 * fVar324 + fVar288 * fStack_7b0;
            auVar329._20_4_ =
                 fVar269 * fStack_34c +
                 fVar283 * fStack_50c + fStack_5ac * fVar211 + fVar161 * fStack_7ac;
            auVar329._24_4_ =
                 fVar280 * fStack_348 +
                 fVar319 * fStack_508 + fStack_5a8 * fVar183 + fVar186 * fStack_7a8;
            auVar329._28_4_ = fStack_344 + fStack_344 + fStack_644 + fStack_344;
            auVar252._8_4_ = 0x7fffffff;
            auVar252._0_8_ = 0x7fffffff7fffffff;
            auVar252._12_4_ = 0x7fffffff;
            auVar252._16_4_ = 0x7fffffff;
            auVar252._20_4_ = 0x7fffffff;
            auVar252._24_4_ = 0x7fffffff;
            auVar252._28_4_ = 0x7fffffff;
            auVar119._4_4_ =
                 fVar233 * (float)local_340._4_4_ +
                 (float)local_580._4_4_ * fVar241 +
                 (float)local_600._4_4_ * fVar212 + (float)local_480._4_4_ * fVar322;
            auVar119._0_4_ =
                 fVar222 * (float)local_340._0_4_ +
                 (float)local_580._0_4_ * fVar180 +
                 (float)local_600._0_4_ * fVar242 + (float)local_480._0_4_ * fVar257;
            auVar119._8_4_ =
                 fVar234 * fStack_338 +
                 fStack_578 * fVar181 + fStack_5f8 * fVar318 + fStack_478 * fVar155;
            auVar119._12_4_ =
                 fVar236 * fStack_334 +
                 fStack_574 * fVar182 + fStack_5f4 * fVar217 + fStack_474 * fVar323;
            auVar119._16_4_ = fStack_730;
            auVar119._20_4_ = fStack_72c;
            auVar119._24_4_ = fStack_728;
            auVar119._28_4_ = fStack_724;
            auVar33 = vandps_avx(auVar119,auVar252);
            auVar39 = vandps_avx(auVar175,auVar252);
            auVar39 = vmaxps_avx(auVar33,auVar39);
            auVar33 = vandps_avx(auVar336,auVar252);
            auVar39 = vmaxps_avx(auVar39,auVar33);
            auVar39 = vcmpps_avx(auVar39,_local_4c0,1);
            auVar22 = vblendvps_avx(auVar119,auVar178,auVar39);
            auVar146._0_4_ =
                 fVar325 * (float)local_160._0_4_ +
                 fVar267 * (float)local_320._0_4_ +
                 fVar184 * (float)local_660._0_4_ + (float)local_100._0_4_ * fVar320;
            auVar146._4_4_ =
                 fVar331 * (float)local_160._4_4_ +
                 fVar240 * (float)local_320._4_4_ +
                 fVar221 * (float)local_660._4_4_ + (float)local_100._4_4_ * fVar219;
            auVar146._8_4_ =
                 fVar332 * fStack_158 +
                 fVar268 * fStack_318 + fVar237 * fStack_658 + fStack_f8 * fVar321;
            auVar146._12_4_ =
                 fVar333 * fStack_154 +
                 fVar279 * fStack_314 + fVar239 * fStack_654 + fStack_f4 * fVar158;
            auVar146._16_4_ =
                 fVar334 * fStack_150 +
                 fVar281 * fStack_310 + fVar288 * fStack_650 + fStack_f0 * fVar324;
            auVar146._20_4_ =
                 fVar269 * fStack_14c +
                 fVar283 * fStack_30c + fVar161 * fStack_64c + fStack_ec * fVar211;
            auVar146._24_4_ =
                 fVar280 * fStack_148 +
                 fVar319 * fStack_308 + fVar186 * fStack_648 + fStack_e8 * fVar183;
            auVar146._28_4_ = auVar33._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar203 = vblendvps_avx(auVar175,auVar32,auVar39);
            auVar33 = vandps_avx(auVar300,auVar252);
            auVar39 = vandps_avx(auVar329,auVar252);
            auVar204 = vmaxps_avx(auVar33,auVar39);
            auVar33 = vandps_avx(auVar146,auVar252);
            auVar33 = vmaxps_avx(auVar204,auVar33);
            local_700._0_4_ = auVar123._0_4_;
            local_700._4_4_ = auVar123._4_4_;
            uStack_6f8._0_4_ = auVar123._8_4_;
            uStack_6f8._4_4_ = auVar123._12_4_;
            auStack_6f0._0_4_ = auVar123._16_4_;
            auStack_6f0._4_4_ = auVar123._20_4_;
            fStack_6e8 = auVar123._24_4_;
            auVar39 = vcmpps_avx(auVar33,_local_4c0,1);
            auVar33 = vblendvps_avx(auVar300,auVar178,auVar39);
            auVar147._0_4_ =
                 (float)local_160._0_4_ * (float)local_700._0_4_ +
                 (float)local_320._0_4_ * (float)local_620._0_4_ +
                 (float)local_100._0_4_ * (float)local_720._0_4_ + (float)local_660._0_4_ * fVar214;
            auVar147._4_4_ =
                 (float)local_160._4_4_ * (float)local_700._4_4_ +
                 (float)local_320._4_4_ * (float)local_620._4_4_ +
                 (float)local_100._4_4_ * (float)local_720._4_4_ + (float)local_660._4_4_ * fVar216;
            auVar147._8_4_ =
                 fStack_158 * (float)uStack_6f8 +
                 fStack_318 * (float)uStack_618 +
                 fStack_f8 * (float)uStack_718 + fStack_658 * fVar136;
            auVar147._12_4_ =
                 fStack_154 * uStack_6f8._4_4_ +
                 fStack_314 * uStack_618._4_4_ + fStack_f4 * uStack_718._4_4_ + fStack_654 * fVar150
            ;
            auVar147._16_4_ =
                 fStack_150 * (float)auStack_6f0._0_4_ +
                 fStack_310 * (float)auStack_610._0_4_ +
                 fStack_f0 * (float)auStack_710._0_4_ + fStack_650 * fVar152;
            auVar147._20_4_ =
                 fStack_14c * (float)auStack_6f0._4_4_ +
                 fStack_30c * (float)auStack_610._4_4_ +
                 fStack_ec * (float)auStack_710._4_4_ + fStack_64c * fVar258;
            auVar147._24_4_ =
                 fStack_148 * fStack_6e8 +
                 fStack_308 * fStack_608 + fStack_e8 * fStack_708 + fStack_648 * fVar162;
            auVar147._28_4_ = auVar204._28_4_ + fStack_624 + fVar160 + 0.0;
            auVar39 = vblendvps_avx(auVar329,auVar32,auVar39);
            fVar161 = auVar22._0_4_;
            fVar186 = auVar22._4_4_;
            fVar267 = auVar22._8_4_;
            fVar240 = auVar22._12_4_;
            fVar268 = auVar22._16_4_;
            fVar279 = auVar22._20_4_;
            fVar281 = auVar22._24_4_;
            fVar283 = auVar22._28_4_;
            fVar214 = auVar33._0_4_;
            fVar136 = auVar33._4_4_;
            fVar152 = auVar33._8_4_;
            fVar162 = auVar33._12_4_;
            fVar241 = auVar33._16_4_;
            fVar182 = auVar33._20_4_;
            fVar184 = auVar33._24_4_;
            fVar242 = auVar203._0_4_;
            fVar318 = auVar203._4_4_;
            fVar320 = auVar203._8_4_;
            fVar321 = auVar203._12_4_;
            fVar322 = auVar203._16_4_;
            fVar323 = auVar203._20_4_;
            fVar324 = auVar203._24_4_;
            auVar311._0_4_ = fVar242 * fVar242 + fVar161 * fVar161;
            auVar311._4_4_ = fVar318 * fVar318 + fVar186 * fVar186;
            auVar311._8_4_ = fVar320 * fVar320 + fVar267 * fVar267;
            auVar311._12_4_ = fVar321 * fVar321 + fVar240 * fVar240;
            auVar311._16_4_ = fVar322 * fVar322 + fVar268 * fVar268;
            auVar311._20_4_ = fVar323 * fVar323 + fVar279 * fVar279;
            auVar311._24_4_ = fVar324 * fVar324 + fVar281 * fVar281;
            auVar311._28_4_ = auVar178._28_4_ + fStack_5a4;
            auVar178 = vrsqrtps_avx(auVar311);
            fVar212 = auVar178._0_4_;
            fVar217 = auVar178._4_4_;
            auVar72._4_4_ = fVar217 * 1.5;
            auVar72._0_4_ = fVar212 * 1.5;
            fVar219 = auVar178._8_4_;
            auVar72._8_4_ = fVar219 * 1.5;
            fVar257 = auVar178._12_4_;
            auVar72._12_4_ = fVar257 * 1.5;
            fVar155 = auVar178._16_4_;
            auVar72._16_4_ = fVar155 * 1.5;
            fVar158 = auVar178._20_4_;
            auVar72._20_4_ = fVar158 * 1.5;
            fVar211 = auVar178._24_4_;
            auVar72._24_4_ = fVar211 * 1.5;
            auVar72._28_4_ = auVar329._28_4_;
            auVar73._4_4_ = fVar217 * fVar217 * fVar217 * auVar311._4_4_ * 0.5;
            auVar73._0_4_ = fVar212 * fVar212 * fVar212 * auVar311._0_4_ * 0.5;
            auVar73._8_4_ = fVar219 * fVar219 * fVar219 * auVar311._8_4_ * 0.5;
            auVar73._12_4_ = fVar257 * fVar257 * fVar257 * auVar311._12_4_ * 0.5;
            auVar73._16_4_ = fVar155 * fVar155 * fVar155 * auVar311._16_4_ * 0.5;
            auVar73._20_4_ = fVar158 * fVar158 * fVar158 * auVar311._20_4_ * 0.5;
            auVar73._24_4_ = fVar211 * fVar211 * fVar211 * auVar311._24_4_ * 0.5;
            auVar73._28_4_ = auVar311._28_4_;
            auVar22 = vsubps_avx(auVar72,auVar73);
            fVar222 = auVar22._0_4_;
            fVar233 = auVar22._4_4_;
            fVar234 = auVar22._8_4_;
            fVar236 = auVar22._12_4_;
            fVar237 = auVar22._16_4_;
            fVar239 = auVar22._20_4_;
            fVar288 = auVar22._24_4_;
            fVar212 = auVar39._0_4_;
            fVar217 = auVar39._4_4_;
            fVar219 = auVar39._8_4_;
            fVar257 = auVar39._12_4_;
            fVar155 = auVar39._16_4_;
            fVar158 = auVar39._20_4_;
            fVar211 = auVar39._24_4_;
            auVar293._0_4_ = fVar212 * fVar212 + fVar214 * fVar214;
            auVar293._4_4_ = fVar217 * fVar217 + fVar136 * fVar136;
            auVar293._8_4_ = fVar219 * fVar219 + fVar152 * fVar152;
            auVar293._12_4_ = fVar257 * fVar257 + fVar162 * fVar162;
            auVar293._16_4_ = fVar155 * fVar155 + fVar241 * fVar241;
            auVar293._20_4_ = fVar158 * fVar158 + fVar182 * fVar182;
            auVar293._24_4_ = fVar211 * fVar211 + fVar184 * fVar184;
            auVar293._28_4_ = auVar178._28_4_ + auVar33._28_4_;
            auVar178 = vrsqrtps_avx(auVar293);
            fVar216 = auVar178._0_4_;
            fVar150 = auVar178._4_4_;
            auVar74._4_4_ = fVar150 * 1.5;
            auVar74._0_4_ = fVar216 * 1.5;
            fVar258 = auVar178._8_4_;
            auVar74._8_4_ = fVar258 * 1.5;
            fVar180 = auVar178._12_4_;
            auVar74._12_4_ = fVar180 * 1.5;
            fVar181 = auVar178._16_4_;
            auVar74._16_4_ = fVar181 * 1.5;
            fVar183 = auVar178._20_4_;
            auVar74._20_4_ = fVar183 * 1.5;
            fVar221 = auVar178._24_4_;
            auVar74._24_4_ = fVar221 * 1.5;
            auVar74._28_4_ = auVar329._28_4_;
            auVar75._4_4_ = fVar150 * fVar150 * fVar150 * auVar293._4_4_ * 0.5;
            auVar75._0_4_ = fVar216 * fVar216 * fVar216 * auVar293._0_4_ * 0.5;
            auVar75._8_4_ = fVar258 * fVar258 * fVar258 * auVar293._8_4_ * 0.5;
            auVar75._12_4_ = fVar180 * fVar180 * fVar180 * auVar293._12_4_ * 0.5;
            auVar75._16_4_ = fVar181 * fVar181 * fVar181 * auVar293._16_4_ * 0.5;
            auVar75._20_4_ = fVar183 * fVar183 * fVar183 * auVar293._20_4_ * 0.5;
            auVar75._24_4_ = fVar221 * fVar221 * fVar221 * auVar293._24_4_ * 0.5;
            auVar75._28_4_ = auVar293._28_4_;
            auVar33 = vsubps_avx(auVar74,auVar75);
            fVar216 = auVar33._0_4_;
            fVar150 = auVar33._4_4_;
            fVar258 = auVar33._8_4_;
            fVar180 = auVar33._12_4_;
            fVar181 = auVar33._16_4_;
            fVar183 = auVar33._20_4_;
            fVar221 = auVar33._24_4_;
            fVar242 = fVar137 * fVar222 * fVar242;
            fVar318 = fVar151 * fVar233 * fVar318;
            auVar76._4_4_ = fVar318;
            auVar76._0_4_ = fVar242;
            fVar320 = fVar153 * fVar234 * fVar320;
            auVar76._8_4_ = fVar320;
            fVar321 = fVar154 * fVar236 * fVar321;
            auVar76._12_4_ = fVar321;
            fVar322 = fVar156 * fVar237 * fVar322;
            auVar76._16_4_ = fVar322;
            fVar323 = fVar157 * fVar239 * fVar323;
            auVar76._20_4_ = fVar323;
            fVar324 = fVar159 * fVar288 * fVar324;
            auVar76._24_4_ = fVar324;
            auVar76._28_4_ = auVar178._28_4_;
            local_700._4_4_ = fVar318 + auVar299._4_4_;
            local_700._0_4_ = fVar242 + auVar299._0_4_;
            uStack_6f8._0_4_ = fVar320 + auVar299._8_4_;
            uStack_6f8._4_4_ = fVar321 + auVar299._12_4_;
            auStack_6f0._0_4_ = fVar322 + auVar299._16_4_;
            auStack_6f0._4_4_ = fVar323 + auVar299._20_4_;
            fStack_6e8 = fVar324 + auVar299._24_4_;
            fStack_6e4 = auVar178._28_4_ + auVar299._28_4_;
            fVar242 = fVar137 * fVar222 * -fVar161;
            fVar318 = fVar151 * fVar233 * -fVar186;
            auVar77._4_4_ = fVar318;
            auVar77._0_4_ = fVar242;
            fVar320 = fVar153 * fVar234 * -fVar267;
            auVar77._8_4_ = fVar320;
            fVar321 = fVar154 * fVar236 * -fVar240;
            auVar77._12_4_ = fVar321;
            fVar322 = fVar156 * fVar237 * -fVar268;
            auVar77._16_4_ = fVar322;
            fVar323 = fVar157 * fVar239 * -fVar279;
            auVar77._20_4_ = fVar323;
            fVar324 = fVar159 * fVar288 * -fVar281;
            auVar77._24_4_ = fVar324;
            auVar77._28_4_ = -fVar283;
            local_720._4_4_ = local_780._4_4_ + fVar318;
            local_720._0_4_ = (float)local_780._0_4_ + fVar242;
            uStack_718._0_4_ = local_780._8_4_ + fVar320;
            uStack_718._4_4_ = local_780._12_4_ + fVar321;
            auStack_710._0_4_ = local_780._16_4_ + fVar322;
            auStack_710._4_4_ = local_780._20_4_ + fVar323;
            fStack_708 = local_780._24_4_ + fVar324;
            fStack_704 = local_780._28_4_ + -fVar283;
            fVar242 = fVar222 * 0.0 * fVar137;
            fVar318 = fVar233 * 0.0 * fVar151;
            auVar78._4_4_ = fVar318;
            auVar78._0_4_ = fVar242;
            fVar320 = fVar234 * 0.0 * fVar153;
            auVar78._8_4_ = fVar320;
            fVar321 = fVar236 * 0.0 * fVar154;
            auVar78._12_4_ = fVar321;
            fVar322 = fVar237 * 0.0 * fVar156;
            auVar78._16_4_ = fVar322;
            fVar323 = fVar239 * 0.0 * fVar157;
            auVar78._20_4_ = fVar323;
            fVar324 = fVar288 * 0.0 * fVar159;
            auVar78._24_4_ = fVar324;
            auVar78._28_4_ = fVar283;
            auVar227 = vsubps_avx(auVar299,auVar76);
            auVar342._0_4_ = fVar242 + auVar147._0_4_;
            auVar342._4_4_ = fVar318 + auVar147._4_4_;
            auVar342._8_4_ = fVar320 + auVar147._8_4_;
            auVar342._12_4_ = fVar321 + auVar147._12_4_;
            auVar342._16_4_ = fVar322 + auVar147._16_4_;
            auVar342._20_4_ = fVar323 + auVar147._20_4_;
            auVar342._24_4_ = fVar324 + auVar147._24_4_;
            auVar342._28_4_ = fVar283 + auVar147._28_4_;
            fVar242 = auVar340._0_4_ * fVar216 * fVar212;
            fVar212 = auVar340._4_4_ * fVar150 * fVar217;
            auVar79._4_4_ = fVar212;
            auVar79._0_4_ = fVar242;
            fVar318 = auVar340._8_4_ * fVar258 * fVar219;
            auVar79._8_4_ = fVar318;
            fVar217 = auVar340._12_4_ * fVar180 * fVar257;
            auVar79._12_4_ = fVar217;
            fVar320 = auVar340._16_4_ * fVar181 * fVar155;
            auVar79._16_4_ = fVar320;
            fVar219 = auVar340._20_4_ * fVar183 * fVar158;
            auVar79._20_4_ = fVar219;
            fVar321 = auVar340._24_4_ * fVar221 * fVar211;
            auVar79._24_4_ = fVar321;
            auVar79._28_4_ = fVar160;
            auVar34 = vsubps_avx(local_780,auVar77);
            auVar337._0_4_ = auVar265._0_4_ + fVar242;
            auVar337._4_4_ = auVar265._4_4_ + fVar212;
            auVar337._8_4_ = auVar265._8_4_ + fVar318;
            auVar337._12_4_ = auVar265._12_4_ + fVar217;
            auVar337._16_4_ = auVar265._16_4_ + fVar320;
            auVar337._20_4_ = auVar265._20_4_ + fVar219;
            auVar337._24_4_ = auVar265._24_4_ + fVar321;
            auVar337._28_4_ = auVar265._28_4_ + fVar160;
            fVar242 = fVar216 * -fVar214 * auVar340._0_4_;
            fVar212 = fVar150 * -fVar136 * auVar340._4_4_;
            auVar80._4_4_ = fVar212;
            auVar80._0_4_ = fVar242;
            fVar318 = fVar258 * -fVar152 * auVar340._8_4_;
            auVar80._8_4_ = fVar318;
            fVar217 = fVar180 * -fVar162 * auVar340._12_4_;
            auVar80._12_4_ = fVar217;
            fVar320 = fVar181 * -fVar241 * auVar340._16_4_;
            auVar80._16_4_ = fVar320;
            fVar219 = fVar183 * -fVar182 * auVar340._20_4_;
            auVar80._20_4_ = fVar219;
            fVar321 = fVar221 * -fVar184 * auVar340._24_4_;
            auVar80._24_4_ = fVar321;
            auVar80._28_4_ = auVar299._28_4_;
            auVar35 = vsubps_avx(auVar147,auVar78);
            auVar230._0_4_ = auVar251._0_4_ + fVar242;
            auVar230._4_4_ = auVar251._4_4_ + fVar212;
            auVar230._8_4_ = auVar251._8_4_ + fVar318;
            auVar230._12_4_ = auVar251._12_4_ + fVar217;
            auVar230._16_4_ = auVar251._16_4_ + fVar320;
            auVar230._20_4_ = auVar251._20_4_ + fVar219;
            auVar230._24_4_ = auVar251._24_4_ + fVar321;
            auVar230._28_4_ = auVar251._28_4_ + auVar299._28_4_;
            fVar242 = fVar216 * 0.0 * auVar340._0_4_;
            fVar212 = fVar150 * 0.0 * auVar340._4_4_;
            auVar81._4_4_ = fVar212;
            auVar81._0_4_ = fVar242;
            fVar318 = fVar258 * 0.0 * auVar340._8_4_;
            auVar81._8_4_ = fVar318;
            fVar217 = fVar180 * 0.0 * auVar340._12_4_;
            auVar81._12_4_ = fVar217;
            fVar320 = fVar181 * 0.0 * auVar340._16_4_;
            auVar81._16_4_ = fVar320;
            fVar219 = fVar183 * 0.0 * auVar340._20_4_;
            auVar81._20_4_ = fVar219;
            fVar321 = fVar221 * 0.0 * auVar340._24_4_;
            auVar81._24_4_ = fVar321;
            auVar81._28_4_ = auVar147._28_4_;
            auVar178 = vsubps_avx(auVar265,auVar79);
            auVar301._0_4_ = (float)local_640._0_4_ + fVar242;
            auVar301._4_4_ = (float)local_640._4_4_ + fVar212;
            auVar301._8_4_ = (float)uStack_638 + fVar318;
            auVar301._12_4_ = uStack_638._4_4_ + fVar217;
            auVar301._16_4_ = fStack_630 + fVar320;
            auVar301._20_4_ = fStack_62c + fVar219;
            auVar301._24_4_ = fStack_628 + fVar321;
            auVar301._28_4_ = fStack_624 + auVar147._28_4_;
            auVar39 = vsubps_avx(auVar251,auVar80);
            auVar22 = vsubps_avx(_local_640,auVar81);
            auVar203 = vsubps_avx(auVar230,auVar34);
            auVar204 = vsubps_avx(auVar301,auVar35);
            auVar82._4_4_ = auVar35._4_4_ * auVar203._4_4_;
            auVar82._0_4_ = auVar35._0_4_ * auVar203._0_4_;
            auVar82._8_4_ = auVar35._8_4_ * auVar203._8_4_;
            auVar82._12_4_ = auVar35._12_4_ * auVar203._12_4_;
            auVar82._16_4_ = auVar35._16_4_ * auVar203._16_4_;
            auVar82._20_4_ = auVar35._20_4_ * auVar203._20_4_;
            auVar82._24_4_ = auVar35._24_4_ * auVar203._24_4_;
            auVar82._28_4_ = auVar329._28_4_;
            auVar83._4_4_ = auVar34._4_4_ * auVar204._4_4_;
            auVar83._0_4_ = auVar34._0_4_ * auVar204._0_4_;
            auVar83._8_4_ = auVar34._8_4_ * auVar204._8_4_;
            auVar83._12_4_ = auVar34._12_4_ * auVar204._12_4_;
            auVar83._16_4_ = auVar34._16_4_ * auVar204._16_4_;
            auVar83._20_4_ = auVar34._20_4_ * auVar204._20_4_;
            auVar83._24_4_ = auVar34._24_4_ * auVar204._24_4_;
            auVar83._28_4_ = fStack_624;
            auVar276 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar227._4_4_ * auVar204._4_4_;
            auVar84._0_4_ = auVar227._0_4_ * auVar204._0_4_;
            auVar84._8_4_ = auVar227._8_4_ * auVar204._8_4_;
            auVar84._12_4_ = auVar227._12_4_ * auVar204._12_4_;
            auVar84._16_4_ = auVar227._16_4_ * auVar204._16_4_;
            auVar84._20_4_ = auVar227._20_4_ * auVar204._20_4_;
            auVar84._24_4_ = auVar227._24_4_ * auVar204._24_4_;
            auVar84._28_4_ = auVar204._28_4_;
            auVar204 = vsubps_avx(auVar337,auVar227);
            auVar85._4_4_ = auVar35._4_4_ * auVar204._4_4_;
            auVar85._0_4_ = auVar35._0_4_ * auVar204._0_4_;
            auVar85._8_4_ = auVar35._8_4_ * auVar204._8_4_;
            auVar85._12_4_ = auVar35._12_4_ * auVar204._12_4_;
            auVar85._16_4_ = auVar35._16_4_ * auVar204._16_4_;
            auVar85._20_4_ = auVar35._20_4_ * auVar204._20_4_;
            auVar85._24_4_ = auVar35._24_4_ * auVar204._24_4_;
            auVar85._28_4_ = auVar33._28_4_;
            auVar297 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar34._4_4_ * auVar204._4_4_;
            auVar86._0_4_ = auVar34._0_4_ * auVar204._0_4_;
            auVar86._8_4_ = auVar34._8_4_ * auVar204._8_4_;
            auVar86._12_4_ = auVar34._12_4_ * auVar204._12_4_;
            auVar86._16_4_ = auVar34._16_4_ * auVar204._16_4_;
            auVar86._20_4_ = auVar34._20_4_ * auVar204._20_4_;
            auVar86._24_4_ = auVar34._24_4_ * auVar204._24_4_;
            auVar86._28_4_ = auVar33._28_4_;
            auVar87._4_4_ = auVar227._4_4_ * auVar203._4_4_;
            auVar87._0_4_ = auVar227._0_4_ * auVar203._0_4_;
            auVar87._8_4_ = auVar227._8_4_ * auVar203._8_4_;
            auVar87._12_4_ = auVar227._12_4_ * auVar203._12_4_;
            auVar87._16_4_ = auVar227._16_4_ * auVar203._16_4_;
            auVar87._20_4_ = auVar227._20_4_ * auVar203._20_4_;
            auVar87._24_4_ = auVar227._24_4_ * auVar203._24_4_;
            auVar87._28_4_ = auVar203._28_4_;
            auVar33 = vsubps_avx(auVar87,auVar86);
            auVar176._0_4_ = auVar276._0_4_ * 0.0 + auVar33._0_4_ + auVar297._0_4_ * 0.0;
            auVar176._4_4_ = auVar276._4_4_ * 0.0 + auVar33._4_4_ + auVar297._4_4_ * 0.0;
            auVar176._8_4_ = auVar276._8_4_ * 0.0 + auVar33._8_4_ + auVar297._8_4_ * 0.0;
            auVar176._12_4_ = auVar276._12_4_ * 0.0 + auVar33._12_4_ + auVar297._12_4_ * 0.0;
            auVar176._16_4_ = auVar276._16_4_ * 0.0 + auVar33._16_4_ + auVar297._16_4_ * 0.0;
            auVar176._20_4_ = auVar276._20_4_ * 0.0 + auVar33._20_4_ + auVar297._20_4_ * 0.0;
            auVar176._24_4_ = auVar276._24_4_ * 0.0 + auVar33._24_4_ + auVar297._24_4_ * 0.0;
            auVar176._28_4_ = auVar276._28_4_ + auVar33._28_4_ + auVar297._28_4_;
            auVar23 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,2);
            auVar178 = vblendvps_avx(auVar178,_local_700,auVar23);
            auVar209 = ZEXT3264(auVar178);
            auVar33 = vblendvps_avx(auVar39,_local_720,auVar23);
            auVar39 = vblendvps_avx(auVar22,auVar342,auVar23);
            auVar22 = vblendvps_avx(auVar227,auVar337,auVar23);
            auVar203 = vblendvps_avx(auVar34,auVar230,auVar23);
            auVar204 = vblendvps_avx(auVar35,auVar301,auVar23);
            auVar227 = vblendvps_avx(auVar337,auVar227,auVar23);
            auVar276 = vblendvps_avx(auVar230,auVar34,auVar23);
            auVar297 = vblendvps_avx(auVar301,auVar35,auVar23);
            local_780 = vandps_avx(auVar250,auVar208);
            auVar227 = vsubps_avx(auVar227,auVar178);
            auVar36 = vsubps_avx(auVar276,auVar33);
            auVar297 = vsubps_avx(auVar297,auVar39);
            auVar37 = vsubps_avx(auVar33,auVar203);
            fVar242 = auVar36._0_4_;
            fVar269 = auVar39._0_4_;
            fVar257 = auVar36._4_4_;
            fVar280 = auVar39._4_4_;
            auVar88._4_4_ = fVar280 * fVar257;
            auVar88._0_4_ = fVar269 * fVar242;
            fVar214 = auVar36._8_4_;
            fVar282 = auVar39._8_4_;
            auVar88._8_4_ = fVar282 * fVar214;
            fVar180 = auVar36._12_4_;
            fVar284 = auVar39._12_4_;
            auVar88._12_4_ = fVar284 * fVar180;
            fVar222 = auVar36._16_4_;
            fVar285 = auVar39._16_4_;
            auVar88._16_4_ = fVar285 * fVar222;
            fVar161 = auVar36._20_4_;
            fVar286 = auVar39._20_4_;
            auVar88._20_4_ = fVar286 * fVar161;
            fVar283 = auVar36._24_4_;
            fVar287 = auVar39._24_4_;
            auVar88._24_4_ = fVar287 * fVar283;
            auVar88._28_4_ = auVar276._28_4_;
            fVar212 = auVar33._0_4_;
            fVar295 = auVar297._0_4_;
            fVar322 = auVar33._4_4_;
            fVar303 = auVar297._4_4_;
            auVar89._4_4_ = fVar303 * fVar322;
            auVar89._0_4_ = fVar295 * fVar212;
            fVar216 = auVar33._8_4_;
            fVar304 = auVar297._8_4_;
            auVar89._8_4_ = fVar304 * fVar216;
            fVar241 = auVar33._12_4_;
            fVar305 = auVar297._12_4_;
            auVar89._12_4_ = fVar305 * fVar241;
            fVar233 = auVar33._16_4_;
            fVar306 = auVar297._16_4_;
            auVar89._16_4_ = fVar306 * fVar233;
            fVar186 = auVar33._20_4_;
            fVar307 = auVar297._20_4_;
            auVar89._20_4_ = fVar307 * fVar186;
            fVar319 = auVar33._24_4_;
            fVar308 = auVar297._24_4_;
            uVar289 = auVar34._28_4_;
            auVar89._24_4_ = fVar308 * fVar319;
            auVar89._28_4_ = uVar289;
            auVar276 = vsubps_avx(auVar89,auVar88);
            fVar318 = auVar178._0_4_;
            fVar155 = auVar178._4_4_;
            auVar90._4_4_ = fVar303 * fVar155;
            auVar90._0_4_ = fVar295 * fVar318;
            fVar136 = auVar178._8_4_;
            auVar90._8_4_ = fVar304 * fVar136;
            fVar181 = auVar178._12_4_;
            auVar90._12_4_ = fVar305 * fVar181;
            fVar234 = auVar178._16_4_;
            auVar90._16_4_ = fVar306 * fVar234;
            fVar267 = auVar178._20_4_;
            auVar90._20_4_ = fVar307 * fVar267;
            fVar325 = auVar178._24_4_;
            auVar90._24_4_ = fVar308 * fVar325;
            auVar90._28_4_ = uVar289;
            fVar217 = auVar227._0_4_;
            fVar323 = auVar227._4_4_;
            auVar91._4_4_ = fVar280 * fVar323;
            auVar91._0_4_ = fVar269 * fVar217;
            fVar150 = auVar227._8_4_;
            auVar91._8_4_ = fVar282 * fVar150;
            fVar182 = auVar227._12_4_;
            auVar91._12_4_ = fVar284 * fVar182;
            fVar236 = auVar227._16_4_;
            auVar91._16_4_ = fVar285 * fVar236;
            fVar240 = auVar227._20_4_;
            auVar91._20_4_ = fVar286 * fVar240;
            fVar331 = auVar227._24_4_;
            auVar91._24_4_ = fVar287 * fVar331;
            auVar91._28_4_ = auVar337._28_4_;
            auVar34 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar322 * fVar323;
            auVar92._0_4_ = fVar212 * fVar217;
            auVar92._8_4_ = fVar216 * fVar150;
            auVar92._12_4_ = fVar241 * fVar182;
            auVar92._16_4_ = fVar233 * fVar236;
            auVar92._20_4_ = fVar186 * fVar240;
            auVar92._24_4_ = fVar319 * fVar331;
            auVar92._28_4_ = uVar289;
            auVar93._4_4_ = fVar155 * fVar257;
            auVar93._0_4_ = fVar318 * fVar242;
            auVar93._8_4_ = fVar136 * fVar214;
            auVar93._12_4_ = fVar181 * fVar180;
            auVar93._16_4_ = fVar234 * fVar222;
            auVar93._20_4_ = fVar267 * fVar161;
            auVar93._24_4_ = fVar325 * fVar283;
            auVar93._28_4_ = auVar35._28_4_;
            auVar35 = vsubps_avx(auVar93,auVar92);
            auVar38 = vsubps_avx(auVar39,auVar204);
            fVar219 = auVar35._28_4_ + auVar34._28_4_;
            auVar312._0_4_ = auVar35._0_4_ + auVar34._0_4_ * 0.0 + auVar276._0_4_ * 0.0;
            auVar312._4_4_ = auVar35._4_4_ + auVar34._4_4_ * 0.0 + auVar276._4_4_ * 0.0;
            auVar312._8_4_ = auVar35._8_4_ + auVar34._8_4_ * 0.0 + auVar276._8_4_ * 0.0;
            auVar312._12_4_ = auVar35._12_4_ + auVar34._12_4_ * 0.0 + auVar276._12_4_ * 0.0;
            auVar312._16_4_ = auVar35._16_4_ + auVar34._16_4_ * 0.0 + auVar276._16_4_ * 0.0;
            auVar312._20_4_ = auVar35._20_4_ + auVar34._20_4_ * 0.0 + auVar276._20_4_ * 0.0;
            auVar312._24_4_ = auVar35._24_4_ + auVar34._24_4_ * 0.0 + auVar276._24_4_ * 0.0;
            auVar312._28_4_ = fVar219 + auVar276._28_4_;
            fVar320 = auVar37._0_4_;
            fVar158 = auVar37._4_4_;
            auVar94._4_4_ = auVar204._4_4_ * fVar158;
            auVar94._0_4_ = auVar204._0_4_ * fVar320;
            fVar152 = auVar37._8_4_;
            auVar94._8_4_ = auVar204._8_4_ * fVar152;
            fVar183 = auVar37._12_4_;
            auVar94._12_4_ = auVar204._12_4_ * fVar183;
            fVar237 = auVar37._16_4_;
            auVar94._16_4_ = auVar204._16_4_ * fVar237;
            fVar268 = auVar37._20_4_;
            auVar94._20_4_ = auVar204._20_4_ * fVar268;
            fVar332 = auVar37._24_4_;
            auVar94._24_4_ = auVar204._24_4_ * fVar332;
            auVar94._28_4_ = fVar219;
            fVar219 = auVar38._0_4_;
            fVar324 = auVar38._4_4_;
            auVar95._4_4_ = auVar203._4_4_ * fVar324;
            auVar95._0_4_ = auVar203._0_4_ * fVar219;
            fVar258 = auVar38._8_4_;
            auVar95._8_4_ = auVar203._8_4_ * fVar258;
            fVar184 = auVar38._12_4_;
            auVar95._12_4_ = auVar203._12_4_ * fVar184;
            fVar239 = auVar38._16_4_;
            auVar95._16_4_ = auVar203._16_4_ * fVar239;
            fVar279 = auVar38._20_4_;
            auVar95._20_4_ = auVar203._20_4_ * fVar279;
            fVar333 = auVar38._24_4_;
            auVar95._24_4_ = auVar203._24_4_ * fVar333;
            auVar95._28_4_ = auVar35._28_4_;
            auVar34 = vsubps_avx(auVar95,auVar94);
            auVar35 = vsubps_avx(auVar178,auVar22);
            fVar321 = auVar35._0_4_;
            fVar211 = auVar35._4_4_;
            auVar96._4_4_ = auVar204._4_4_ * fVar211;
            auVar96._0_4_ = auVar204._0_4_ * fVar321;
            fVar162 = auVar35._8_4_;
            auVar96._8_4_ = auVar204._8_4_ * fVar162;
            fVar221 = auVar35._12_4_;
            auVar96._12_4_ = auVar204._12_4_ * fVar221;
            fVar288 = auVar35._16_4_;
            auVar96._16_4_ = auVar204._16_4_ * fVar288;
            fVar281 = auVar35._20_4_;
            auVar96._20_4_ = auVar204._20_4_ * fVar281;
            fVar334 = auVar35._24_4_;
            auVar96._24_4_ = auVar204._24_4_ * fVar334;
            auVar96._28_4_ = auVar204._28_4_;
            auVar97._4_4_ = fVar324 * auVar22._4_4_;
            auVar97._0_4_ = fVar219 * auVar22._0_4_;
            auVar97._8_4_ = fVar258 * auVar22._8_4_;
            auVar97._12_4_ = fVar184 * auVar22._12_4_;
            auVar97._16_4_ = fVar239 * auVar22._16_4_;
            auVar97._20_4_ = fVar279 * auVar22._20_4_;
            auVar97._24_4_ = fVar333 * auVar22._24_4_;
            auVar97._28_4_ = auVar276._28_4_;
            auVar204 = vsubps_avx(auVar96,auVar97);
            auVar98._4_4_ = auVar203._4_4_ * fVar211;
            auVar98._0_4_ = auVar203._0_4_ * fVar321;
            auVar98._8_4_ = auVar203._8_4_ * fVar162;
            auVar98._12_4_ = auVar203._12_4_ * fVar221;
            auVar98._16_4_ = auVar203._16_4_ * fVar288;
            auVar98._20_4_ = auVar203._20_4_ * fVar281;
            auVar98._24_4_ = auVar203._24_4_ * fVar334;
            auVar98._28_4_ = auVar203._28_4_;
            auVar99._4_4_ = fVar158 * auVar22._4_4_;
            auVar99._0_4_ = fVar320 * auVar22._0_4_;
            auVar99._8_4_ = fVar152 * auVar22._8_4_;
            auVar99._12_4_ = fVar183 * auVar22._12_4_;
            auVar99._16_4_ = fVar237 * auVar22._16_4_;
            auVar99._20_4_ = fVar268 * auVar22._20_4_;
            auVar99._24_4_ = fVar332 * auVar22._24_4_;
            auVar99._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar99,auVar98);
            auVar148._0_4_ = auVar34._0_4_ * 0.0 + auVar22._0_4_ + auVar204._0_4_ * 0.0;
            auVar148._4_4_ = auVar34._4_4_ * 0.0 + auVar22._4_4_ + auVar204._4_4_ * 0.0;
            auVar148._8_4_ = auVar34._8_4_ * 0.0 + auVar22._8_4_ + auVar204._8_4_ * 0.0;
            auVar148._12_4_ = auVar34._12_4_ * 0.0 + auVar22._12_4_ + auVar204._12_4_ * 0.0;
            auVar148._16_4_ = auVar34._16_4_ * 0.0 + auVar22._16_4_ + auVar204._16_4_ * 0.0;
            auVar148._20_4_ = auVar34._20_4_ * 0.0 + auVar22._20_4_ + auVar204._20_4_ * 0.0;
            auVar148._24_4_ = auVar34._24_4_ * 0.0 + auVar22._24_4_ + auVar204._24_4_ * 0.0;
            auVar148._28_4_ = auVar204._28_4_ + auVar22._28_4_ + auVar204._28_4_;
            auVar149 = ZEXT3264(auVar148);
            auVar22 = vmaxps_avx(auVar312,auVar148);
            auVar22 = vcmpps_avx(auVar22,ZEXT432(0) << 0x20,2);
            auVar203 = local_780 & auVar22;
            if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar203 >> 0x7f,0) == '\0') &&
                  (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar203 >> 0xbf,0) == '\0') &&
                (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar203[0x1f]) {
LAB_01051cc1:
              auVar179 = ZEXT3264(CONCAT824(uStack_4c8,
                                            CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
              auVar294._4_4_ = fVar151;
              auVar294._0_4_ = fVar137;
              auVar294._8_4_ = fVar153;
              auVar294._12_4_ = fVar154;
              auVar294._16_4_ = fVar156;
              auVar294._20_4_ = fVar157;
              auVar294._24_4_ = fVar159;
              auVar294._28_4_ = fVar160;
            }
            else {
              auVar203 = vandps_avx(auVar22,local_780);
              auVar100._4_4_ = fVar324 * fVar257;
              auVar100._0_4_ = fVar219 * fVar242;
              auVar100._8_4_ = fVar258 * fVar214;
              auVar100._12_4_ = fVar184 * fVar180;
              auVar100._16_4_ = fVar239 * fVar222;
              auVar100._20_4_ = fVar279 * fVar161;
              auVar100._24_4_ = fVar333 * fVar283;
              auVar100._28_4_ = local_780._28_4_;
              auVar101._4_4_ = fVar158 * fVar303;
              auVar101._0_4_ = fVar320 * fVar295;
              auVar101._8_4_ = fVar152 * fVar304;
              auVar101._12_4_ = fVar183 * fVar305;
              auVar101._16_4_ = fVar237 * fVar306;
              auVar101._20_4_ = fVar268 * fVar307;
              auVar101._24_4_ = fVar332 * fVar308;
              auVar101._28_4_ = auVar22._28_4_;
              auVar204 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar211 * fVar303;
              auVar102._0_4_ = fVar321 * fVar295;
              auVar102._8_4_ = fVar162 * fVar304;
              auVar102._12_4_ = fVar221 * fVar305;
              auVar102._16_4_ = fVar288 * fVar306;
              auVar102._20_4_ = fVar281 * fVar307;
              auVar102._24_4_ = fVar334 * fVar308;
              auVar102._28_4_ = auVar297._28_4_;
              auVar103._4_4_ = fVar324 * fVar323;
              auVar103._0_4_ = fVar219 * fVar217;
              auVar103._8_4_ = fVar258 * fVar150;
              auVar103._12_4_ = fVar184 * fVar182;
              auVar103._16_4_ = fVar239 * fVar236;
              auVar103._20_4_ = fVar279 * fVar240;
              auVar103._24_4_ = fVar333 * fVar331;
              auVar103._28_4_ = auVar38._28_4_;
              auVar276 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar158 * fVar323;
              auVar104._0_4_ = fVar320 * fVar217;
              auVar104._8_4_ = fVar152 * fVar150;
              auVar104._12_4_ = fVar183 * fVar182;
              auVar104._16_4_ = fVar237 * fVar236;
              auVar104._20_4_ = fVar268 * fVar240;
              auVar104._24_4_ = fVar332 * fVar331;
              auVar104._28_4_ = auVar227._28_4_;
              auVar105._4_4_ = fVar211 * fVar257;
              auVar105._0_4_ = fVar321 * fVar242;
              auVar105._8_4_ = fVar162 * fVar214;
              auVar105._12_4_ = fVar221 * fVar180;
              auVar105._16_4_ = fVar288 * fVar222;
              auVar105._20_4_ = fVar281 * fVar161;
              auVar105._24_4_ = fVar334 * fVar283;
              auVar105._28_4_ = auVar36._28_4_;
              auVar297 = vsubps_avx(auVar105,auVar104);
              auVar177._0_4_ = auVar204._0_4_ * 0.0 + auVar297._0_4_ + auVar276._0_4_ * 0.0;
              auVar177._4_4_ = auVar204._4_4_ * 0.0 + auVar297._4_4_ + auVar276._4_4_ * 0.0;
              auVar177._8_4_ = auVar204._8_4_ * 0.0 + auVar297._8_4_ + auVar276._8_4_ * 0.0;
              auVar177._12_4_ = auVar204._12_4_ * 0.0 + auVar297._12_4_ + auVar276._12_4_ * 0.0;
              auVar177._16_4_ = auVar204._16_4_ * 0.0 + auVar297._16_4_ + auVar276._16_4_ * 0.0;
              auVar177._20_4_ = auVar204._20_4_ * 0.0 + auVar297._20_4_ + auVar276._20_4_ * 0.0;
              auVar177._24_4_ = auVar204._24_4_ * 0.0 + auVar297._24_4_ + auVar276._24_4_ * 0.0;
              auVar177._28_4_ = auVar36._28_4_ + auVar297._28_4_ + auVar227._28_4_;
              auVar22 = vrcpps_avx(auVar177);
              fVar242 = auVar22._0_4_;
              fVar217 = auVar22._4_4_;
              auVar106._4_4_ = auVar177._4_4_ * fVar217;
              auVar106._0_4_ = auVar177._0_4_ * fVar242;
              fVar320 = auVar22._8_4_;
              auVar106._8_4_ = auVar177._8_4_ * fVar320;
              fVar219 = auVar22._12_4_;
              auVar106._12_4_ = auVar177._12_4_ * fVar219;
              fVar321 = auVar22._16_4_;
              auVar106._16_4_ = auVar177._16_4_ * fVar321;
              fVar257 = auVar22._20_4_;
              auVar106._20_4_ = auVar177._20_4_ * fVar257;
              fVar323 = auVar22._24_4_;
              auVar106._24_4_ = auVar177._24_4_ * fVar323;
              auVar106._28_4_ = auVar38._28_4_;
              auVar330._8_4_ = 0x3f800000;
              auVar330._0_8_ = &DAT_3f8000003f800000;
              auVar330._12_4_ = 0x3f800000;
              auVar330._16_4_ = 0x3f800000;
              auVar330._20_4_ = 0x3f800000;
              auVar330._24_4_ = 0x3f800000;
              auVar330._28_4_ = 0x3f800000;
              auVar22 = vsubps_avx(auVar330,auVar106);
              fVar242 = auVar22._0_4_ * fVar242 + fVar242;
              fVar217 = auVar22._4_4_ * fVar217 + fVar217;
              fVar320 = auVar22._8_4_ * fVar320 + fVar320;
              fVar219 = auVar22._12_4_ * fVar219 + fVar219;
              fVar321 = auVar22._16_4_ * fVar321 + fVar321;
              fVar257 = auVar22._20_4_ * fVar257 + fVar257;
              fVar323 = auVar22._24_4_ * fVar323 + fVar323;
              auVar107._4_4_ =
                   (fVar155 * auVar204._4_4_ + auVar276._4_4_ * fVar322 + auVar297._4_4_ * fVar280)
                   * fVar217;
              auVar107._0_4_ =
                   (fVar318 * auVar204._0_4_ + auVar276._0_4_ * fVar212 + auVar297._0_4_ * fVar269)
                   * fVar242;
              auVar107._8_4_ =
                   (fVar136 * auVar204._8_4_ + auVar276._8_4_ * fVar216 + auVar297._8_4_ * fVar282)
                   * fVar320;
              auVar107._12_4_ =
                   (fVar181 * auVar204._12_4_ +
                   auVar276._12_4_ * fVar241 + auVar297._12_4_ * fVar284) * fVar219;
              auVar107._16_4_ =
                   (fVar234 * auVar204._16_4_ +
                   auVar276._16_4_ * fVar233 + auVar297._16_4_ * fVar285) * fVar321;
              auVar107._20_4_ =
                   (fVar267 * auVar204._20_4_ +
                   auVar276._20_4_ * fVar186 + auVar297._20_4_ * fVar286) * fVar257;
              auVar107._24_4_ =
                   (fVar325 * auVar204._24_4_ +
                   auVar276._24_4_ * fVar319 + auVar297._24_4_ * fVar287) * fVar323;
              auVar107._28_4_ = auVar178._28_4_ + auVar33._28_4_ + auVar39._28_4_;
              auVar209 = ZEXT3264(auVar107);
              uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar231._4_4_ = uVar289;
              auVar231._0_4_ = uVar289;
              auVar231._8_4_ = uVar289;
              auVar231._12_4_ = uVar289;
              auVar231._16_4_ = uVar289;
              auVar231._20_4_ = uVar289;
              auVar231._24_4_ = uVar289;
              auVar231._28_4_ = uVar289;
              auVar178 = vcmpps_avx(local_120,auVar107,2);
              auVar33 = vcmpps_avx(auVar107,auVar231,2);
              auVar178 = vandps_avx(auVar178,auVar33);
              auVar39 = auVar203 & auVar178;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0x7f,0) == '\0') &&
                    (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar39 >> 0xbf,0) == '\0') &&
                  (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar39[0x1f]) goto LAB_01051cc1;
              auVar178 = vandps_avx(auVar203,auVar178);
              auVar39 = vcmpps_avx(ZEXT432(0) << 0x20,auVar177,4);
              auVar22 = auVar178 & auVar39;
              auVar179 = ZEXT3264(CONCAT824(uStack_4c8,
                                            CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
              auVar294._4_4_ = fVar151;
              auVar294._0_4_ = fVar137;
              auVar294._8_4_ = fVar153;
              auVar294._12_4_ = fVar154;
              auVar294._16_4_ = fVar156;
              auVar294._20_4_ = fVar157;
              auVar294._24_4_ = fVar159;
              auVar294._28_4_ = fVar160;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar178 = vandps_avx(auVar39,auVar178);
                auVar179 = ZEXT3264(auVar178);
                auVar108._4_4_ = fVar217 * auVar312._4_4_;
                auVar108._0_4_ = fVar242 * auVar312._0_4_;
                auVar108._8_4_ = fVar320 * auVar312._8_4_;
                auVar108._12_4_ = fVar219 * auVar312._12_4_;
                auVar108._16_4_ = fVar321 * auVar312._16_4_;
                auVar108._20_4_ = fVar257 * auVar312._20_4_;
                auVar108._24_4_ = fVar323 * auVar312._24_4_;
                auVar108._28_4_ = auVar33._28_4_;
                auVar109._4_4_ = auVar148._4_4_ * fVar217;
                auVar109._0_4_ = auVar148._0_4_ * fVar242;
                auVar109._8_4_ = auVar148._8_4_ * fVar320;
                auVar109._12_4_ = auVar148._12_4_ * fVar219;
                auVar109._16_4_ = auVar148._16_4_ * fVar321;
                auVar109._20_4_ = auVar148._20_4_ * fVar257;
                auVar109._24_4_ = auVar148._24_4_ * fVar323;
                auVar109._28_4_ = auVar148._28_4_;
                auVar266._8_4_ = 0x3f800000;
                auVar266._0_8_ = &DAT_3f8000003f800000;
                auVar266._12_4_ = 0x3f800000;
                auVar266._16_4_ = 0x3f800000;
                auVar266._20_4_ = 0x3f800000;
                auVar266._24_4_ = 0x3f800000;
                auVar266._28_4_ = 0x3f800000;
                auVar178 = vsubps_avx(auVar266,auVar108);
                local_180 = vblendvps_avx(auVar178,auVar108,auVar23);
                auVar178 = vsubps_avx(auVar266,auVar109);
                _local_3c0 = vblendvps_avx(auVar178,auVar109,auVar23);
                auVar149 = ZEXT3264(_local_3c0);
                local_1a0 = auVar107;
              }
            }
            auVar317 = ZEXT3264(_local_7c0);
            auVar178 = auVar179._0_32_;
            if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar178 >> 0x7f,0) != '\0') ||
                  (auVar179 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar178 >> 0xbf,0) != '\0') ||
                (auVar179 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar179[0x1f] < '\0') {
              auVar33 = vsubps_avx(auVar340,auVar294);
              auVar209 = ZEXT3264(local_180);
              fVar151 = auVar294._0_4_ + auVar33._0_4_ * local_180._0_4_;
              fVar153 = auVar294._4_4_ + auVar33._4_4_ * local_180._4_4_;
              fVar154 = auVar294._8_4_ + auVar33._8_4_ * local_180._8_4_;
              fVar156 = auVar294._12_4_ + auVar33._12_4_ * local_180._12_4_;
              fVar157 = auVar294._16_4_ + auVar33._16_4_ * local_180._16_4_;
              fVar159 = auVar294._20_4_ + auVar33._20_4_ * local_180._20_4_;
              fVar242 = auVar294._24_4_ + auVar33._24_4_ * local_180._24_4_;
              fVar212 = auVar294._28_4_ + auVar33._28_4_;
              fVar137 = *(float *)((long)local_698->ray_space + k * 4 + -0x10);
              auVar110._4_4_ = (fVar153 + fVar153) * fVar137;
              auVar110._0_4_ = (fVar151 + fVar151) * fVar137;
              auVar110._8_4_ = (fVar154 + fVar154) * fVar137;
              auVar110._12_4_ = (fVar156 + fVar156) * fVar137;
              auVar110._16_4_ = (fVar157 + fVar157) * fVar137;
              auVar110._20_4_ = (fVar159 + fVar159) * fVar137;
              auVar110._24_4_ = (fVar242 + fVar242) * fVar137;
              auVar110._28_4_ = fVar212 + fVar212;
              auVar33 = vcmpps_avx(local_1a0,auVar110,6);
              auVar149 = ZEXT3264(auVar33);
              auVar39 = auVar178 & auVar33;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                local_220 = vandps_avx(auVar33,auVar178);
                auVar149 = ZEXT3264(local_220);
                auVar168._0_8_ =
                     CONCAT44((float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0,
                              (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0);
                auVar168._8_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
                auVar168._12_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
                auVar172._16_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                auVar172._0_16_ = auVar168;
                auVar172._20_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                fStack_2a8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                _local_2c0 = auVar172;
                fStack_2a4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                auVar179 = ZEXT3264(_local_2c0);
                local_2e0 = local_180;
                local_2a0 = local_1a0;
                local_270 = local_6b0;
                uStack_268 = uStack_6a8;
                local_260 = local_500._0_8_;
                uStack_258 = local_500._8_8_;
                local_250 = local_4a0._0_8_;
                uStack_248 = local_4a0._8_8_;
                local_240 = local_490._0_8_;
                uStack_238 = local_490._8_8_;
                local_7a0._0_8_ = (context->scene->geometries).items[local_7e8].ptr;
                _local_3c0 = _local_2c0;
                if ((((Geometry *)local_7a0._0_8_)->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  pRVar130 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar130 = context->args;
                  if ((pRVar130->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar130 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar130 >> 8),1),
                     ((Geometry *)local_7a0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_7a0._8_24_ = auVar265._8_24_;
                    stack0xfffffffffffff824 = auVar312._4_28_;
                    local_7e0._0_4_ = (int)uVar133;
                    auVar169._0_4_ = (float)(int)local_280;
                    auVar169._4_8_ = SUB128(ZEXT812(0),4);
                    auVar169._12_4_ = 0;
                    auVar226 = vshufps_avx(auVar169,auVar169,0);
                    local_200[0] = (auVar226._0_4_ + local_180._0_4_ + 0.0) * (float)local_140._0_4_
                    ;
                    local_200[1] = (auVar226._4_4_ + local_180._4_4_ + 1.0) * (float)local_140._4_4_
                    ;
                    local_200[2] = (auVar226._8_4_ + local_180._8_4_ + 2.0) * fStack_138;
                    local_200[3] = (auVar226._12_4_ + local_180._12_4_ + 3.0) * fStack_134;
                    fStack_1f0 = (auVar226._0_4_ + local_180._16_4_ + 4.0) * fStack_130;
                    fStack_1ec = (auVar226._4_4_ + local_180._20_4_ + 5.0) * fStack_12c;
                    fStack_1e8 = (auVar226._8_4_ + local_180._24_4_ + 6.0) * fStack_128;
                    fStack_1e4 = auVar226._12_4_ + (float)local_180._28_4_ + 7.0;
                    uStack_3b8 = auVar168._8_8_;
                    uStack_3b0 = auVar172._16_8_;
                    uStack_3a8 = local_2c0._24_8_;
                    local_1e0 = auVar168._0_8_;
                    uStack_1d8 = uStack_3b8;
                    uStack_1d0 = uStack_3b0;
                    uStack_1c8 = uStack_3a8;
                    auVar179 = ZEXT3264(local_1a0);
                    local_1c0 = local_1a0;
                    iVar128 = vmovmskps_avx(local_220);
                    local_840 = (undefined1  [8])CONCAT44((int)((ulong)pRVar130 >> 0x20),iVar128);
                    lVar18 = 0;
                    if (local_840 != (undefined1  [8])0x0) {
                      for (; ((ulong)local_840 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                      }
                    }
                    local_820 = (uint)lVar18;
                    uStack_81c = (undefined4)((ulong)lVar18 >> 0x20);
                    local_6e0._4_28_ = auVar251._4_28_;
                    local_6e0._0_4_ = (int)CONCAT71((int7)((ulong)local_840 >> 8),iVar128 != 0);
                    if (iVar128 != 0) {
                      _local_700 = local_500;
                      _auStack_610 = auVar250._16_16_;
                      _local_620 = local_4a0;
                      _local_720 = local_490;
                      local_740 = (float)*(undefined8 *)*local_6a0;
                      fStack_73c = (float)((ulong)*(undefined8 *)*local_6a0 >> 0x20);
                      fStack_738 = (float)*(undefined8 *)(*local_6a0 + 8);
                      fStack_734 = (float)((ulong)*(undefined8 *)(*local_6a0 + 8) >> 0x20);
                      _local_760 = auVar208;
                      _local_5a0 = auVar32;
                      local_27c = uVar15;
                      do {
                        local_780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        lVar18 = CONCAT44(uStack_81c,local_820);
                        local_420 = local_200[lVar18];
                        local_410 = *(undefined4 *)((long)&local_1e0 + lVar18 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + lVar18 * 4);
                        fVar338 = 1.0 - local_420;
                        fVar185 = local_420 * fVar338 + local_420 * fVar338;
                        auVar226 = ZEXT416((uint)(local_420 * local_420 * 3.0));
                        auVar226 = vshufps_avx(auVar226,auVar226,0);
                        auVar245 = ZEXT416((uint)((fVar185 - local_420 * local_420) * 3.0));
                        auVar245 = vshufps_avx(auVar245,auVar245,0);
                        auVar202 = ZEXT416((uint)((fVar338 * fVar338 - fVar185) * 3.0));
                        auVar202 = vshufps_avx(auVar202,auVar202,0);
                        local_690.context = context->user;
                        auVar190 = ZEXT416((uint)(fVar338 * fVar338 * -3.0));
                        auVar190 = vshufps_avx(auVar190,auVar190,0);
                        auVar191._0_4_ =
                             auVar190._0_4_ * (float)local_6b0._0_4_ +
                             auVar202._0_4_ * (float)local_700._0_4_ +
                             auVar226._0_4_ * (float)local_720._0_4_ +
                             auVar245._0_4_ * (float)local_620._0_4_;
                        auVar191._4_4_ =
                             auVar190._4_4_ * (float)local_6b0._4_4_ +
                             auVar202._4_4_ * (float)local_700._4_4_ +
                             auVar226._4_4_ * (float)local_720._4_4_ +
                             auVar245._4_4_ * (float)local_620._4_4_;
                        auVar191._8_4_ =
                             auVar190._8_4_ * (float)uStack_6a8 +
                             auVar202._8_4_ * (float)uStack_6f8 +
                             auVar226._8_4_ * (float)uStack_718 + auVar245._8_4_ * (float)uStack_618
                        ;
                        auVar191._12_4_ =
                             auVar190._12_4_ * uStack_6a8._4_4_ +
                             auVar202._12_4_ * uStack_6f8._4_4_ +
                             auVar226._12_4_ * uStack_718._4_4_ + auVar245._12_4_ * uStack_618._4_4_
                        ;
                        local_450 = (RTCHitN  [16])vshufps_avx(auVar191,auVar191,0);
                        local_440 = vshufps_avx(auVar191,auVar191,0x55);
                        auVar209 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar191,auVar191,0xaa);
                        local_400 = local_5e0._0_8_;
                        uStack_3f8 = local_5e0._8_8_;
                        local_3f0 = local_5d0._0_8_;
                        uStack_3e8 = local_5d0._8_8_;
                        vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        uStack_3dc = (local_690.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_690.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_800 = CONCAT44(fStack_73c,local_740);
                        uStack_7f8 = CONCAT44(fStack_734,fStack_738);
                        local_690.valid = (int *)&local_800;
                        local_690.geometryUserPtr = *(void **)(local_7a0._0_8_ + 0x18);
                        local_690.hit = local_450;
                        local_690.N = 4;
                        local_690.ray = (RTCRayN *)ray;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        if (*(code **)(local_7a0._0_8_ + 0x48) != (code *)0x0) {
                          auVar209 = ZEXT1664(local_440);
                          (**(code **)(local_7a0._0_8_ + 0x48))(&local_690);
                        }
                        auVar114._8_8_ = uStack_7f8;
                        auVar114._0_8_ = local_800;
                        if (auVar114 == (undefined1  [16])0x0) {
                          auVar226 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar226 = auVar226 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var20 = context->args->filter;
                          if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar209 = ZEXT1664(auVar209._0_16_);
                            (*p_Var20)(&local_690);
                          }
                          auVar115._8_8_ = uStack_7f8;
                          auVar115._0_8_ = local_800;
                          auVar245 = vpcmpeqd_avx((undefined1  [16])0x0,auVar115);
                          auVar226 = auVar245 ^ _DAT_01febe20;
                          auVar192._8_4_ = 0xff800000;
                          auVar192._0_8_ = 0xff800000ff800000;
                          auVar192._12_4_ = 0xff800000;
                          auVar245 = vblendvps_avx(auVar192,*(undefined1 (*) [16])
                                                             (local_690.ray + 0x80),auVar245);
                          *(undefined1 (*) [16])(local_690.ray + 0x80) = auVar245;
                        }
                        auVar149 = ZEXT1664(auVar226);
                        auVar170._8_8_ = 0x100000001;
                        auVar170._0_8_ = 0x100000001;
                        auVar179 = ZEXT1664(auVar170);
                        if ((auVar170 & auVar226) != (undefined1  [16])0x0) break;
                        auVar149 = ZEXT464((uint)local_780._0_4_);
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_780._0_4_;
                        local_840 = (undefined1  [8])
                                    ((ulong)local_840 ^ 1L << ((ulong)local_820 & 0x3f));
                        lVar18 = 0;
                        if (local_840 != (undefined1  [8])0x0) {
                          for (; ((ulong)local_840 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                          }
                        }
                        local_820 = (uint)lVar18;
                        uStack_81c = (undefined4)((ulong)lVar18 >> 0x20);
                        local_6e0._0_4_ =
                             (int)CONCAT71((int7)((ulong)local_840 >> 8),
                                           local_840 != (undefined1  [8])0x0);
                      } while (local_840 != (undefined1  [8])0x0);
                    }
                    pRVar130 = (RTCIntersectArguments *)(ulong)(local_6e0[0] & 1);
                    auVar317 = ZEXT3264(_local_7c0);
                    uVar133 = (ulong)(uint)local_7e0._0_4_;
                  }
                }
                uVar133 = CONCAT71((int7)(uVar133 >> 8),(byte)uVar133 | (byte)pRVar130);
                fVar185 = (float)local_600._0_4_;
                fVar338 = (float)local_600._4_4_;
                fVar197 = fStack_5f8;
                fVar256 = fStack_5f4;
                fVar198 = fStack_5f0;
                fVar210 = fStack_5ec;
                fVar213 = fStack_5e8;
                fVar215 = (float)local_520._0_4_;
                fVar220 = (float)local_520._4_4_;
                fVar232 = fStack_518;
                fVar235 = fStack_514;
                fVar238 = fStack_510;
                fVar243 = fStack_50c;
                fVar253 = fStack_508;
                fVar254 = (float)local_580._0_4_;
                fVar255 = (float)local_580._4_4_;
                fVar313 = fStack_578;
                fVar343 = fStack_574;
                fVar344 = fStack_570;
                fVar218 = fStack_56c;
                fVar314 = fStack_568;
              }
            }
          }
          lVar135 = lVar135 + 8;
        } while ((int)lVar135 < (int)uVar15);
      }
      if ((uVar133 & 1) != 0) {
        return local_855;
      }
      uVar289 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar141._4_4_ = uVar289;
      auVar141._0_4_ = uVar289;
      auVar141._8_4_ = uVar289;
      auVar141._12_4_ = uVar289;
      auVar226 = vcmpps_avx(local_2f0,auVar141,2);
      uVar131 = vmovmskps_avx(auVar226);
      uVar127 = uVar127 & uVar127 + 0xf & uVar131;
      local_855 = uVar127 != 0;
    } while (local_855);
  }
  return local_855;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }